

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1P3L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  float *pfVar1;
  undefined1 (*pauVar2) [16];
  iterator __position;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  SrcEvaluatorType srcEvaluator_1;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pCVar31;
  ostream *poVar32;
  uint uVar33;
  ulong uVar34;
  Scalar SVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar126;
  float fVar130;
  undefined1 auVar124 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar125 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined4 uVar151;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar165;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float ty;
  vector<float,_std::allocator<float>_> realRoots;
  float b;
  Matrix<float,_4,_4,_0,_4,_4> transOut;
  float tx;
  Matrix<float,_5,_1,_0,_5,_1> factors;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_6,_6,_0,_6,_6> TK;
  Matrix<float,_6,_6,_0,_6,_6> TL;
  Matrix<float,_4,_4,_0,_4,_4> TV;
  undefined4 uStack_178c;
  undefined4 uStack_175c;
  float local_1758;
  undefined4 uStack_173c;
  undefined4 uStack_172c;
  undefined4 uStack_16fc;
  undefined4 uStack_169c;
  undefined4 uStack_168c;
  undefined4 uStack_166c;
  float local_164c;
  undefined1 local_1648 [16];
  ulong local_1638;
  undefined4 uStack_1630;
  undefined4 uStack_162c;
  float local_1628;
  float fStack_1624;
  float fStack_1620;
  float fStack_161c;
  undefined8 local_1618;
  float fStack_1610;
  float fStack_160c;
  float local_1608;
  float fStack_1604;
  float fStack_1600;
  float fStack_15fc;
  float local_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float local_15e8;
  float fStack_15e4;
  float fStack_15e0;
  float fStack_15dc;
  float local_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  float local_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float local_15a8;
  float fStack_15a4;
  float fStack_15a0;
  float fStack_159c;
  float local_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float local_1588;
  float fStack_1584;
  float fStack_1580;
  float fStack_157c;
  undefined8 local_1578;
  float fStack_1570;
  float fStack_156c;
  float local_1568;
  float fStack_1564;
  undefined4 uStack_1560;
  undefined4 uStack_155c;
  float local_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float local_1548;
  float fStack_1544;
  float fStack_1540;
  float fStack_153c;
  float local_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float local_1528;
  float fStack_1524;
  float fStack_1520;
  float fStack_151c;
  float local_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float local_1508;
  float fStack_1504;
  float fStack_1500;
  float fStack_14fc;
  float local_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *local_14e8;
  plainobjectbase_evaluator_data<float,_3> local_14e0;
  undefined1 local_14d8 [8];
  float fStack_14d0;
  float fStack_14cc;
  float local_14c8;
  float fStack_14c4;
  float fStack_14c0;
  float fStack_14bc;
  float local_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float local_14a8;
  float fStack_14a4;
  float fStack_14a0;
  float fStack_149c;
  float local_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float local_1488;
  float fStack_1484;
  float fStack_1480;
  float fStack_147c;
  undefined1 local_1478 [16];
  float local_1468;
  float fStack_1464;
  float fStack_1460;
  float fStack_145c;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float local_1448;
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float local_1428;
  float fStack_1424;
  float fStack_1420;
  float fStack_141c;
  float local_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float local_1408;
  float fStack_1404;
  float fStack_1400;
  float fStack_13fc;
  float local_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float local_13e8;
  float fStack_13e4;
  float fStack_13e0;
  float fStack_13dc;
  float local_13d8;
  float fStack_13d4;
  undefined4 uStack_13d0;
  undefined4 uStack_13cc;
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  undefined8 local_13a8;
  float fStack_13a0;
  float fStack_139c;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float local_1388;
  float fStack_1384;
  undefined4 uStack_1380;
  undefined4 uStack_137c;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  undefined1 local_1358 [12];
  float fStack_134c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  DstXprType local_1330;
  undefined1 local_12f8 [16];
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  ulong local_1268;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  Scalar local_1184;
  Scalar local_1180;
  Scalar local_117c;
  Scalar local_1178;
  Scalar local_1174;
  Scalar local_1170;
  Scalar local_116c;
  Scalar local_1168;
  Scalar local_1164;
  undefined4 local_1160;
  float local_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [8];
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  variable_if_dynamic<long,__1> local_1078;
  variable_if_dynamic<long,__1> vStack_1070;
  Index local_1068;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  float local_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float local_f68;
  float fStack_f64;
  float fStack_f60;
  float fStack_f5c;
  float local_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float local_f48;
  float fStack_f44;
  float fStack_f40;
  float fStack_f3c;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float local_f28;
  float fStack_f24;
  float fStack_f20;
  float fStack_f1c;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  undefined1 local_f08 [16];
  float local_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float local_ee8;
  float fStack_ee4;
  undefined4 uStack_ee0;
  undefined4 uStack_edc;
  ulong local_ed8;
  float fStack_ed0;
  float fStack_ecc;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  float local_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  float local_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float local_e68;
  float fStack_e64;
  float fStack_e60;
  float fStack_e5c;
  float local_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float local_e48;
  float fStack_e44;
  float fStack_e40;
  float fStack_e3c;
  float local_e38;
  float fStack_e34;
  undefined4 uStack_e30;
  undefined4 uStack_e2c;
  float local_e28;
  float fStack_e24;
  float fStack_e20;
  float fStack_e1c;
  float local_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  undefined1 local_e08 [8];
  float fStack_e00;
  float fStack_dfc;
  float local_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  undefined1 local_de8 [12];
  float fStack_ddc;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  undefined8 local_db8;
  float fStack_db0;
  float fStack_dac;
  float local_da8;
  float fStack_da4;
  float fStack_da0;
  float fStack_d9c;
  float local_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float local_d88;
  float fStack_d84;
  float fStack_d80;
  float fStack_d7c;
  float local_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float local_d68;
  float fStack_d64;
  float fStack_d60;
  float fStack_d5c;
  float local_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float local_d48;
  float fStack_d44;
  float fStack_d40;
  float fStack_d3c;
  float local_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  float local_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  float local_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  float local_cb8;
  float fStack_cb4;
  undefined4 uStack_cb0;
  undefined4 uStack_cac;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  float local_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float local_c68;
  float fStack_c64;
  undefined4 uStack_c60;
  undefined4 uStack_c5c;
  float local_c58;
  float fStack_c54;
  undefined4 uStack_c50;
  undefined4 uStack_c4c;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_c28;
  Matrix<float,_4,_4,_0,_4,_4> local_c08;
  float local_bc8;
  float fStack_bc4;
  undefined4 uStack_bc0;
  undefined4 uStack_bbc;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b98;
  float fStack_b94;
  undefined4 uStack_b90;
  undefined4 uStack_b8c;
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float local_b68;
  float fStack_b64;
  undefined4 uStack_b60;
  undefined4 uStack_b5c;
  float local_b58;
  float fStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  float fStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_988;
  float fStack_984;
  undefined4 uStack_980;
  undefined4 uStack_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  Matrix<float,_3,_3,_0,_3,_3> local_8b8;
  Matrix<float,_4,_4,_0,_4,_4> local_888;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_840;
  undefined1 local_828 [12];
  float fStack_81c;
  float local_818;
  float local_814;
  float local_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  float local_800;
  float local_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float local_7e4;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  undefined1 auStack_7d4 [76];
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  undefined1 local_718 [16];
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  undefined1 local_698 [12];
  float fStack_68c;
  float local_688;
  float fStack_684;
  undefined8 uStack_680;
  undefined8 local_678;
  float fStack_670;
  float fStack_66c;
  undefined8 local_668;
  float fStack_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_650;
  float fStack_64c;
  float fStack_648;
  undefined1 auStack_644 [60];
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined8 local_5f8;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  undefined8 local_5d8;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined8 local_5b8;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined8 local_598;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  undefined8 local_578;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  undefined8 local_558;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined8 local_4e8;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [16];
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  ulong local_438;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  ulong local_408;
  float local_3f8;
  float fStack_3f4;
  ulong local_3e8;
  undefined8 uStack_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  ulong local_2d8;
  ulong local_2c8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  ulong local_298;
  ulong uStack_290;
  float local_288;
  float fStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined8 local_278;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  ulong local_218;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  ulong uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  Matrix<float,_4,_4,_0,_4,_4> local_b8;
  Matrix<float,_3,_1,_0,_3,_1> local_78;
  Matrix<float,_3,_1,_0,_3,_1> local_68;
  Matrix<float,_4,_1,_0,_4,_1> local_58;
  Matrix<float,_4,_1,_0,_4,_1> local_48;
  
  pfVar1 = *(float **)plPair;
  local_14e8 = (vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                *)__return_storage_ptr__;
  if ((*(float **)(plPair + 8) == pfVar1) ||
     (pauVar2 = *(undefined1 (**) [16])lPair, (ulong)(*(long *)(lPair + 8) - (long)pauVar2) < 0x81))
  {
    poVar32 = std::operator<<((ostream *)&std::cerr,
                              "Solver 3L1Q requires at least 1 plane, and 3 line pairs!");
    std::endl<char,std::char_traits<char>>(poVar32);
    exit(-1);
  }
  uVar9 = *(undefined8 *)pfVar1;
  uVar10 = *(undefined8 *)(pfVar1 + 2);
  uVar11 = *(undefined8 *)(pfVar1 + 4);
  uVar12 = *(undefined8 *)(pfVar1 + 6);
  auVar78 = *pauVar2;
  auVar158._12_4_ = auVar78._12_4_;
  auVar147 = pauVar2[1];
  uVar151 = auVar147._12_4_;
  auVar27 = *(undefined1 (*) [12])pauVar2[2];
  uStack_173c = (undefined4)((ulong)*(undefined8 *)(pauVar2[2] + 8) >> 0x20);
  auVar28 = *(undefined1 (*) [12])pauVar2[3];
  uStack_172c = (undefined4)((ulong)*(undefined8 *)(pauVar2[3] + 8) >> 0x20);
  auVar6 = *(undefined1 (*) [12])pauVar2[4];
  uStack_175c = (undefined4)((ulong)*(undefined8 *)(pauVar2[4] + 8) >> 0x20);
  auVar7 = *(undefined1 (*) [12])pauVar2[5];
  uStack_169c = (undefined4)((ulong)*(undefined8 *)(pauVar2[5] + 8) >> 0x20);
  auVar29 = *(undefined1 (*) [12])pauVar2[6];
  uStack_178c = (undefined4)((ulong)*(undefined8 *)(pauVar2[6] + 8) >> 0x20);
  auVar30 = *(undefined1 (*) [12])pauVar2[7];
  uStack_166c = (undefined4)((ulong)*(undefined8 *)(pauVar2[7] + 8) >> 0x20);
  auVar124._4_4_ = auVar147._8_4_;
  auVar124._0_4_ = auVar78._8_4_;
  auVar124._8_4_ = auVar158._12_4_;
  auVar124._12_4_ = uVar151;
  auVar146._4_4_ = uVar151;
  auVar146._0_4_ = auVar158._12_4_;
  auVar146._8_4_ = auVar78._8_4_;
  auVar146._12_4_ = auVar158._12_4_;
  auVar158._4_4_ = auVar158._12_4_;
  auVar158._0_4_ = auVar158._12_4_;
  auVar158._8_4_ = auVar158._12_4_;
  auVar46 = divps(auVar78,auVar158);
  auVar78._4_4_ = uVar151;
  auVar78._0_4_ = uVar151;
  auVar78._8_4_ = uVar151;
  auVar78._12_4_ = uVar151;
  auVar78 = divps(auVar147,auVar78);
  fVar38 = auVar78._0_4_;
  fVar39 = auVar78._4_4_;
  fVar36 = auVar46._0_4_;
  fVar37 = auVar46._4_4_;
  auVar8 = *(undefined1 (*) [12])pauVar2[8];
  uStack_168c = (undefined4)((ulong)*(undefined8 *)(pauVar2[8] + 8) >> 0x20);
  auVar78 = divps(auVar124,auVar146);
  auVar17 = *(undefined1 (*) [12])pauVar2[9];
  uStack_16fc = (undefined4)((ulong)*(undefined8 *)(pauVar2[9] + 8) >> 0x20);
  unique0x00005300 = (XprTypeNested)local_568;
  local_1558 = (float)*(undefined8 *)pauVar2[10];
  fStack_1554 = (float)((ulong)*(undefined8 *)pauVar2[10] >> 0x20);
  fStack_1550 = (float)*(undefined8 *)(pauVar2[10] + 8);
  fStack_154c = (float)((ulong)*(undefined8 *)(pauVar2[10] + 8) >> 0x20);
  local_1608 = (float)*(undefined8 *)pauVar2[0xb];
  fStack_1604 = (float)((ulong)*(undefined8 *)pauVar2[0xb] >> 0x20);
  fStack_1600 = (float)*(undefined8 *)(pauVar2[0xb] + 8);
  fStack_15fc = (float)((ulong)*(undefined8 *)(pauVar2[0xb] + 8) >> 0x20);
  local_568._4_4_ = fVar39 - fVar37;
  local_568._0_4_ = fVar38 - fVar36;
  fVar40 = auVar78._0_4_;
  fVar59 = auVar78._4_4_;
  fStack_560 = fVar59 - fVar40;
  fStack_55c = fVar39 * fVar40 - fVar37 * fVar59;
  local_558 = CONCAT44(fVar38 * fVar37 - fVar39 * fVar36,fVar36 * fVar59 - fVar40 * fVar38);
  stack0xfffffffffffff970 = 3;
  local_678 = 0;
  local_668 = 6;
  local_698._0_8_ = unique0x00005300;
  uStack_680 = unique0x00005300;
  SVar35 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_828,(scalar_sum_op<float,_float> *)local_10b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_698);
  auVar47._0_4_ = SQRT(SVar35);
  auVar47._4_4_ = auVar47._0_4_;
  auVar47._8_4_ = auVar47._0_4_;
  auVar47._12_4_ = auVar47._0_4_;
  _local_568 = divps(_local_568,auVar47);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_558;
  auVar78 = divps(auVar79,auVar47);
  local_558 = auVar78._0_8_;
  auVar14._12_4_ = uStack_175c;
  auVar14._0_12_ = auVar6;
  uVar151 = auVar6._8_4_;
  auVar80._4_4_ = uStack_175c;
  auVar80._0_4_ = uStack_175c;
  auVar80._8_4_ = uStack_175c;
  auVar80._12_4_ = uStack_175c;
  auVar78 = divps(auVar14,auVar80);
  auVar20._12_4_ = uStack_169c;
  auVar20._0_12_ = auVar7;
  auVar81._4_4_ = uStack_169c;
  auVar81._0_4_ = uStack_169c;
  auVar81._8_4_ = uStack_169c;
  auVar81._12_4_ = uStack_169c;
  auVar147 = divps(auVar20,auVar81);
  fVar38 = auVar147._0_4_;
  fVar39 = auVar147._4_4_;
  fVar36 = auVar78._0_4_;
  fVar37 = auVar78._4_4_;
  local_588._4_4_ = fVar39 - fVar37;
  local_588._0_4_ = fVar38 - fVar36;
  auVar159._4_4_ = auVar7._8_4_;
  auVar159._0_4_ = uVar151;
  auVar159._8_4_ = uStack_175c;
  auVar159._12_4_ = uStack_169c;
  auVar147._4_4_ = uStack_169c;
  auVar147._0_4_ = uStack_175c;
  auVar147._8_4_ = uVar151;
  auVar147._12_4_ = uStack_175c;
  auVar78 = divps(auVar159,auVar147);
  fVar40 = auVar78._0_4_;
  fVar59 = auVar78._4_4_;
  unique0x00005300 = (XprTypeNested)local_588;
  fStack_580 = fVar59 - fVar40;
  fStack_57c = fVar39 * fVar40 - fVar37 * fVar59;
  local_578 = CONCAT44(fVar38 * fVar37 - fVar39 * fVar36,fVar36 * fVar59 - fVar40 * fVar38);
  stack0xfffffffffffff970 = 3;
  local_678 = 0;
  local_668 = 6;
  local_698._0_8_ = unique0x00005300;
  uStack_680 = unique0x00005300;
  SVar35 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_828,(scalar_sum_op<float,_float> *)local_10b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_698);
  auVar48._0_4_ = SQRT(SVar35);
  auVar48._4_4_ = auVar48._0_4_;
  auVar48._8_4_ = auVar48._0_4_;
  auVar48._12_4_ = auVar48._0_4_;
  _local_588 = divps(_local_588,auVar48);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = local_578;
  auVar78 = divps(auVar82,auVar48);
  local_578 = auVar78._0_8_;
  auVar21._12_4_ = uStack_168c;
  auVar21._0_12_ = auVar8;
  uVar151 = auVar8._8_4_;
  auVar83._4_4_ = uStack_168c;
  auVar83._0_4_ = uStack_168c;
  auVar83._8_4_ = uStack_168c;
  auVar83._12_4_ = uStack_168c;
  auVar78 = divps(auVar21,auVar83);
  auVar19._12_4_ = uStack_16fc;
  auVar19._0_12_ = auVar17;
  auVar84._4_4_ = uStack_16fc;
  auVar84._0_4_ = uStack_16fc;
  auVar84._8_4_ = uStack_16fc;
  auVar84._12_4_ = uStack_16fc;
  auVar147 = divps(auVar19,auVar84);
  fVar38 = auVar147._0_4_;
  fVar39 = auVar147._4_4_;
  fVar36 = auVar78._0_4_;
  fVar37 = auVar78._4_4_;
  local_5a8._4_4_ = fVar39 - fVar37;
  local_5a8._0_4_ = fVar38 - fVar36;
  auVar160._4_4_ = auVar17._8_4_;
  auVar160._0_4_ = uVar151;
  auVar160._8_4_ = uStack_168c;
  auVar160._12_4_ = uStack_16fc;
  auVar46._4_4_ = uStack_16fc;
  auVar46._0_4_ = uStack_168c;
  auVar46._8_4_ = uVar151;
  auVar46._12_4_ = uStack_168c;
  auVar78 = divps(auVar160,auVar46);
  fVar40 = auVar78._0_4_;
  fVar59 = auVar78._4_4_;
  unique0x00005300 = (XprTypeNested)local_5a8;
  fStack_5a0 = fVar59 - fVar40;
  fStack_59c = fVar39 * fVar40 - fVar37 * fVar59;
  local_598 = CONCAT44(fVar38 * fVar37 - fVar39 * fVar36,fVar36 * fVar59 - fVar40 * fVar38);
  stack0xfffffffffffff970 = 3;
  local_678 = 0;
  local_668 = 6;
  local_698._0_8_ = unique0x00005300;
  uStack_680 = unique0x00005300;
  SVar35 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_828,(scalar_sum_op<float,_float> *)local_10b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_698);
  auVar49._0_4_ = SQRT(SVar35);
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  _local_5a8 = divps(_local_5a8,auVar49);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = local_598;
  auVar78 = divps(auVar85,auVar49);
  local_598 = auVar78._0_8_;
  auVar15._12_4_ = uStack_173c;
  auVar15._0_12_ = auVar27;
  uVar151 = auVar27._8_4_;
  auVar86._4_4_ = uStack_173c;
  auVar86._0_4_ = uStack_173c;
  auVar86._8_4_ = uStack_173c;
  auVar86._12_4_ = uStack_173c;
  auVar78 = divps(auVar15,auVar86);
  auVar18._12_4_ = uStack_172c;
  auVar18._0_12_ = auVar28;
  auVar87._4_4_ = uStack_172c;
  auVar87._0_4_ = uStack_172c;
  auVar87._8_4_ = uStack_172c;
  auVar87._12_4_ = uStack_172c;
  auVar147 = divps(auVar18,auVar87);
  fVar38 = auVar147._0_4_;
  fVar39 = auVar147._4_4_;
  fVar36 = auVar78._0_4_;
  fVar37 = auVar78._4_4_;
  local_5c8._4_4_ = fVar39 - fVar37;
  local_5c8._0_4_ = fVar38 - fVar36;
  auVar161._4_4_ = auVar28._8_4_;
  auVar161._0_4_ = uVar151;
  auVar161._8_4_ = uStack_173c;
  auVar161._12_4_ = uStack_172c;
  auVar3._4_4_ = uStack_172c;
  auVar3._0_4_ = uStack_173c;
  auVar3._8_4_ = uVar151;
  auVar3._12_4_ = uStack_173c;
  auVar78 = divps(auVar161,auVar3);
  fVar40 = auVar78._0_4_;
  fVar59 = auVar78._4_4_;
  unique0x00005300 = (XprTypeNested)local_5c8;
  fStack_5c0 = fVar59 - fVar40;
  fStack_5bc = fVar39 * fVar40 - fVar37 * fVar59;
  local_5b8 = CONCAT44(fVar38 * fVar37 - fVar39 * fVar36,fVar36 * fVar59 - fVar40 * fVar38);
  stack0xfffffffffffff970 = 3;
  local_678 = 0;
  local_668 = 6;
  local_698._0_8_ = unique0x00005300;
  uStack_680 = unique0x00005300;
  SVar35 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_828,(scalar_sum_op<float,_float> *)local_10b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_698);
  auVar50._0_4_ = SQRT(SVar35);
  auVar50._4_4_ = auVar50._0_4_;
  auVar50._8_4_ = auVar50._0_4_;
  auVar50._12_4_ = auVar50._0_4_;
  _local_5c8 = divps(_local_5c8,auVar50);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = local_5b8;
  auVar78 = divps(auVar88,auVar50);
  local_5b8 = auVar78._0_8_;
  auVar13._12_4_ = uStack_178c;
  auVar13._0_12_ = auVar29;
  uVar151 = auVar29._8_4_;
  auVar89._4_4_ = uStack_178c;
  auVar89._0_4_ = uStack_178c;
  auVar89._8_4_ = uStack_178c;
  auVar89._12_4_ = uStack_178c;
  auVar78 = divps(auVar13,auVar89);
  auVar22._12_4_ = uStack_166c;
  auVar22._0_12_ = auVar30;
  auVar90._4_4_ = uStack_166c;
  auVar90._0_4_ = uStack_166c;
  auVar90._8_4_ = uStack_166c;
  auVar90._12_4_ = uStack_166c;
  auVar147 = divps(auVar22,auVar90);
  fVar38 = auVar147._0_4_;
  fVar39 = auVar147._4_4_;
  fVar36 = auVar78._0_4_;
  fVar37 = auVar78._4_4_;
  local_5e8._4_4_ = fVar39 - fVar37;
  local_5e8._0_4_ = fVar38 - fVar36;
  auVar162._4_4_ = auVar30._8_4_;
  auVar162._0_4_ = uVar151;
  auVar162._8_4_ = uStack_178c;
  auVar162._12_4_ = uStack_166c;
  auVar4._4_4_ = uStack_166c;
  auVar4._0_4_ = uStack_178c;
  auVar4._8_4_ = uVar151;
  auVar4._12_4_ = uStack_178c;
  auVar78 = divps(auVar162,auVar4);
  fVar40 = auVar78._0_4_;
  fVar59 = auVar78._4_4_;
  unique0x00005300 = (XprTypeNested)local_5e8;
  fStack_5e0 = fVar59 - fVar40;
  fStack_5dc = fVar39 * fVar40 - fVar37 * fVar59;
  local_5d8 = CONCAT44(fVar38 * fVar37 - fVar39 * fVar36,fVar36 * fVar59 - fVar40 * fVar38);
  stack0xfffffffffffff970 = 3;
  local_678 = 0;
  local_668 = 6;
  local_698._0_8_ = unique0x00005300;
  uStack_680 = unique0x00005300;
  SVar35 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_828,(scalar_sum_op<float,_float> *)local_10b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_698);
  auVar51._0_4_ = SQRT(SVar35);
  auVar51._4_4_ = auVar51._0_4_;
  auVar51._8_4_ = auVar51._0_4_;
  auVar51._12_4_ = auVar51._0_4_;
  _local_5e8 = divps(_local_5e8,auVar51);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = local_5d8;
  auVar78 = divps(auVar91,auVar51);
  local_5d8 = auVar78._0_8_;
  auVar24._4_4_ = fStack_1554;
  auVar24._0_4_ = local_1558;
  auVar24._8_4_ = fStack_1550;
  auVar24._12_4_ = fStack_154c;
  auVar92._4_4_ = fStack_154c;
  auVar92._0_4_ = fStack_154c;
  auVar92._8_4_ = fStack_154c;
  auVar92._12_4_ = fStack_154c;
  auVar78 = divps(auVar24,auVar92);
  auVar23._4_4_ = fStack_1604;
  auVar23._0_4_ = local_1608;
  auVar23._8_4_ = fStack_1600;
  auVar23._12_4_ = fStack_15fc;
  auVar93._4_4_ = fStack_15fc;
  auVar93._0_4_ = fStack_15fc;
  auVar93._8_4_ = fStack_15fc;
  auVar93._12_4_ = fStack_15fc;
  auVar147 = divps(auVar23,auVar93);
  fVar38 = auVar147._0_4_;
  fVar39 = auVar147._4_4_;
  fVar36 = auVar78._0_4_;
  fVar37 = auVar78._4_4_;
  local_608._4_4_ = fVar39 - fVar37;
  local_608._0_4_ = fVar38 - fVar36;
  auVar163._4_4_ = fStack_1600;
  auVar163._0_4_ = fStack_1550;
  auVar163._8_4_ = fStack_154c;
  auVar163._12_4_ = fStack_15fc;
  auVar5._4_4_ = fStack_15fc;
  auVar5._0_4_ = fStack_154c;
  auVar5._8_4_ = fStack_1550;
  auVar5._12_4_ = fStack_154c;
  auVar78 = divps(auVar163,auVar5);
  fVar40 = auVar78._0_4_;
  fVar59 = auVar78._4_4_;
  unique0x00005300 = (XprTypeNested)local_608;
  fStack_600 = fVar59 - fVar40;
  fStack_5fc = fVar39 * fVar40 - fVar37 * fVar59;
  local_5f8 = CONCAT44(fVar38 * fVar37 - fVar39 * fVar36,fVar36 * fVar59 - fVar40 * fVar38);
  stack0xfffffffffffff970 = 3;
  local_678 = 0;
  local_668 = 6;
  local_698._0_8_ = unique0x00005300;
  uStack_680 = unique0x00005300;
  SVar35 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_828,(scalar_sum_op<float,_float> *)local_10b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_698);
  auVar52._0_4_ = SQRT(SVar35);
  auVar52._4_4_ = auVar52._0_4_;
  auVar52._8_4_ = auVar52._0_4_;
  auVar52._12_4_ = auVar52._0_4_;
  _local_608 = divps(_local_608,auVar52);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = local_5f8;
  auVar78 = divps(auVar94,auVar52);
  local_5f8 = auVar78._0_8_;
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_
       = uVar11;
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_
       = uVar12;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_
       = uVar9;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_
       = uVar10;
  getPredefinedTransformations1Plane3Line<float>(&local_840,&local_48,&local_58,false);
  local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          local_840.
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (local_840.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
  local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._16_8_
       = *(undefined8 *)
          (local_840.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
  local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._24_8_
       = *(undefined8 *)
          (local_840.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
  local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._32_8_
       = *(undefined8 *)
          (local_840.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8);
  local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._40_8_
       = *(undefined8 *)
          (local_840.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10);
  local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._48_8_
       = *(undefined8 *)
          (local_840.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc)
  ;
  local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_
       = *(undefined8 *)
          (local_840.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe)
  ;
  local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          local_840.
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-2].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_
       = *(undefined8 *)
          (local_840.
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
  local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _16_8_ = *(undefined8 *)
            (local_840.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4)
  ;
  local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _24_8_ = *(undefined8 *)
            (local_840.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6)
  ;
  local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _32_8_ = *(undefined8 *)
            (local_840.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8)
  ;
  local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _40_8_ = *(undefined8 *)
            (local_840.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10
            );
  local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _48_8_ = *(undefined8 *)
            (local_840.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
            0xc);
  local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
  _56_8_ = *(undefined8 *)
            (local_840.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
            0xe);
  local_840.
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_840.
       super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -2;
  memset((XprTypeNested)local_698,0,0x90);
  uStack_10b0 = 3;
  local_10a8 = (RhsNested)0x3;
  local_1098 = (Matrix<float,_4,_4,_0,_4,_4> *)0x0;
  uStack_1090 = 0;
  local_1088 = 6;
  local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_888;
  local_10b8 = (undefined1  [8])local_698;
  uStack_10a0 = (XprTypeNested)local_698;
  local_de8._0_8_ = (DstEvaluatorType *)&local_8b8;
  unique0x1001535e = &local_1330;
  local_dd8 = &local_c28;
  uStack_dd0 = (SrcXprType *)local_10b8;
  local_8b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_
       = (XprTypeNested)local_698;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_de8);
  local_10b8 = (undefined1  [8])auStack_644;
  uStack_10b0 = 3;
  local_10a8 = (RhsNested)0x3;
  local_1098 = (Matrix<float,_4,_4,_0,_4,_4> *)0x3;
  uStack_1090 = 3;
  local_1088 = 6;
  local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_888;
  uStack_10a0 = (XprTypeNested)local_698;
  local_de8._0_8_ = (DstEvaluatorType *)&local_8b8;
  unique0x10015356 = &local_1330;
  local_dd8 = &local_c28;
  uStack_dd0 = (SrcXprType *)local_10b8;
  local_8b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_
       = local_10b8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_de8);
  local_68.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_68.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_68.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<float>(&local_8b8,&local_68);
  local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       &fStack_68c;
  local_1078.m_value = 0;
  vStack_1070.m_value = 0;
  uStack_10b0 = CONCAT44(uStack_10b0._4_4_,0xbf800000);
  uStack_1090 = 3;
  local_1088 = 3;
  local_1068 = 4;
  local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.m_value
       = 3;
  local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.m_value
       = 3;
  local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.m_value
       = 3;
  local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.m_value
       = 0;
  local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride = 6;
  local_db8 = 0;
  local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)local_698;
  local_10a8 = &local_8b8;
  local_1098 = &local_888;
  uStack_1080 = &local_888;
  Eigen::internal::
  Assignment<Eigen::Matrix<float,_3,_-1,_0,_3,_4>,_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<float,_3,__1,_0,_3,_4> *)local_de8,(SrcXprType *)local_10b8,
        (assign_op<float,_float> *)&local_c28);
  if ((local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.
       m_value == 3) &&
     (local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.
      m_value == local_db8)) {
    local_c28.m_dst = (DstEvaluatorType *)&local_c08;
    local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = local_1330.
            super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.
            m_data;
    local_c28.m_src = (SrcEvaluatorType *)&local_14e0;
    local_c28.m_functor = (assign_op<float,_float> *)&local_164c;
    local_14e0.data = (float *)local_de8;
    local_c28.m_dstExpr = &local_1330;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run(&local_c28);
    memset((XprTypeNested)local_828,0,0x90);
    uStack_10b0 = 3;
    local_10a8 = (RhsNested)0x3;
    local_1098 = (Matrix<float,_4,_4,_0,_4,_4> *)0x0;
    uStack_1090 = 0;
    local_1088 = 6;
    local_de8._0_8_ = &local_8b8;
    local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
         (PointerType)&local_b8;
    local_10b8 = (undefined1  [8])local_828;
    uStack_10a0 = (XprTypeNested)local_828;
    unique0x10015366 = &local_1330;
    local_dd8 = &local_c28;
    uStack_dd0 = (SrcXprType *)local_10b8;
    local_8b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _0_8_ = (XprTypeNested)local_828;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_de8);
    local_10b8 = (undefined1  [8])auStack_7d4;
    uStack_10b0 = 3;
    local_10a8 = (RhsNested)0x3;
    local_1098 = (Matrix<float,_4,_4,_0,_4,_4> *)0x3;
    uStack_1090 = 3;
    local_1088 = 6;
    local_de8._0_8_ = &local_8b8;
    local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
         (PointerType)&local_b8;
    uStack_10a0 = (XprTypeNested)local_828;
    unique0x1001536e = &local_1330;
    local_dd8 = &local_c28;
    uStack_dd0 = (SrcXprType *)local_10b8;
    local_8b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
    _0_8_ = local_10b8;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_de8);
    local_78.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xc];
    local_78.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xd];
    local_78.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         local_b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xe];
    getSkew<float>(&local_8b8,&local_78);
    local_1078.m_value = 0;
    vStack_1070.m_value = 0;
    uStack_10b0 = CONCAT44(uStack_10b0._4_4_,0xbf800000);
    uStack_1090 = 3;
    local_1088 = 3;
    local_1068 = 4;
    local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.
    m_value = 3;
    local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)local_828;
    local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.
    m_value = 3;
    local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride =
         6;
    local_db8 = 0;
    local_1330.super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
         &fStack_81c;
    local_10a8 = &local_8b8;
    local_1098 = &local_b8;
    uStack_1080 = &local_b8;
    Eigen::internal::
    Assignment<Eigen::Matrix<float,_3,_-1,_0,_3,_4>,_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<float,_3,__1,_0,_3,_4> *)local_de8,(SrcXprType *)local_10b8,
          (assign_op<float,_float> *)&local_c28);
    local_14e0.data = (float *)local_de8;
    if (local_db8 == 3) {
      local_c28.m_dst = (DstEvaluatorType *)&local_c08;
      local_c28.m_src = (SrcEvaluatorType *)&local_14e0;
      local_c28.m_functor = (assign_op<float,_float> *)&local_164c;
      local_c28.m_dstExpr = &local_1330;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
      _0_8_ = &fStack_81c;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run(&local_c28);
      local_13e8 = local_558._4_4_ * (float)auStack_644._36_4_ +
                   (float)local_558 * (float)auStack_644._12_4_ +
                   fStack_55c * local_650 +
                   fStack_560 * (float)local_668 +
                   (float)local_568._4_4_ * (float)uStack_680 +
                   (float)local_568._0_4_ * (float)local_698._0_4_;
      local_1498 = local_558._4_4_ * (float)auStack_644._40_4_ +
                   (float)local_558 * (float)auStack_644._16_4_ +
                   fStack_55c * fStack_64c +
                   fStack_560 * local_668._4_4_ +
                   (float)local_568._4_4_ * uStack_680._4_4_ +
                   (float)local_568._0_4_ * (float)local_698._4_4_;
      fStack_13e0 = local_558._4_4_ * (float)auStack_644._44_4_ +
                    (float)local_558 * (float)auStack_644._20_4_ +
                    fStack_55c * fStack_648 +
                    fStack_560 * fStack_660 +
                    (float)local_568._4_4_ * (float)local_678 +
                    (float)local_568._0_4_ * (float)local_698._8_4_;
      local_1608 = local_558._4_4_ * (float)auStack_644._48_4_ +
                   (float)local_558 * (float)auStack_644._24_4_ +
                   fStack_55c * (float)auStack_644._0_4_ +
                   fStack_560 * fStack_65c +
                   (float)local_568._4_4_ * local_678._4_4_ + (float)local_568._0_4_ * fStack_68c;
      fStack_120c = local_558._4_4_ * (float)auStack_644._52_4_ +
                    (float)local_558 * (float)auStack_644._28_4_ +
                    fStack_55c * (float)auStack_644._4_4_;
      local_1198 = fStack_120c +
                   (float)local_568._4_4_ * fStack_670 + fStack_560 * fStack_658 +
                   (float)local_568._0_4_ * local_688;
      fStack_1214 = fStack_120c + fStack_120c;
      fStack_1210 = fStack_120c +
                    fStack_55c * (float)local_668 + (float)local_558 * local_650 +
                    fStack_560 * (float)uStack_680;
      fStack_120c = fStack_120c +
                    (float)local_558 * local_668._4_4_ + local_558._4_4_ * fStack_64c +
                    fStack_55c * uStack_680._4_4_;
      fStack_c2c = local_558._4_4_ * (float)auStack_644._56_4_ +
                   (float)local_558 * (float)auStack_644._32_4_ +
                   fStack_55c * (float)auStack_644._8_4_;
      local_c38 = fStack_c2c +
                  (float)local_568._4_4_ * fStack_66c + fStack_560 * fStack_654 +
                  (float)local_568._0_4_ * fStack_684;
      fStack_c34 = fStack_c2c + fStack_c2c;
      fStack_c30 = fStack_c2c +
                   fStack_55c * local_668._4_4_ + (float)local_558 * fStack_64c +
                   fStack_560 * uStack_680._4_4_;
      fStack_c2c = fStack_c2c +
                   (float)local_558 * fStack_660 + local_558._4_4_ * fStack_648 +
                   fStack_55c * (float)local_678;
      fVar108 = local_5b8._4_4_ * (float)auStack_7d4._36_4_ +
                (float)local_5b8 * (float)auStack_7d4._12_4_ +
                fStack_5bc * local_7e0 +
                fStack_5c0 * local_7f8 +
                (float)local_5c8._4_4_ * local_810 + (float)local_5c8._0_4_ * (float)local_828._0_4_
      ;
      fVar126 = local_5b8._4_4_ * (float)auStack_7d4._40_4_ +
                (float)local_5b8 * (float)auStack_7d4._16_4_ +
                fStack_5bc * fStack_7dc +
                fStack_5c0 * fStack_7f4 +
                (float)local_5c8._4_4_ * fStack_80c +
                (float)local_5c8._0_4_ * (float)local_828._4_4_;
      fStack_1580 = local_5b8._4_4_ * (float)auStack_7d4._44_4_ +
                    (float)local_5b8 * (float)auStack_7d4._20_4_ +
                    fStack_5bc * fStack_7d8 +
                    fStack_5c0 * fStack_7f0 +
                    (float)local_5c8._4_4_ * fStack_808 +
                    (float)local_5c8._0_4_ * (float)local_828._8_4_;
      fVar131 = local_5b8._4_4_ * (float)auStack_7d4._48_4_ +
                (float)local_5b8 * (float)auStack_7d4._24_4_ +
                fStack_5bc * (float)auStack_7d4._0_4_ +
                fStack_5c0 * fStack_7ec +
                (float)local_5c8._4_4_ * fStack_804 + (float)local_5c8._0_4_ * fStack_81c;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = local_5b8._4_4_ * (float)auStack_7d4._52_4_ +
              (float)local_5b8 * (float)auStack_7d4._28_4_ + fStack_5bc * (float)auStack_7d4._4_4_;
      fVar152 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xb] +
                (float)local_5c8._4_4_ * local_800 + fStack_5c0 * local_7e8 +
                (float)local_5c8._0_4_ * local_818;
      fStack_1434 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xb] +
                    local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xb];
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xb] + fStack_5bc * 0.0 + (float)local_5b8 * 0.0 + fStack_5c0 * 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0xb] + (float)local_5b8 * 0.0 + local_5b8._4_4_ * 0.0 + fStack_5bc * 0.0;
      fStack_149c = (float)auStack_7d4._56_4_ * local_5b8._4_4_ +
                    (float)auStack_7d4._32_4_ * (float)local_5b8 +
                    (float)auStack_7d4._8_4_ * fStack_5bc;
      local_14a8 = fStack_149c +
                   local_7fc * (float)local_5c8._4_4_ + local_7e4 * fStack_5c0 +
                   local_814 * (float)local_5c8._0_4_;
      fStack_14a4 = fStack_149c + fStack_149c;
      fStack_14a0 = fStack_149c + fStack_5bc * 0.0 + (float)local_5b8 * 0.0 + fStack_5c0 * 0.0;
      fStack_149c = fStack_149c + (float)local_5b8 * 0.0 + local_5b8._4_4_ * 0.0 + fStack_5bc * 0.0;
      local_1558 = local_578._4_4_ * (float)auStack_644._36_4_ +
                   (float)local_578 * (float)auStack_644._12_4_ +
                   fStack_57c * local_650 +
                   fStack_580 * (float)local_668 +
                   (float)local_588._4_4_ * (float)uStack_680 +
                   (float)local_588._0_4_ * (float)local_698._0_4_;
      fVar214 = local_578._4_4_ * (float)auStack_644._40_4_ +
                (float)local_578 * (float)auStack_644._16_4_ +
                fStack_57c * fStack_64c +
                fStack_580 * local_668._4_4_ +
                (float)local_588._4_4_ * uStack_680._4_4_ +
                (float)local_588._0_4_ * (float)local_698._4_4_;
      fStack_1550 = local_578._4_4_ * (float)auStack_644._44_4_ +
                    (float)local_578 * (float)auStack_644._20_4_ +
                    fStack_57c * fStack_648 +
                    fStack_580 * fStack_660 +
                    (float)local_588._4_4_ * (float)local_678 +
                    (float)local_588._0_4_ * (float)local_698._8_4_;
      fVar215 = local_578._4_4_ * (float)auStack_644._48_4_ +
                (float)local_578 * (float)auStack_644._24_4_ +
                fStack_57c * (float)auStack_644._0_4_ +
                fStack_580 * fStack_65c +
                (float)local_588._4_4_ * local_678._4_4_ + (float)local_588._0_4_ * fStack_68c;
      fStack_1600 = (float)auStack_644._52_4_ * local_578._4_4_ +
                    (float)auStack_644._28_4_ * (float)local_578 +
                    (float)auStack_644._4_4_ * fStack_57c;
      fStack_dec = local_578._4_4_ * (float)auStack_644._56_4_ +
                   (float)local_578 * (float)auStack_644._32_4_ +
                   fStack_57c * (float)auStack_644._8_4_;
      local_df8 = fStack_dec +
                  (float)local_588._4_4_ * fStack_66c + fStack_580 * fStack_654 +
                  (float)local_588._0_4_ * fStack_684;
      fStack_df4 = fStack_dec + fStack_dec;
      fStack_df0 = fStack_dec +
                   fStack_57c * local_668._4_4_ + (float)local_578 * fStack_64c +
                   fStack_580 * uStack_680._4_4_;
      fStack_dec = fStack_dec +
                   (float)local_578 * fStack_660 + local_578._4_4_ * fStack_648 +
                   fStack_57c * (float)local_678;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = local_5d8._4_4_ * (float)auStack_7d4._36_4_ +
              (float)local_5d8 * (float)auStack_7d4._12_4_ +
              fStack_5dc * local_7e0 +
              fStack_5e0 * local_7f8 +
              (float)local_5e8._4_4_ * local_810 + (float)local_5e8._0_4_ * (float)local_828._0_4_;
      fVar127 = local_5d8._4_4_ * (float)auStack_7d4._40_4_ +
                (float)local_5d8 * (float)auStack_7d4._16_4_ +
                fStack_5dc * fStack_7dc +
                fStack_5e0 * fStack_7f4 +
                (float)local_5e8._4_4_ * fStack_80c +
                (float)local_5e8._0_4_ * (float)local_828._4_4_;
      fVar130 = local_5d8._4_4_ * (float)auStack_7d4._44_4_ +
                (float)local_5d8 * (float)auStack_7d4._20_4_ +
                fStack_5dc * fStack_7d8 +
                fStack_5e0 * fStack_7f0 +
                (float)local_5e8._4_4_ * fStack_808 +
                (float)local_5e8._0_4_ * (float)local_828._8_4_;
      fVar132 = local_5d8._4_4_ * (float)auStack_7d4._48_4_ +
                (float)local_5d8 * (float)auStack_7d4._24_4_ +
                fStack_5dc * (float)auStack_7d4._0_4_ +
                fStack_5e0 * fStack_7ec +
                (float)local_5e8._4_4_ * fStack_804 + (float)local_5e8._0_4_ * fStack_81c;
      fStack_10fc = local_5d8._4_4_ * (float)auStack_7d4._52_4_ +
                    (float)local_5d8 * (float)auStack_7d4._28_4_ +
                    fStack_5dc * (float)auStack_7d4._4_4_;
      fVar62 = fStack_10fc +
               (float)local_5e8._4_4_ * local_800 + fStack_5e0 * local_7e8 +
               (float)local_5e8._0_4_ * local_818;
      fStack_1104 = fStack_10fc + fStack_10fc;
      fStack_1100 = fStack_10fc + fStack_5dc * 0.0 + (float)local_5d8 * 0.0 + fStack_5e0 * 0.0;
      fStack_10fc = fStack_10fc + (float)local_5d8 * 0.0 + local_5d8._4_4_ * 0.0 + fStack_5dc * 0.0;
      fVar128 = (float)auStack_7d4._56_4_ * local_5d8._4_4_;
      fVar190 = local_598._4_4_ * (float)auStack_644._36_4_ +
                (float)local_598 * (float)auStack_644._12_4_ +
                fStack_59c * local_650 +
                fStack_5a0 * (float)local_668 +
                (float)local_5a8._4_4_ * (float)uStack_680 +
                (float)local_5a8._0_4_ * (float)local_698._0_4_;
      fStack_1244 = local_598._4_4_ * (float)auStack_644._40_4_ +
                    (float)local_598 * (float)auStack_644._16_4_ +
                    fStack_59c * fStack_64c +
                    fStack_5a0 * local_668._4_4_ +
                    (float)local_5a8._4_4_ * uStack_680._4_4_ +
                    (float)local_5a8._0_4_ * (float)local_698._4_4_;
      fVar192 = local_598._4_4_ * (float)auStack_644._44_4_ +
                (float)local_598 * (float)auStack_644._20_4_ +
                fStack_59c * fStack_648 +
                fStack_5a0 * fStack_660 +
                (float)local_5a8._4_4_ * (float)local_678 +
                (float)local_5a8._0_4_ * (float)local_698._8_4_;
      fStack_340 = local_598._4_4_ * (float)auStack_644._48_4_ +
                   (float)local_598 * (float)auStack_644._24_4_ +
                   fStack_59c * (float)auStack_644._0_4_ +
                   fStack_5a0 * fStack_65c +
                   (float)local_5a8._4_4_ * local_678._4_4_ + (float)local_5a8._0_4_ * fStack_68c;
      fStack_b0c = (float)auStack_644._52_4_ * local_598._4_4_ +
                   (float)auStack_644._28_4_ * (float)local_598 +
                   (float)auStack_644._4_4_ * fStack_59c;
      fVar36 = fStack_b0c +
               fStack_670 * (float)local_5a8._4_4_ + fStack_658 * fStack_5a0 +
               local_688 * (float)local_5a8._0_4_;
      fStack_d80 = fStack_b0c + fStack_b0c;
      fStack_b10 = fStack_b0c +
                   (float)local_668 * fStack_59c + local_650 * (float)local_598 +
                   (float)uStack_680 * fStack_5a0;
      fStack_b0c = fStack_b0c +
                   local_668._4_4_ * (float)local_598 + fStack_64c * local_598._4_4_ +
                   uStack_680._4_4_ * fStack_59c;
      fStack_122c = local_598._4_4_ * (float)auStack_644._56_4_ +
                    (float)local_598 * (float)auStack_644._32_4_ +
                    fStack_59c * (float)auStack_644._8_4_;
      fVar37 = fStack_122c +
               (float)local_5a8._4_4_ * fStack_66c + fStack_5a0 * fStack_654 +
               (float)local_5a8._0_4_ * fStack_684;
      fStack_1234 = fStack_122c + fStack_122c;
      fStack_1230 = fStack_122c +
                    fStack_59c * local_668._4_4_ + (float)local_598 * fStack_64c +
                    fStack_5a0 * uStack_680._4_4_;
      fStack_122c = fStack_122c +
                    (float)local_598 * fStack_660 + local_598._4_4_ * fStack_648 +
                    fStack_59c * (float)local_678;
      local_14f8 = (float)auStack_7d4._36_4_ * local_5f8._4_4_ +
                   (float)local_5f8 * (float)auStack_7d4._12_4_ +
                   fStack_5fc * local_7e0 +
                   fStack_600 * local_7f8 +
                   (float)local_608._4_4_ * local_810 +
                   (float)local_608._0_4_ * (float)local_828._0_4_;
      fStack_1544 = (float)auStack_7d4._40_4_ * local_5f8._4_4_ +
                    (float)local_5f8 * (float)auStack_7d4._16_4_ +
                    fStack_5fc * fStack_7dc +
                    fStack_600 * fStack_7f4 +
                    (float)local_608._4_4_ * fStack_80c +
                    (float)local_608._0_4_ * (float)local_828._4_4_;
      fStack_1620 = (float)auStack_7d4._44_4_ * local_5f8._4_4_ +
                    (float)local_5f8 * (float)auStack_7d4._20_4_ +
                    fStack_5fc * fStack_7d8 +
                    fStack_600 * fStack_7f0 +
                    (float)local_608._4_4_ * fStack_808 +
                    (float)local_608._0_4_ * (float)local_828._8_4_;
      fStack_14ec = (float)auStack_7d4._48_4_ * local_5f8._4_4_ +
                    (float)local_5f8 * (float)auStack_7d4._24_4_ +
                    fStack_5fc * (float)auStack_7d4._0_4_ +
                    fStack_600 * fStack_7ec +
                    (float)local_608._4_4_ * fStack_804 + (float)local_608._0_4_ * fStack_81c;
      fStack_15f4 = local_7e8 * fStack_600 + local_800 * (float)local_608._4_4_ +
                    local_818 * (float)local_608._0_4_;
      fVar169 = fStack_5dc * (float)auStack_7d4._8_4_ +
                fVar128 + (float)auStack_7d4._32_4_ * (float)local_5d8 +
                local_7e4 * fStack_5e0 + (float)local_5e8._4_4_ * local_7fc +
                (float)local_5e8._0_4_ * local_814;
      auVar53._4_4_ = fStack_5fc;
      auVar53._0_4_ = fStack_5fc;
      auVar53._8_4_ = fStack_5fc;
      auVar53._12_4_ = fStack_5fc;
      auVar6._4_8_ = auVar53._8_8_;
      auVar6._0_4_ = fVar126;
      auVar54._0_8_ = auVar6._0_8_ << 0x20;
      auVar54._8_4_ = fStack_1580;
      auVar54._12_4_ = fVar131;
      local_1648._8_4_ = fStack_1580;
      local_1648._0_8_ = auVar54._8_8_;
      local_1648._12_4_ = fVar131;
      auVar25._4_4_ = fVar214;
      auVar25._0_4_ = local_1558;
      auVar25._8_4_ = fStack_1550;
      auVar25._12_4_ = fVar215;
      fVar38 = local_13e8 + local_13e8;
      fVar109 = fVar38 * (fStack_1600 +
                         fStack_670 * (float)local_588._4_4_ + fStack_658 * fStack_580 +
                         local_688 * (float)local_588._0_4_);
      fStack_1604 = -fStack_1214;
      fVar63 = local_1608 + local_1608;
      local_1618._4_4_ = -(local_1198 * local_1558);
      fVar110 = local_13e8 * fVar214;
      fStack_1154 = fVar63 * fStack_1550;
      auVar95._4_4_ = fStack_1154;
      auVar95._0_4_ = fVar110;
      fStack_1150 = fStack_13e0 * fStack_1550;
      fStack_114c = local_1608 * fVar215;
      auVar95._8_4_ = fStack_1150;
      auVar95._12_4_ = fStack_114c;
      local_6b8 = fStack_1580 * fVar110 * fVar192;
      local_8c8 = fVar126 * fStack_1154 * fVar192;
      local_6a8 = fVar62 * local_6b8;
      local_6b8 = fVar130 * local_6b8;
      fStack_6b4 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd] * local_8c8;
      fStack_6b0 = fVar130 * fStack_1580 * fStack_1150 * fVar192;
      fStack_6ac = fVar132 * fVar131 * fStack_114c * fVar192;
      local_8c8 = -local_8c8;
      auVar7._4_8_ = auVar95._8_8_;
      auVar7._0_4_ = local_1498;
      auVar96._0_8_ = auVar7._0_8_ << 0x20;
      auVar96._8_4_ = fStack_13e0;
      auVar96._12_4_ = local_1608;
      auVar8._4_8_ = auVar96._8_8_;
      auVar8._0_4_ = local_1498;
      auVar97._0_8_ = auVar8._0_8_ << 0x20;
      auVar97._8_4_ = fStack_13e0;
      auVar97._12_4_ = local_1608;
      stack0xffffffffffffecb0 = 0;
      local_1358._0_8_ = auVar97._8_8_;
      fVar39 = fStack_13e0 * fVar215;
      fVar153 = local_1198 + local_1198;
      fVar165 = local_1498 + local_1498;
      fStack_204 = fVar165 * fStack_1550;
      fVar59 = (fStack_1210 + fStack_1210) * fStack_1550;
      fVar61 = (fStack_120c + fStack_120c) * fVar215;
      fVar111 = fVar131 * fStack_204 * fVar192;
      fVar154 = fVar127 * fVar111;
      local_c8 = fVar39 * fVar192 * fVar126 *
                 local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xd];
      fVar201 = local_1608 * 4.0;
      fVar202 = local_1498 * fStack_1550;
      fStack_9d4 = -fVar201 * fStack_1550;
      fStack_9d0 = local_1498 * fStack_1550;
      fStack_9cc = local_1498 * fStack_1550;
      fVar98 = local_1498 * local_df8;
      fVar206 = fStack_13e0 + fStack_13e0;
      fStack_cc4 = local_c38 + local_c38;
      fStack_cc0 = local_1608 + local_1608;
      fStack_cbc = fStack_c34 + fStack_c34;
      fStack_1364 = fVar206 * local_df8;
      fVar102 = (fStack_1210 + fStack_1210) * local_df8;
      fVar105 = (fStack_120c + fStack_120c) * local_df8;
      fVar173 = fVar165 * local_1558;
      local_bc8 = fStack_13e0 * local_df8;
      uStack_bc0 = 0;
      uStack_bbc = 0;
      fVar40 = fVar63 * local_1558 * fVar192;
      fVar166 = local_1608 * fStack_1550;
      fStack_12b4 = fVar165 * fVar215;
      fStack_12b0 = fStack_13e0 * fStack_1550;
      fStack_12ac = local_1608 * fVar215;
      fStack_e00 = fStack_1550;
      local_e08 = auVar25._8_8_;
      fStack_dfc = fVar215;
      fVar112 = fVar206 * local_1558;
      fVar64 = fStack_1550 * fVar206;
      fVar99 = local_1558 * fStack_cc4;
      fStack_1b4 = local_c38 * fStack_1550;
      local_928 = fVar64 * fVar192;
      fStack_924 = fVar99 * fVar192;
      fStack_920 = fStack_1550 * fStack_cc0 * fVar192;
      fStack_91c = fVar215 * fStack_cbc * fVar192;
      fVar181 = fVar173 * fVar192;
      fVar65 = fVar192 * fVar153 * fVar214;
      fVar103 = fVar192 * fVar59;
      fVar106 = fStack_d80 * fVar61;
      fStack_1010 = fStack_1580 * fVar36 * fStack_204;
      fVar113 = fVar38 * local_1558 * fVar192;
      fVar114 = fVar132 * fStack_1580 * fVar113;
      local_348 = fStack_340 * -fVar173 * fStack_1580 * fVar130;
      fStack_344 = -fVar114;
      fStack_33c = -fVar132;
      fVar193 = fVar173 * fVar36 * fStack_1580 * fVar130;
      fVar115 = local_13e8 * 4.0;
      local_378 = fVar115 * local_1558 * fVar192;
      fVar185 = fVar115 * fStack_1550;
      fVar194 = fStack_204 * fVar190;
      fVar197 = -fVar185 * fStack_1244;
      local_1538 = fVar194 * fStack_1580;
      fStack_a40 = -(fVar185 * fVar190) * fVar152;
      fStack_1530 = fStack_204 * fVar192 * fVar126;
      fStack_152c = fStack_204 * fStack_340 * fStack_1434;
      fVar170 = fStack_204 * fStack_340 * fStack_1580;
      local_6c8 = fVar130 * -(local_1608 * local_1558) * fVar192 * fVar108;
      fStack_6c4 = fVar127 * fVar170;
      fStack_6c0 = fVar130 * fVar59 * fVar192 * fStack_1580;
      fStack_6bc = fVar132 * fVar61 * fStack_340 * fVar131;
      fStack_330 = -fStack_6c4;
      fStack_32c = -fStack_6c4;
      local_338 = fVar115 * local_1608 * fVar192 * fStack_1580 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      fVar116 = fStack_13e0 * 4.0;
      fVar66 = fVar116 * local_1558;
      fVar59 = fVar66 * fVar190 * fVar108;
      fStack_914 = fVar110 * fStack_1244 * fStack_1580;
      local_6d8 = fVar62 * fVar59;
      fStack_6d4 = fVar62 * fStack_914;
      fStack_6d0 = fVar62 * fStack_1150 * fVar192 * fStack_1580;
      fStack_6cc = fVar62 * fStack_114c * fStack_340 * fVar131;
      local_318 = -(fStack_914 * fVar130);
      fStack_310 = -fStack_914;
      fStack_30c = -fStack_914;
      fStack_314 = -fVar59 * fVar130;
      fVar117 = local_1498 * local_1558;
      fStack_1004 = fVar116 * fVar214;
      fStack_1000 = local_1498 * fStack_1550;
      fStack_ffc = local_1498 * fVar215;
      fVar186 = local_1198 * fStack_1550;
      fStack_cd4 = fVar201 * local_1558 * fVar192;
      fStack_cf4 = fVar36 * fVar66;
      fStack_cf0 = fVar192 * fStack_1000;
      fStack_cec = fStack_d80 * fStack_ffc;
      fVar67 = fVar153 * fStack_1550;
      fVar68 = fVar67 * fVar192 * fVar108;
      fVar155 = fVar127 * fVar68;
      fStack_964 = fVar190 * fStack_9d4;
      fStack_960 = fVar192 * fStack_9d0;
      fStack_95c = fStack_340 * fStack_9cc;
      local_ca8 = fVar152 * fVar192 * fVar202;
      local_968 = fVar192 * fVar202 * fStack_1580;
      local_d8 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xd] * local_968;
      local_978 = CONCAT44(local_d8,fVar155) ^ 0x8000000000000000;
      fVar100 = fVar126 * fVar186 * fVar192;
      local_108 = local_1498 * local_1608 * fVar190 * fStack_1580 * fVar127;
      fVar207 = local_1498 * 4.0;
      fVar118 = -(local_1198 * 4.0);
      fVar134 = fStack_13e0 * fVar214;
      fVar135 = fVar134 * fVar192;
      local_118 = fVar126 * fVar135 * fVar62;
      fVar59 = local_1558 * -fVar207 * fVar192;
      local_358 = fVar131 * fVar59;
      fVar167 = fVar59 * fStack_1580 * fVar62;
      local_2d8 = CONCAT44(fVar167,local_118) ^ 0x80000000;
      local_e38 = fStack_13e0 * fStack_1550;
      uStack_e30 = 0;
      uStack_e2c = 0;
      fVar136 = local_e38 * fStack_1244;
      local_938 = fVar127 * fVar108 * fVar136;
      local_1758 = fVar207 * fVar214 * fVar192;
      fVar195 = fStack_1580 * local_1758 * fVar132;
      local_2c8 = CONCAT44(fVar195,local_938) ^ 0x80000000;
      fVar148 = fVar207 * fStack_1550;
      fStack_1240 = fStack_1210 * fStack_1550;
      fStack_123c = fStack_120c * fVar215;
      fVar209 = fStack_13e0 * local_1608;
      fVar198 = fVar166 * fVar192 * fVar108;
      fVar200 = fStack_12b4 * fVar192 * fStack_1580;
      local_748 = fVar127 * fVar198;
      fStack_744 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd] * fVar200;
      fStack_740 = fVar130 * fStack_12b0 * fVar192 * fStack_1580;
      fStack_73c = fVar132 * fStack_12ac * fVar192 * fVar131;
      fVar137 = fVar192 * fVar63 * fVar214;
      fVar69 = fVar38 * fStack_1550;
      local_308 = fVar126 * fVar64 * fVar36;
      local_1578._4_4_ = -(fVar64 * fVar36);
      fVar70 = fVar38 * fVar214;
      fVar59 = fVar192 * fVar70;
      fVar71 = fStack_13e0 * local_1558;
      local_128 = fVar70 * fVar37;
      fVar61 = fVar206 * fVar214;
      fStack_e64 = local_c38 * fVar214;
      fVar187 = fVar61 * fVar192;
      local_328 = fVar108 * fVar187;
      fStack_d04 = fVar61 * fVar36;
      fStack_af4 = fVar215 * fVar206;
      fVar211 = -fVar134;
      fVar119 = fVar165 * fVar214 * fVar192;
      fVar133 = -local_1608 * fStack_340;
      local_188 = fVar152 * fVar119;
      local_508 = fVar190 * fVar214 * local_1498;
      local_1758 = -local_1758;
      fVar41 = fVar40 * fVar126 * fVar130;
      fVar55 = local_1618._4_4_ * fVar192 * fVar126 * fVar130;
      fStack_1610 = (float)local_828._8_4_ * fVar192 * fVar126 * fVar130;
      fStack_160c = fStack_81c * fVar192 * fVar126 * fVar130;
      local_1618 = CONCAT44(fVar55,fVar41);
      local_c88 = -fVar38 * local_df8 * fVar192 * fStack_1580 * fVar130;
      fStack_c84 = fVar98 * fVar192 * fStack_1580 * fVar130;
      fStack_c80 = fStack_13e0 * local_df8 * fVar192 * fStack_1580 * fVar130;
      fStack_c7c = local_1608 * local_df8 * fVar192 * fStack_1580 * fVar130;
      local_958 = fVar131 * fVar119 * fVar130;
      fStack_954 = fVar108 * fVar211 * fStack_340 * fVar130;
      fStack_950 = fStack_1580 * fVar165 * fVar192 * fVar130;
      fStack_94c = fVar131 * fVar133 * fVar130;
      local_11d8 = fVar65 * fVar108 * fVar130;
      fStack_11d4 = -(local_13e8 * local_df8) * fStack_1244 * fStack_1580 * fVar130;
      fStack_11d0 = fVar103 * fStack_1580 * fVar130;
      fStack_11cc = fVar106 * fVar131 * fVar130;
      fVar205 = -fStack_1004;
      fVar174 = fVar192 * -fVar117;
      local_9e8 = fStack_1580 * fVar174;
      fStack_1514 = fStack_1154 * fStack_1244 * fVar108;
      local_b08 = fVar69 * fVar36 * fStack_1580;
      fVar42 = fStack_1580 * fStack_1244 * fVar117 * fVar130;
      fStack_d14 = fVar108 * fStack_cf4 * fVar130;
      fStack_d10 = fStack_1580 * fStack_cf0 * fVar130;
      fStack_d0c = fVar131 * fStack_cec * fVar130;
      fVar43 = fStack_1004 * fStack_1244 * fVar126;
      local_9a8 = fVar130 * fVar43;
      fVar138 = fStack_1580 * fVar59;
      local_4f8 = fVar62 * fVar138;
      local_158 = fVar138 * fVar130;
      fStack_154 = fVar108 * -fVar112 * fVar37 * fVar130;
      fStack_150 = fStack_1580 * fVar192 * local_1498 * fVar130;
      fStack_14c = fVar131 * fVar192 * fStack_1234 * fVar130;
      local_908 = fStack_1580 * -(fVar165 * local_df8) * fVar192 * fVar130;
      fStack_904 = fVar126 * local_bc8 * fVar192 * fVar130;
      fStack_900 = fStack_1580 * -fStack_1364 * fVar192 * fVar130;
      fStack_8fc = fVar131 * local_1608 * fVar192 * fVar130;
      local_138 = fVar165 * local_df8 * fVar190 * fStack_1580 * fVar130;
      fStack_134 = fStack_1364 * fVar190 * fVar108 * fVar130;
      fStack_130 = fVar102 * fVar190 * fStack_1580 * fVar130;
      fStack_12c = fVar105 * fVar190 * fVar131 * fVar130;
      local_1228 = fStack_1580 * fStack_1244 * -fVar38 * local_df8 * fVar130;
      fStack_1224 = fVar126 * fStack_d04 * fVar130;
      fStack_1220 = fStack_1580 * fVar192 * fVar98 * fVar130;
      fStack_121c = fVar131 * fStack_340 * fStack_d80 * fVar130;
      local_368 = fVar132 * -fVar187 * fVar126;
      fStack_8f4 = -fVar187 * fVar126 * fVar130;
      fStack_8f0 = local_c38 * local_1558 * fStack_1244 * fStack_1580 * fVar130;
      fStack_f0 = -fStack_e64 * fStack_1580 * fVar130;
      fStack_ec = fStack_c34 * fVar131 * fVar130;
      local_e8 = -fVar61 * fVar37 * fVar126 * fVar130;
      fStack_e4 = -fStack_e64 * fVar190 * fStack_1580 * fVar130;
      fStack_e0 = -(fStack_cc4 * fVar214) * fStack_1230 * fStack_1580 * fVar130;
      fStack_dc = -(fStack_c34 * fVar214) * fStack_122c * fVar131 * fVar130;
      fStack_1134 = local_1558 * fVar153 * fVar192;
      fVar104 = fVar71 * fVar192;
      fVar107 = fStack_204 * fStack_1244;
      local_9b8 = fStack_1134 * fVar108 * fVar130;
      fStack_9b4 = fVar190 * fVar205 * fVar126 * fVar130;
      fStack_9b0 = fVar104 * fStack_1580 * fVar130;
      fStack_9ac = fVar107 * fVar131 * fVar130;
      fVar101 = fVar190 * fVar173 * fStack_1580;
      fStack_d84 = fVar181 * fVar152 * fVar130;
      fStack_d7c = fVar131 * fVar113 * fVar130;
      fStack_750 = fStack_9d0 * fVar192 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10] * fVar130;
      fStack_74c = fStack_9cc * fVar192 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xb] * fVar130;
      local_9c8 = fVar130 * fStack_340 * fVar117 * fStack_1580;
      fStack_9c4 = fVar62 * fVar101;
      fStack_9c0 = fVar130 * fVar192 * fStack_1000 * fStack_1580;
      fStack_9bc = fStack_1104 * fStack_340 * fStack_ffc * fStack_1580;
      local_1128 = -fVar101;
      fVar203 = fStack_1004 * fVar36 * fVar126 * fVar130;
      uStack_970 = CONCAT44(fStack_1004,fVar203);
      auVar17._4_4_ = fVar127;
      auVar17._0_4_ =
           local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd];
      auVar17._8_4_ = fVar130;
      auVar16._12_4_ = fVar132;
      auVar16._0_12_ = auVar17;
      local_1f8._4_12_ = auVar16._4_12_;
      local_a08 = fVar67 * fVar190 * fVar126;
      local_1f8._0_4_ =
           local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] * local_a08;
      local_a08 = -local_a08;
      fVar168 = local_1198 * 4.0 * fStack_1550;
      fVar44 = fVar112 * fVar192;
      fVar45 = fVar64 * fVar190;
      fVar72 = fVar108 * fVar45;
      local_3b8 = fVar108 * fVar64 * fStack_340;
      local_478._0_4_ =
           local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] * fVar152 * fVar194;
      local_478._4_12_ = local_1f8._4_12_;
      fStack_254 = -(fVar152 * fVar194);
      fStack_24c = -fStack_1434;
      fVar139 = fVar206 * local_1608;
      local_258 = fVar108 * fVar139 * fStack_1244;
      local_228 = fVar131 * fVar148 * fStack_1244;
      fStack_224 = fVar126 * fVar63 * local_1558 * fStack_1244;
      fStack_220 = fStack_1580 * fVar148 * fStack_1244;
      fStack_21c = fVar131 * fVar148 * fStack_1244;
      local_248 = fVar108 * fVar139 * fVar192;
      local_14d8 = auVar17._4_8_;
      fStack_14d0 = fVar130;
      fStack_14cc = fVar132;
      local_1d8 = fVar127 * fVar108 * fVar168 * fStack_1244;
      fStack_1d4 = fVar130 * fVar108 * -fVar44;
      fStack_1d0 = fVar130 * fVar108 * 0.0;
      fStack_1cc = fVar132 * fVar108 * -fStack_cc4;
      fVar171 = fVar62 * fVar108 * -fVar44;
      fVar73 = fVar165 * fVar214 * fVar190;
      local_488 = fVar131 * fVar73 * fVar130;
      fVar175 = fVar131 * fVar59 * fVar130;
      fStack_484 = -fVar175;
      fStack_47c = -fVar131;
      fStack_15e4 = -fVar45;
      fVar74 = local_e38 * fVar192;
      local_10c8 = -(fVar126 * fVar74);
      local_10b8 = (undefined1  [8])(CONCAT44(fStack_cc4,fVar126) ^ 0x80000000);
      fVar120 = -(fStack_cc4 * fStack_1550);
      fStack_11fc = -fStack_cc4;
      uStack_3e0 = auVar16._8_8_;
      local_3e8 = CONCAT44(fVar126,fVar126) ^ 0x80000000;
      auVar78 = _local_3e8;
      local_1a8 = fVar110 * fVar36 * fStack_1580 * fVar130;
      fVar75 = fVar108 * fVar112 * fVar190;
      fVar176 = fVar112 * fVar190 * fVar126;
      local_468 = fVar130 * fVar176;
      local_448 = fVar62 * fVar176;
      local_438 = CONCAT44(fVar176 * fVar132,local_1a8) ^ 0x80000000;
      fVar177 = fVar116 * fVar215 * fVar190 * fVar108 * fVar127;
      local_1c8 = fStack_1580 * local_508 * fVar62;
      local_408 = CONCAT44(fVar177,local_1c8) ^ 0x80000000;
      _local_3f8 = CONCAT44(local_1608,-fVar131);
      fVar191 = fVar119 * fStack_1580 * fVar132;
      fVar178 = fVar211 * fVar190;
      fVar182 = fVar69 * fStack_1244;
      fVar184 = -local_1608 * fVar192;
      fVar149 = fStack_1580 * fVar182;
      local_e78 = fVar126 * fVar178 * fVar62;
      fStack_e74 = fVar149 * fVar127;
      fStack_e70 = fStack_1580 * fVar184 * fStack_1100;
      fStack_e6c = fVar131 * local_1498 * fStack_340 * fStack_10fc;
      local_10e8 = fVar119 * fStack_1580 * fVar62;
      fStack_10e4 = -(fStack_af4 * fVar192) * fVar108 * fVar127;
      fStack_10e0 = fVar165 * fVar192 * fStack_1580 * fStack_1100;
      fStack_10dc = fVar133 * fVar131 * fStack_10fc;
      fVar140 = fVar214 * local_1498 * fVar192;
      local_af8 = fStack_af4 * fStack_1244;
      local_3c8 = fVar127 * fVar108 * local_af8;
      local_6e8 = fVar62 * -fVar140 * fStack_1580;
      fStack_6e4 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd] * -(fVar108 * local_af8);
      fStack_6e0 = fStack_1100 * -fStack_af4;
      fStack_6dc = fStack_10fc * -fVar126;
      fVar76 = fVar61 * fVar190;
      local_428 = fVar108 * fVar76;
      local_768 = fVar126 * fVar76;
      fVar172 = fVar126 * fVar67 * fStack_1244;
      fVar212 = fVar126 * fVar64 * fStack_1244;
      fVar179 = -(fVar64 * fStack_1244);
      local_3d8 = fVar108 * fVar179;
      fStack_1204 = fVar120 * fStack_1244 * fStack_1580;
      local_1208 = fStack_cc4 * fStack_1550 * fVar192 * fStack_1580;
      local_148 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd] * local_1208;
      local_1208 = -local_1208;
      fStack_1200 = -fStack_cc4;
      fStack_1044 = fVar127 * local_b08;
      fStack_1040 = fVar127 * local_1578._4_4_ * fVar108;
      fVar77 = local_13e8 * fStack_1550;
      fStack_a74 = fVar38 * fVar215;
      fStack_a70 = fStack_13e0 * fStack_1550;
      fStack_a6c = local_1608 * fVar215;
      fStack_b04 = fVar131 * fVar77 * fVar192;
      local_708 = fVar127 * fStack_b04;
      local_738 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd] * fVar126 * fStack_1154 * fStack_1244;
      fStack_734 = fVar127 * fVar100;
      fStack_730 = fVar130 * fVar126 * fStack_1150 * fVar192;
      fStack_72c = fVar132 * fVar126 * fStack_114c * fStack_340;
      local_c48 = fVar108 * fVar39 * fVar192 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      fStack_c44 = -fVar111 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_c40 = fVar126 * local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array[0xd];
      fStack_c3c = -fVar131 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fVar198 = fVar198 * local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xd];
      fVar170 = fVar170 * local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xd];
      fVar183 = fStack_15e4 * fVar126 *
                local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd];
      fVar111 = -(local_e38 * fVar37) * fVar126 *
                local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd];
      fVar56 = fVar190 * fVar120 * fStack_1580 *
               local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xd];
      fStack_1250 = fStack_1580 * 0.0 *
                    local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xd];
      fStack_124c = fVar131 * 0.0 *
                    local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xd];
      _local_1258 = CONCAT44(fVar56,fVar111);
      local_788 = fVar39 * fStack_1244 * fVar108 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      fStack_784 = fVar107 * fVar131 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_780 = fVar104 * fStack_1580 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_77c = fVar107 * fVar131 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fVar119 = local_13e8 * fVar215 * fVar192 * fStack_1580 *
                local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd];
      fVar57 = fVar109 * fStack_1244 * fStack_1580 *
               local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xd];
      fStack_1280 = fStack_1280 *
                    local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xd];
      fStack_127c = fStack_127c *
                    local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xd];
      _local_1288 = CONCAT44(fVar57,fVar119);
      local_b08 = local_b08 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      fStack_b04 = fStack_b04 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_b00 = local_1498 * fStack_1580 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_afc = -fVar99 * fVar131 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      local_6f8 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd] * fVar202 * fVar36 * fStack_1580;
      fStack_6f4 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd] * fStack_1514;
      fStack_6f0 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd] * fStack_9d0 * fStack_b10 * fStack_1580;
      fStack_6ec = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd] * fStack_9cc * fStack_b0c * fVar131;
      local_a68 = fVar108 * fVar67 * fVar190 * fVar127;
      fStack_9a4 = -local_a68;
      fStack_99c = -fVar126;
      local_298 = CONCAT44(fStack_11d4,local_11d8) ^ 0x8000000080000000;
      fVar180 = local_e38 * fVar190;
      fVar120 = fVar61 * fStack_1244;
      fStack_22c = fVar126 * fVar120;
      fVar196 = fVar120 * fVar108;
      local_778 = fVar130 * fVar196;
      local_458 = fVar132 * fVar196;
      uStack_290 = CONCAT44(fVar120,-fVar196 * fVar62) ^ 0x8000000000000000;
      local_eb8 = (float)local_608._4_4_ * local_7fc + local_7e4 * fStack_600 +
                  local_814 * (float)local_608._0_4_ +
                  local_5f8._4_4_ * (float)auStack_7d4._56_4_ +
                  (float)auStack_7d4._32_4_ * (float)local_5f8 +
                  fStack_5fc * (float)auStack_7d4._8_4_;
      fStack_eb4 = fVar169 + fVar72;
      fStack_eb0 = fStack_5fc * 0.0 + 0.0 + 0.0 + local_5f8._4_4_;
      fStack_eac = (float)local_5f8 * 0.0 + fVar128 + fVar128 + 0.0 + fVar126;
      fStack_f4c = fVar72 * fVar169;
      fVar120 = fStack_1580 * fVar69 * fVar192;
      local_268._0_4_ =
           local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] * fVar120;
      local_268._4_12_ = local_1f8._4_12_;
      local_9d8 = fVar202 * fVar37 * fStack_1580 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      fVar120 = -fVar120 * fVar169;
      uVar34 = CONCAT44(local_9d8,fVar120) ^ 0x8000000000000000;
      local_2f8 = fVar108 * fVar139 * fVar190;
      fStack_270 = fVar139 * fVar190 * fVar126;
      local_2e8._0_4_ =
           local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] * fStack_270;
      local_2e8._4_12_ = local_1f8._4_12_;
      fStack_270 = fStack_270 * fVar127;
      local_418._0_4_ =
           local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] * fVar212;
      local_418._4_12_ = local_1f8._4_12_;
      local_1368 = fStack_1364 * fVar192;
      fVar156 = fVar126 * local_1368 * fVar130;
      fVar212 = fVar212 * fVar169;
      local_168 = CONCAT44(fVar212,fVar156);
      local_e68 = fStack_e64 * fVar192 * fStack_1580 * fVar130;
      uStack_160 = CONCAT44(fStack_e64,local_e68) ^ 0x8000000080000000;
      auStack_7d4._60_4_ =
           local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] * fVar149;
      auStack_7d4._64_12_ = local_1f8._4_12_;
      fStack_a30 = -fVar149;
      local_728 = fVar127 * local_14a8 * fVar180;
      fStack_724 = fVar130 * fStack_22c;
      fStack_720 = fVar130 * fStack_14a0 * fVar61 * fVar192;
      fStack_71c = fVar132 * fStack_149c * fVar61 * fStack_340;
      local_238 = fStack_22c * fVar62;
      fStack_234 = fStack_22c * fStack_1104;
      fStack_230 = fStack_22c * fStack_1100;
      fStack_22c = fStack_22c * fStack_10fc;
      fStack_a34 = -local_238;
      fStack_a2c = -fStack_234;
      local_a38 = -fVar149 * fVar169;
      fVar128 = local_13e8 * local_1558 * fStack_1244;
      fVar133 = fVar71 * fStack_1244;
      fStack_12a4 = -fStack_1214;
      fStack_12a0 = -fStack_1210;
      fStack_129c = -fStack_120c;
      local_198 = local_bc8 * fStack_1244;
      uStack_190 = 0;
      uStack_18c = 0;
      fVar38 = fVar38 * local_1558 * fStack_1244;
      fStack_e14 = -fStack_12b4;
      fStack_e10 = -fStack_12b0;
      fStack_e0c = -fStack_12ac;
      fStack_cb4 = -local_1608;
      uStack_cb0 = 0x80000000;
      uStack_cac = 0x80000000;
      local_a18 = fVar116 * fVar215 * fStack_1244;
      uStack_a10 = 0;
      uStack_a0c = 0;
      local_cb8 = -fVar116 * local_1608 * fStack_1244;
      local_2a8 = fStack_9d4 * fStack_1244;
      local_cc8 = fVar112 * fStack_1244;
      fVar60 = -((float)local_5f8 * (float)auStack_7d4._28_4_) * fStack_1244;
      fVar149 = fVar131 * fVar194 * fVar127;
      local_718._0_4_ =
           local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] * local_ca8;
      local_718._4_12_ = local_1f8._4_12_;
      local_ca8 = local_ca8 * fVar127;
      fStack_ca4 = fVar126 * fStack_964 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_ca0 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10] * fStack_960 * fVar130;
      fStack_c9c = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xb] * fStack_95c * fVar132;
      local_b78 = fVar197 * fVar152 * fVar127;
      fStack_b74 = -(fVar64 * fStack_340) * fVar126 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_b70 = fVar197 * local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array[10] * fVar130;
      fStack_b6c = fVar197 * local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array[0xb] * fVar132;
      fVar141 = fVar69 * fStack_340 * fStack_1580;
      local_fb8 = fVar141 * fVar127;
      fStack_fb4 = -fVar77 * fStack_1244 * fVar131 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_fb0 = fVar60 * fStack_1580 * fVar130;
      fStack_fac = -fStack_a74 * fStack_1244 * fVar131 * fVar132;
      local_4c8 = fVar127 * local_1538;
      fStack_4c4 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd] * fStack_a40;
      fStack_4c0 = fVar130 * fStack_1530;
      fStack_4bc = fVar132 * fStack_152c;
      local_10c8 = local_10c8 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fVar58 = fVar139 * fStack_1244 * fVar126 * fVar127;
      fStack_10c0 = fStack_204 * fVar192 * fVar130;
      fStack_10bc = fStack_204 * fStack_340 * fVar132;
      _local_10c8 = CONCAT44(fVar58,local_10c8);
      fStack_a44 = -fVar58;
      fStack_a3c = -fVar58;
      local_a48 = local_1538 * fVar169;
      fVar142 = fStack_204 * fVar192 * fStack_1580;
      local_178 = fVar126 * local_928;
      fStack_f54 = -fVar126;
      local_218 = CONCAT44(fVar142,local_178) ^ 0x80000000;
      fStack_174 = -fVar142;
      fStack_16c = -fStack_204;
      fVar194 = (float)auStack_7d4._4_4_ * fStack_5fc +
                (float)auStack_7d4._52_4_ * local_5f8._4_4_ +
                (float)local_5f8 * (float)auStack_7d4._28_4_;
      fStack_1134 = fVar126 * fStack_1134;
      fStack_1130 = fVar130 * fStack_1134;
      fStack_15c0 = fVar130 * local_14a8 * fVar104;
      fStack_15bc = fVar127 * fStack_1580 * fVar107;
      fStack_15c4 = fStack_15f4 * fVar194;
      local_15c8 = fStack_1130;
      fStack_1134 = fVar130 + fStack_1134;
      fStack_15f4 = fStack_15f4 + fVar194;
      fStack_a94 = fVar152 * fVar107;
      local_1398 = local_1608 * fVar214 * fVar192 * fVar108 * fVar130;
      fStack_1394 = fStack_12b4 * fVar190 * fStack_1580 * fVar127;
      fStack_1390 = fStack_12b0 * fVar192 * fStack_1580 * fVar130;
      fStack_138c = fStack_12ac * fStack_340 * fVar131 * fVar132;
      local_a88 = fVar126 * fVar65 * fVar130;
      fStack_a84 = fStack_1010 * fVar127;
      fStack_a80 = fStack_1580 * fVar103 * fVar130;
      fStack_a7c = fVar131 * fVar106 * fVar132;
      local_14b8 = fVar190 * local_1198 * fVar214 * fVar126 * fVar130;
      fStack_14b4 = fStack_340 * fVar148 * fStack_1580 * fVar127;
      fStack_14b0 = fVar192 * fStack_1240 * fStack_1580 * fVar130;
      fStack_14ac = fStack_340 * fStack_123c * fVar131 * fVar132;
      fVar121 = fVar137 * fVar126 * fVar130;
      fVar129 = fStack_af4 * fVar192 * fVar126 * fVar127;
      local_498 = fVar126 * fVar44;
      local_a58 = -fVar76 * local_14a8 * fVar130;
      fStack_a54 = fVar172 * fVar127;
      fStack_a50 = fVar126 * fStack_14a0 * fVar130;
      fStack_a4c = fVar126 * fStack_149c * fVar132;
      local_1598 = fVar99 * fStack_1244 * fStack_1580 * fVar130;
      fStack_1594 = local_14a8 * fVar179 * fVar127;
      fStack_1590 = fVar99 * fStack_1580 * fVar130;
      fStack_158c = fStack_14a4 * fVar131 * fVar132;
      local_1378 = fVar153 * fVar214 * fVar190 * fVar108 * fVar130;
      fStack_1374 = fVar77 * fVar37 * fStack_1580 * fVar127;
      fStack_1370 = fStack_204 * fStack_1244 * fStack_1580 * fVar130;
      fStack_136c = fStack_a74 * fStack_1234 * fVar131 * fVar132;
      fStack_a90 = -fVar41;
      fStack_a8c = -fVar55;
      local_2b8 = fVar130 * fVar118 * fVar214 * fVar192 * fVar108;
      fStack_2b4 = fVar127 * fStack_a94;
      fStack_2b0 = fVar130 * fStack_1580 * -0.0;
      fStack_2ac = fVar132 * fStack_1434 * fVar131;
      local_a98 = fStack_a94 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      auVar26._4_4_ = fStack_1544;
      auVar26._0_4_ = local_14f8;
      auVar26._8_4_ = fStack_1620;
      auVar26._12_4_ = fStack_14ec;
      fVar114 = fVar114 * local_14f8;
      fVar194 = fVar69 * fVar190;
      fVar179 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd] * fStack_1580 * fVar194 * fStack_14ec;
      local_1478._8_4_ = fStack_1620;
      local_1478._0_8_ = auVar26._8_8_;
      local_1478._12_4_ = fStack_14ec;
      fVar122 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd] * fVar131 * fVar194 * fStack_1620;
      fVar123 = fVar108 * local_cc8;
      local_4b8 = fVar130 * fVar123;
      local_4a8 = fVar62 * fVar123;
      fVar143 = fVar36 * -fVar77 * fStack_1580 * fVar127;
      local_288 = local_bc8 * fVar190;
      uStack_280 = 0;
      uStack_27c = 0;
      fStack_ab4 = -local_1608;
      fStack_ab0 = -local_1608;
      fStack_aac = -local_1608;
      local_ab8 = -(fVar63 * fVar214) * fVar190;
      fStack_ba4 = -fVar165;
      fStack_ba0 = -fVar165;
      fStack_b9c = -fVar165;
      local_ba8 = -(fVar165 * local_1608) * fVar190;
      local_b98 = -fVar116 * local_1608 * fVar190;
      local_13a8._4_4_ = fStack_1b4;
      local_13a8._0_4_ = fStack_1b4;
      fStack_13a0 = fStack_1b4;
      fStack_139c = fStack_1b4;
      local_1b8 = fStack_1b4 * fVar190;
      fStack_c94 = -fStack_1b4;
      fStack_c90 = -(fVar206 * fStack_1550);
      fStack_c8c = -(fStack_c34 * fVar215);
      local_c98 = -(fStack_cc4 * fVar214) * fVar190;
      fVar65 = local_13e8 * local_1558 * fVar192;
      fStack_e24 = -local_1498;
      fStack_e20 = -local_1498;
      fStack_e1c = -local_1498;
      local_8e8 = local_c38 * local_1558 * fVar192;
      fVar76 = fVar115 * fVar214 * fVar192;
      fStack_bb4 = -local_1498;
      fStack_bb0 = -fStack_13e0;
      fStack_bac = -local_1608;
      local_bb8 = -fVar115 * fVar215 * fVar192;
      local_aa8 = fVar207 * local_1608 * fVar192;
      local_ce8 = fVar201 * fVar214 * fVar192;
      local_1578._0_4_ = fVar69 * fVar192 * fVar152;
      fVar116 = -(fVar190 * fVar77) * fStack_1580;
      local_f48 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd] * (float)local_1578;
      fStack_f44 = fVar127 * fVar116;
      fStack_f40 = fVar130 * local_1498 *
                             local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array[10];
      fStack_f3c = fVar132 * -fStack_1244 *
                             local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array[0xb];
      local_1578._0_4_ = -(float)local_1578;
      fVar210 = fStack_a74 * fVar192 * fStack_1580;
      fVar99 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xd] * fVar210;
      fVar150 = -fVar77 * fStack_1244 * fStack_1580;
      local_1408 = -(local_1558 * fVar153) * fStack_1244 * fVar108 * fVar130;
      fStack_1404 = fVar150 * fVar169;
      fStack_1400 = fVar60 * fStack_1580 * fVar130;
      fStack_13fc = -fStack_a74 * fStack_1244 * fVar131 * fVar132;
      fVar141 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd] * fVar141 * local_14f8;
      fVar103 = fVar99 * local_14f8;
      fVar60 = fVar130 * fVar75 * fStack_14ec;
      fVar75 = fVar75 * fVar132 * fStack_1620;
      fVar63 = fVar108 * fVar112 * fStack_340 * fVar130 * local_14f8;
      local_508 = fVar152 * local_508;
      fStack_504 = fVar126 * fVar190 * fStack_af4;
      fStack_500 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10] * fVar190 * fStack_1550 * fStack_13e0;
      fStack_4fc = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xb] * fVar190 * fVar215 * local_1608;
      fVar106 = fVar190 * fStack_af4 * fVar108 *
                local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd] * fStack_1620;
      fVar115 = fVar108 * fVar40 * fVar130;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = fVar152 * fVar202 * fVar190 * fVar127;
      local_4e8 = CONCAT44(fVar115,local_c08.
                                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                   m_storage.m_data.array[8]);
      fVar40 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xd] * fVar108 * fVar190 * fStack_1154 * fStack_1620;
      fVar201 = -fVar38 * fStack_1580 * fVar62 * fStack_1620;
      fVar38 = fVar152 * fVar38 * fVar130 * fStack_1620;
      fVar144 = fStack_1580 * fVar113 * fVar62 * fStack_1544;
      fVar153 = fVar152 * fVar113 * fVar130 * fStack_1544;
      local_388 = fStack_1580 * fVar128 * fVar132 * fStack_1620;
      local_f38 = fVar128 * fVar131 * fVar130 * fStack_1620;
      local_398 = fStack_1580 * fVar65 * fVar132 * fStack_1544;
      fVar128 = fVar70 * fStack_1244 * fStack_1580;
      fStack_514 = fStack_1580 * fVar194 * fVar127;
      local_518 = -local_958;
      fStack_510 = -fStack_954;
      fVar157 = fStack_1580 * fVar70 * fVar190 * fVar130 * fStack_15f4;
      fVar145 = -(fVar70 * fVar190) * fVar152 * fVar130 * fStack_1620;
      fVar199 = -fVar128 * fVar130 * fStack_14ec;
      local_528 = fVar132 * fVar128 * fStack_1620;
      fVar113 = fVar132 * fVar138 * fStack_1544;
      fVar175 = fVar175 * fStack_1544;
      fVar208 = fVar59 * fVar152 * fVar130 * local_14f8;
      fVar213 = fVar70 * fStack_340 * fStack_1580 * fVar130 * fStack_1544;
      fVar70 = -fVar70 * fVar36 * fStack_1580 * fVar130 * local_14f8;
      local_538 = fStack_514 * fStack_15f4;
      fStack_15b4 = -local_1498;
      fStack_15b0 = -fStack_13e0;
      fStack_15ac = -local_1608;
      local_15b8 = -fVar65 * fVar131 * fVar130;
      fVar194 = fVar194 * fVar152 * fVar127;
      local_3a8 = fStack_1580 * fVar110 * fVar190 * fVar130;
      local_1158 = fVar110 * fVar190 * fVar131 * fVar130;
      local_d48 = fVar127 * fVar182 * fVar131;
      fStack_d44 = fVar130 * fVar110 * fVar192 * fVar131;
      fStack_d40 = fVar130 * fVar184 * fVar131;
      fStack_d3c = fVar132 * local_1498 * fStack_340 * fVar131;
      fVar204 = fVar182 * fVar152 *
                local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd];
      local_ad8 = fVar110 * fStack_340 * fStack_1580 * fVar130;
      local_1578._0_4_ = (float)local_1578 * fVar127;
      fVar188 = fVar131 * fVar190 * fVar77 * fVar127;
      fStack_1570 = fStack_13e0 * fVar127;
      fStack_156c = local_1608 * fVar127;
      local_1578 = CONCAT44(fVar188,(float)local_1578);
      local_1468 = -fVar77 * fStack_340 * fStack_1580 * fVar127;
      fStack_1464 = -fStack_a74 * fStack_1244 * fStack_1580 * fVar127;
      fStack_1460 = -fStack_a70 * fVar192 * fStack_1580 * fVar127;
      fStack_145c = -fStack_a6c * fStack_340 * fStack_1580 * fVar127;
      local_8d8 = fStack_cc4 * fVar214 * fVar192 * fStack_1580;
      fStack_8d4 = fStack_1b4 * fVar192 * fStack_1580;
      fStack_8d0 = fVar206 * fStack_1550 * fVar192 * fStack_1580;
      fStack_8cc = fStack_c34 * fVar215 * fVar192 * fStack_1580;
      local_ae8 = fVar117 * fVar190 * fStack_1580;
      fStack_d64 = fVar109 * fVar192 * fStack_1580;
      fStack_ae0 = fStack_1004 * fStack_1580;
      fStack_adc = local_1498 * fStack_1580;
      fStack_d24 = fStack_1580 * fVar202 * fVar190;
      fStack_d1c = fStack_1580 * fVar173 * fStack_1244;
      local_d38 = fVar69 * fVar37 * fStack_1580 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      fStack_d34 = fVar98 * fVar190 * fStack_1580 * fVar130;
      fStack_d30 = fStack_13e0 * local_df8 * fStack_1230 * fStack_1580 * fVar130;
      fStack_d2c = local_1608 * local_df8 * fStack_122c * fStack_1580 * fVar132;
      fVar109 = fStack_1580 * fVar202 * fStack_1244 *
                local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd];
      fStack_14c4 = fVar126 * fStack_cd4 * fVar130;
      fStack_14c0 = fStack_1580 * fStack_9d0 * fVar192 * fVar130;
      fStack_14bc = fVar131 * fStack_9cc * fStack_340 * fVar132;
      fStack_1504 = fVar44 * local_14a8 * fVar130;
      local_1508 = fVar172 * local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array[0xd];
      fStack_1500 = fVar172 * fVar130;
      fStack_14fc = fVar172 * fVar132;
      local_13f8 = -(fVar37 * fVar64) * fVar126 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_13f4 = fVar187 * local_14a8 * fVar130;
      fStack_13f0 = -fStack_1234 * fStack_1580 * fVar130;
      fStack_13ec = fStack_e64 * fStack_14a4 * fVar132;
      local_1428 = fVar202 * fStack_340 * fStack_1580 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_1424 = -(fVar173 * fStack_1244) * fVar131 * fVar130;
      fStack_1420 = -(fStack_9d0 * fVar192) * fStack_1580 * fVar130;
      fStack_141c = -(fStack_9cc * fStack_340) * fVar131 * fVar132;
      local_1058 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd] * fStack_d24;
      fStack_1054 = fVar130 * fStack_d1c;
      fStack_1050 = fVar130 * fStack_1580 * fStack_9d0 * fVar192;
      fStack_104c = fVar132 * fStack_1580 * fStack_9cc * fStack_340;
      local_d28 = -fVar68 * local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0xd];
      fStack_d24 = fStack_d24 * fVar169;
      fStack_d20 = -fVar165 * fVar130;
      fStack_d1c = fStack_d1c * fVar132;
      local_11b8 = local_13e8 * fVar215 * fStack_1244 * fStack_1580 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fVar210 = fVar210 * fVar127;
      local_a28 = fVar126 * fVar205 * fStack_340 * fVar130;
      fStack_a24 = fVar108 * fVar67 * fStack_1244 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_a20 = fStack_1580 * fVar205 * fVar192 * fVar130;
      fStack_a1c = fVar131 * fVar205 * fStack_340 * fVar132;
      fVar65 = local_14a8 * -fVar45 *
               local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xd];
      local_e58 = fStack_1364 * fStack_1244 * fVar126 * fVar130;
      fStack_e54 = fStack_1b4 * fStack_1244 * fStack_1580 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_e50 = fVar102 * fStack_1244 * fStack_1580 * fVar130;
      fStack_e4c = fVar105 * fStack_1244 * fVar131 * fVar132;
      local_1418 = local_508 * fVar130;
      fStack_1414 = fStack_504 *
                    local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xd];
      fStack_1410 = fStack_500 * fVar130;
      fStack_140c = fStack_4fc * fVar132;
      local_c78 = fVar130 * local_ae8;
      fStack_c74 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd] * fStack_d64;
      fStack_c70 = fVar130 * fStack_ae0;
      fStack_c6c = fVar132 * fStack_adc;
      local_d68 = fStack_d64 * fVar127;
      local_ae8 = local_ae8 * fVar132;
      local_1128 = local_1128 * fVar130;
      fVar189 = local_9e8 * fVar132;
      fStack_1120 = fVar192 * fStack_1000 * fVar130;
      fStack_111c = fStack_340 * fStack_ffc * fVar132;
      _local_1128 = CONCAT44(fVar189,local_1128);
      local_1278 = local_1498 * fVar215 * fVar190 * fStack_1580 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_100c = fStack_1580 * fVar181;
      fStack_1014 = fStack_100c * fVar132;
      local_d58 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd] * fStack_1580 * -(local_1498 * fVar215) * fVar192;
      fStack_d54 = fVar62 * fStack_100c;
      fStack_d50 = fVar127 * fStack_1580 * fStack_9d0 * fVar192;
      fStack_d4c = fStack_1104 * fStack_1580 * fStack_9cc * fVar192;
      fVar59 = fVar71 * fVar190 * fVar126;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = fVar130 * fVar59;
      fVar184 = fVar181 * fVar131 * fVar130;
      auVar27._4_4_ = fStack_1544;
      auVar27._0_4_ = local_14f8;
      auVar27._8_4_ = fStack_1620;
      fVar45 = -fVar116 * fVar108;
      local_fd8 = fVar62 * fVar45;
      local_1048 = local_fd8;
      fStack_103c = fStack_1040;
      local_1018 = fStack_1010 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      local_d88 = fVar36 * fVar211 * fVar108 * fVar130;
      fVar59 = -fVar59 * fVar132;
      local_1638 = CONCAT44(local_1608,fVar59) ^ 0x8000000000000000;
      uStack_1630 = 0x80000000;
      uStack_162c = 0x80000000;
      local_12f8._12_4_ = local_14f8;
      local_12f8._0_12_ = auVar27;
      local_fe8 = fVar108 * fVar133 * fVar132;
      local_b48 = fVar108 * fVar104 * fVar132;
      fVar98 = -fVar73 * fStack_1580 * fVar132;
      local_1458 = fVar132 * fVar126 * fVar104;
      local_b58 = fVar71 * fStack_340 * fVar126 * fVar130;
      uStack_b50 = 0;
      uStack_b4c = 0;
      local_f88 = fVar108 * fVar178 * fVar130;
      local_1538 = local_1538 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fStack_1534 = fVar108 * fVar180 * fVar127;
      fStack_1530 = fStack_1530 * fVar130;
      fStack_152c = fStack_152c * fVar132;
      local_f18 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd] * fVar126 * fVar180;
      local_ff8 = fVar108 * local_e38 * fStack_340 * fVar127;
      local_b68 = local_e38 * fStack_340 * fVar126 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      uStack_b60 = 0;
      uStack_b5c = 0;
      fVar44 = fStack_1580 * fVar107 *
               local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xd];
      fVar138 = -fVar39 * fVar190 * fVar126 *
                local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd];
      local_1268 = CONCAT44(local_1608,fVar138) ^ 0x8000000000000000;
      fStack_1260 = -fStack_13e0;
      fStack_125c = -local_1608;
      fVar107 = -fVar44;
      local_11c8 = local_1608 * local_1558 * fStack_1244 * fVar108 * fVar130;
      fVar181 = -fVar170;
      local_fa8 = local_1608 * fVar214 * fVar190 * fVar108 * fVar130;
      _local_e48 = CONCAT44(fStack_1620,local_14f8);
      local_12b8 = fVar166 * fVar190 * fVar108 * fVar127;
      local_e18 = -fVar166 * fStack_1244 * fVar108 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      fVar200 = fVar200 * fVar127;
      fVar187 = local_ba8 * fStack_1580 *
                local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd];
      _local_1628 = CONCAT44(fStack_1620,fStack_1620);
      fVar166 = fVar130 * fVar126 * local_cc8;
      local_ef8 = -fVar166;
      fStack_ef4 = -fVar132;
      fStack_ef0 = -fVar130;
      fStack_eec = -fVar132;
      fStack_15d4 = fVar108 * -fVar101 * fStack_1244 * fVar130;
      fStack_15d0 = fVar150 * fVar130;
      fStack_15cc = fVar150 * fVar132;
      fVar116 = fVar126 * local_cc8 * fVar132;
      local_b88 = local_13e8 * local_1608 * fStack_1244 * fStack_1580 * fVar127;
      local_1448 = local_13e8 * local_1608 * fVar192 * fStack_1580 * fVar127;
      fStack_1444 = local_1498;
      fStack_1440 = fStack_13e0;
      fStack_143c = local_1608;
      fVar206 = fVar112 * fStack_340 * fVar126 * fVar130;
      fVar112 = -fVar206;
      fVar102 = fVar108 * -local_1498 * fVar36 * fVar130;
      local_cf8 = fStack_1244 * fVar117 * fVar152 * fVar130;
      fVar211 = fVar130 * local_428;
      fVar68 = -local_1498 * fVar36 * fVar126 * fVar130;
      local_ec8 = -fVar68;
      fStack_ec4 = -fVar214;
      fStack_ec0 = -fStack_cc0;
      fStack_ebc = -fStack_cbc;
      local_ac8 = fVar152 * fVar174 * fVar130;
      fStack_ac4 = fVar108 * fVar190 * fVar205 * fVar132;
      fStack_ac0 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10] * fVar192 * -fStack_1000 * fVar130;
      fStack_abc = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xb] * fStack_340 * -fStack_ffc * fVar132;
      fVar174 = local_1608 * fVar130;
      local_1008 = fVar117 * fVar36 * fStack_1580 * fVar130;
      local_b28 = fVar152 * fVar140 * fVar130;
      fStack_cd4 = -fStack_cd4;
      fStack_cd0 = -(fStack_9d0 * fVar192);
      fStack_ccc = -(fStack_9cc * fStack_340);
      local_cd8 = -(fVar202 * fStack_1244) * fVar152 *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0xd];
      local_b38 = fVar108 * fVar137 * fVar130;
      local_f78 = -local_b38;
      fStack_f74 = -fVar126;
      fStack_f70 = -fStack_1580;
      fStack_f6c = -fVar131;
      local_f08._8_4_ = fStack_1544;
      local_f08._0_8_ = auVar27._4_8_;
      local_f08._12_4_ = fStack_1544;
      fVar140 = fStack_340 * fVar61 * fVar126 * fVar130;
      local_d08 = fStack_d04 * fVar108 * fVar130;
      local_e28 = -(local_1498 * local_1608) * fVar192 * fStack_1580 * fVar127;
      fVar69 = fVar126 * fVar133 * fVar130;
      local_fc8 = fVar71 * fVar36 * fVar126 * fVar130;
      uStack_fc0 = 0;
      uStack_fbc = 0;
      fStack_1564 = -fVar131;
      uStack_1560 = 0x80000000;
      uStack_155c = 0x80000000;
      fVar137 = -fVar45 * fVar130;
      local_1108 = fVar62 * fVar108 * fVar135;
      fVar73 = local_af8 * fVar126 *
               local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xd];
      fVar105 = fVar126 * fVar136 *
                local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xd];
      local_918 = fStack_914 * fVar130 * fStack_15f4;
      local_15d8 = fVar150 * fVar127 * fStack_15f4;
      local_d18 = fVar42 * fStack_15f4;
      local_14c8 = fVar109 * fStack_15f4;
      local_1528 = fVar69 * fStack_15f4;
      fStack_1524 = fVar126;
      fStack_1520 = fVar126;
      fStack_151c = fVar126;
      local_1568 = fVar137 * fStack_15f4;
      local_938 = local_938 * fStack_15f4;
      local_15f8 = fStack_15f4 * fVar105;
      local_1588 = fVar108 * local_e38 * fVar36 * fVar127;
      local_1148 = local_e38 * fVar36 * fVar126 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      uStack_1140 = 0;
      uStack_113c = 0;
      local_10f8 = fVar126 * fVar104 * fVar130;
      fVar45 = -fVar126;
      fVar202 = -(local_188 * fVar130);
      fStack_ed0 = -local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[10];
      fStack_ecc = -local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0xb];
      local_ed8 = CONCAT44(fStack_1434,fVar202) ^ 0x8000000000000000;
      local_998 = fVar126 * -fVar209 * fVar190 * fVar127;
      fStack_994 = fStack_1580 * fVar148 * fVar190 * fVar127;
      fStack_990 = fStack_1580 * fStack_1240 * fVar190 * fVar127;
      fStack_98c = fVar131 * fStack_123c * fVar190 * fVar127;
      local_ee8 = fVar209 * fStack_1244 * fVar108 * fVar127;
      uStack_ee0 = 0;
      uStack_edc = 0;
      local_1488 = fVar108 * fVar209 * fVar192 * fVar127;
      local_1388 = fVar209 * fVar192 * fVar126 * fVar127;
      uStack_1380 = 0;
      uStack_137c = 0;
      fVar39 = -(fVar139 * fVar192) * fVar126 *
               local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xd];
      local_11a8 = local_1198 * local_1558 * fStack_1244 * fVar126 * fVar130;
      fVar61 = local_ab8 * fVar126 * fVar130;
      local_1248 = -local_1608 * fVar192 * fVar126 * fVar130;
      local_1218 = fVar186 * fVar190 * fVar126 * fVar127;
      local_12a8 = -fVar186 * fStack_1244 * fVar126 *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      fVar104 = fVar190 * fStack_1154 * fVar126 * fVar127;
      local_1518 = fVar100 * local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array[0xd];
      fStack_1514 = fStack_1514 * fVar127;
      fStack_1510 = fVar100 * fVar130;
      fStack_150c = fVar100 * fVar132;
      local_a08 = local_a08 * fVar127;
      fVar128 = fVar165 * local_1608 * fVar192 * fStack_1580 * fVar127;
      fStack_a00 = fStack_a00 * fVar127;
      fStack_9fc = fStack_9fc * fVar127;
      _local_a08 = CONCAT44(fVar128,local_a08);
      local_8c8 = local_8c8 * fVar127;
      fVar67 = fVar110 * fVar37 * fStack_1580 * fVar130;
      fStack_8c0 = fStack_8c0 * fVar130;
      fStack_8bc = fStack_8bc * fVar132;
      _local_8c8 = CONCAT44(fVar67,local_8c8);
      local_a78 = fVar77 * fVar192 * fStack_1580;
      local_15a8 = fVar127 * local_a78;
      fStack_15a4 = fVar127;
      fStack_15a0 = fVar127;
      fStack_159c = fVar127;
      local_a78 = local_a78 * fVar169;
      local_11e8 = local_13e8 * local_df8 * fVar192 * fStack_1580 * fVar130;
      local_9e8 = local_9e8 * fVar130;
      fStack_9e4 = -fVar43 * fVar132;
      fStack_9e0 = fVar131 * fVar130;
      fStack_9dc = -fStack_1004 * fVar132;
      local_1238 = fVar37 * -fVar117 * fStack_1580 * fVar130;
      local_968 = local_968 * fVar169;
      local_278._4_4_ = (float)(uVar34 >> 0x20);
      local_13d8 = fVar133 * local_14a8 * fVar130;
      uStack_13d0 = 0;
      uStack_13cc = 0;
      local_988 = fVar71 * fVar37 * fVar126 * fVar130;
      uStack_980 = 0;
      uStack_97c = 0;
      local_9f8 = fVar74 * local_14a8;
      uStack_9f0 = 0;
      uStack_9ec = 0;
      local_1438 = fVar45 * local_9f8;
      local_12e8 = local_14a8 * fVar178 * fVar130;
      local_15e8 = fVar108 * fVar135 * fVar130;
      fStack_15e4 = fVar126;
      fStack_15e0 = fStack_1580;
      fStack_15dc = fVar131;
      local_c68 = fVar135 * local_14a8 * fVar130;
      uStack_c60 = 0;
      uStack_c5c = 0;
      local_11f8 = fVar134 * fVar37 * fVar108 * fVar130;
      uStack_11f0 = 0;
      uStack_11ec = 0;
      local_10d8 = fVar126 * fVar180 * fVar169;
      fStack_10d4 = fVar126;
      fStack_10d0 = fVar126;
      fStack_10cc = fVar126;
      local_948 = fVar108 * fVar136 * fVar169;
      local_c58 = fVar136 * local_14a8 * fVar45;
      uStack_c50 = 0;
      uStack_c4c = 0;
      fVar43 = fVar108 * fVar74 * fVar127;
      fVar117 = -(fVar108 * fVar74) * fVar169;
      local_e98 = fVar126 * fVar74 * fVar169;
      fVar71 = fStack_204 * fVar37 * fStack_1580 * fVar127;
      fVar77 = -(local_bc8 * fVar192) * fVar108 * fVar130;
      local_e88 = fVar108 * local_e38 * fVar37 * fVar127;
      fVar133 = fVar130 * fStack_1580 * fStack_924;
      fVar100 = local_288 * fVar126 * fVar130;
      fVar74 = local_198 * fVar108 * fVar130;
      local_8f8 = fVar108 * fVar37 * fVar64 * fVar127;
      fVar64 = local_8e8 * fStack_1580 * fVar130;
      fVar110 = local_1b8 * fStack_1580 * fVar127;
      local_8b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = -fStack_8d4 * fVar127 * local_14f8 +
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] * fStack_8d4 * fStack_1544 +
            ((fVar110 * fStack_1620 +
             local_e68 * local_14f8 +
             fStack_e4 * fStack_1620 +
             ((fStack_8f0 * fStack_1620 +
              fStack_904 * local_14f8 +
              fVar77 * fStack_1544 +
              fVar74 * fStack_1620 +
              ((fVar111 * fStack_1620 +
               local_e88 * fStack_1620 +
               -local_9f8 * fVar127 * local_14f8 +
               local_1438 * fStack_1544 +
               local_e98 * local_14f8 +
               local_eb8 * local_10c8 +
               fVar117 * fStack_1544 +
               fVar43 * local_eb8 +
               ((local_948 * fStack_1620 +
                local_728 * fStack_1620 +
                (((local_c68 * local_14f8 +
                  ((local_12e8 * fStack_1620 +
                   local_988 * fStack_1620 +
                   ((local_10f8 * local_eb8 +
                    local_13d8 * fStack_1620 +
                    ((fStack_d34 * fStack_1620 +
                     local_9d8 * fStack_1620 +
                     ((local_d8 * local_eb8 +
                      fStack_d24 * fStack_1620 +
                      local_1238 * fStack_1620 +
                      local_9e8 * local_eb8 +
                      local_11e8 * fStack_1544 +
                      fStack_11d4 * fStack_1620 +
                      ((local_a78 * fStack_1544 +
                       ((fStack_1404 * fStack_1620 +
                        fVar67 * fStack_1620 +
                        local_6b8 * local_eb8 +
                        ((local_1518 * fStack_1544 +
                         local_12a8 * fStack_1620 +
                         local_1218 * fStack_1620 +
                         local_1248 * local_14f8 +
                         ((fVar55 * fStack_1544 +
                          local_11a8 * fStack_1620 +
                          local_1388 * local_14f8 +
                          ((local_ee8 * fStack_1620 +
                           local_998 * fStack_1620 +
                           ((local_1588 * fStack_1544 +
                            ((local_938 +
                             local_d88 * fStack_1544 +
                             local_118 * local_14f8 +
                             ((local_fd8 * fStack_1620 +
                              local_1568 +
                              local_e78 * fStack_1620 +
                              local_fc8 * fStack_1544 +
                              local_1528 +
                              local_e28 * local_14f8 +
                              local_108 * fStack_1620 +
                              local_6f8 * fStack_1544 +
                              ((local_718._0_4_ * fStack_1544 +
                               local_cd8 * fStack_1620 +
                               local_14c8 +
                               local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[8] * fStack_1620 +
                               local_b28 * local_14f8 +
                               local_6e8 * local_14f8 +
                               ((local_1c8 * fStack_1620 +
                                ((local_ac8 * fStack_1544 +
                                 local_cf8 * fStack_1620 +
                                 ((local_1448 * fStack_1544 +
                                  ((fVar143 * fStack_1544 +
                                   local_15d8 +
                                   local_1a8 * fStack_1544 +
                                   local_6a8 * fStack_1544 +
                                   ((local_918 +
                                    ((fVar198 * fStack_1544 +
                                     local_e18 * fStack_1620 +
                                     local_12b8 * fStack_1620 +
                                     local_1398 * local_14f8 +
                                     ((local_6c8 * fStack_1544 +
                                      local_11c8 * fStack_1620 +
                                      local_c8 * local_14f8 +
                                      ((local_788 * fStack_1620 +
                                       fVar138 * fStack_1620 +
                                       ((local_ff8 * local_14f8 +
                                        ((fStack_1534 * fStack_14ec +
                                         fStack_954 * local_14f8 +
                                         local_f88 * fStack_14ec +
                                         local_b58 * local_14f8 +
                                         local_1458 * local_14f8 +
                                         ((local_fe8 * fStack_1620 +
                                          fVar59 * fStack_1620 +
                                          local_c08.
                                          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                          .m_storage.m_data.array[4] * fStack_14ec +
                                          local_d58 * local_14f8 +
                                          local_1278 * fStack_1620 +
                                          local_1428 * local_14f8 +
                                          local_1058 * fStack_14ec +
                                          ((fVar189 * local_14f8 +
                                           local_ae8 * fStack_1620 +
                                           ((fVar119 * fStack_1544 +
                                            ((local_1468 * local_14f8 +
                                             ((fStack_b04 * fStack_1544 +
                                              fStack_fb4 * fStack_1620 +
                                              fVar188 * fStack_1620 +
                                              fStack_f44 * fStack_14ec +
                                              local_ad8 * local_14f8 +
                                              fStack_d44 * local_14f8 +
                                              ((local_3a8 * fStack_14ec +
                                               local_15b8 * fStack_1544 +
                                               (local_f38 - local_388) + local_398) -
                                              local_1158 * fStack_1620)) - local_708 * local_14f8))
                                            - local_11b8 * fStack_1620)) - local_c78 * fStack_14ec))
                                          - local_9c8 * local_14f8)) - local_b48 * fStack_1544)) -
                                        local_f18 * fStack_14ec)) - local_b68 * local_14f8)) -
                                      local_c48 * fStack_1544)) - local_fa8 * fStack_1620)) -
                                    local_748 * local_14f8)) - fStack_6d4 * fStack_1620)) -
                                  local_b88 * fStack_1620)) - local_d18)) - local_1008 * fStack_1544
                                )) - local_1418 * fStack_1620)) - local_ca8 * local_14f8)) -
                             local_1108 * fStack_1544)) - local_15f8)) - local_1148 * fStack_1544))
                          - local_1488 * fStack_1544)) - local_14b8 * fStack_1620)) -
                        fStack_734 * local_14f8)) - local_15a8 * local_eb8)) -
                      fStack_1374 * fStack_1620)) - local_968 * local_14f8)) -
                    fStack_c84 * local_14f8)) - fStack_15c0 * fStack_1544)) - local_15e8 * local_eb8
                  )) - local_11f8 * fStack_1620) - local_10d8 * fStack_1620)) -
               local_c58 * fStack_1620)) - fVar100 * fStack_1620)) - fVar64 * fStack_1544)) -
            fStack_e54 * fStack_1620);
      local_8b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = local_1208 * fVar127 * local_14f8 +
            local_148 * fStack_1544 +
            local_c98 * fStack_1580 * fVar130 * fStack_1620 +
            local_1598 * fStack_1620 +
            fVar156 * local_14f8 +
            -local_1368 * fVar108 * fVar130 * fStack_1544 +
            local_13f8 * fStack_1620 +
            fStack_1620 * local_8f8 +
            local_14f8 * -(local_928 * local_14a8) * fVar127 +
            fStack_1544 * fVar45 * local_928 * local_14a8 +
            local_178 * fVar169 * local_14f8 +
            local_eb8 * (float)local_218 * fVar45 +
            -(fVar108 * local_928) * fVar169 * fStack_1544 +
            local_eb8 * fVar127 * fVar108 * local_928 +
            local_a58 * fStack_1620 +
            local_cc8 * local_14a8 * fVar130 * fStack_1620 +
            local_138 * fStack_1620 +
            fStack_1620 * local_a48 +
            -fVar173 * fVar37 * fStack_1580 * fVar130 * fStack_1620 +
            -fStack_100c * fVar130 * fStack_f54 +
            local_1228 * fStack_1620 +
            local_a38 * fStack_1620 +
            fStack_1620 * local_128 * fStack_1580 * fVar130 +
            local_eb8 * local_158 +
            fVar172 * local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xd] * fStack_1620 +
            fStack_1620 * local_1d8 +
            local_a08 * fStack_1620 +
            -local_a88 * local_14f8 +
            local_2b8 * fStack_1544 +
            fStack_1544 * fStack_1130 +
            local_2a8 * fVar126 * fVar127 * fStack_1620 +
            local_ce8 * fVar126 * fVar130 * fStack_1544 +
            local_cb8 * fVar126 * fVar45 * fStack_1620 +
            -local_258 * fVar127 * fStack_1620 +
            fStack_270 * fStack_1620 +
            fStack_1620 * local_a18 * fVar126 * fVar127 +
            local_14f8 * fVar203 +
            local_d08 * fStack_1544 +
            local_a28 * fStack_1544 +
            fStack_1620 * fStack_9e4 +
            fStack_14ec * local_9a8 +
            -fVar196 * fVar62 * fStack_1620 +
            fStack_15f4 * local_778 +
            local_768 * fVar62 * fStack_1620 +
            fStack_9b4 * fStack_15f4 +
            local_ec8 * fStack_1544 +
            -fVar101 * fStack_1244 * fVar126 * fVar62 * fStack_1620 +
            local_ef8 * fStack_15f4 +
            fVar128 * local_14f8 +
            local_aa8 * fStack_1580 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] * fStack_1544 +
            fVar192 * -fVar207 * fVar215 * fStack_1580 * fVar127 * fStack_1544 +
            -fVar148 * fVar36 * fStack_1580 * fVar127 * local_14f8 +
            fStack_1544 * -local_1018 +
            fStack_14b4 * fStack_1544 +
            local_228 * fVar127 * fStack_1620 +
            -(fVar148 * fStack_1244) * fStack_1580 * fVar127 * fStack_14ec +
            fStack_15f4 * fVar107 +
            fStack_254 * fVar127 * fStack_1620 +
            fStack_15f4 * fStack_994 +
            fVar202 * local_14f8 +
            local_1758 * fVar131 * fVar130 * fStack_1544 +
            local_10e8 * local_14f8 +
            fStack_1544 * fVar195 +
            fStack_1544 * fStack_d84 +
            fStack_1544 * fVar167 +
            -local_d68 * fStack_1544 +
            fStack_1544 * fStack_1044 +
            fStack_1620 * local_b78 +
            fStack_15f4 * fStack_e74 +
            fStack_1544 * fVar76 * fVar152 * fVar130 +
            fStack_1544 * -local_4f8 +
            fStack_1620 *
            fVar168 * fVar190 * fVar108 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] +
            local_14f8 * local_1558 * fVar118 * fVar192 * fVar108 * fVar130 +
            fStack_6f4 * fStack_1620 +
            fStack_ca4 * fStack_1620 +
            -fVar131 * fVar127 * fStack_1620 +
            local_f78 * local_14f8 +
            fStack_14c4 * local_14f8 +
            fStack_1544 * fVar115 +
            fStack_1620 *
            local_b98 * fVar108 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] +
            fStack_6e4 * fStack_1620 +
            fStack_1620 * fStack_1414 +
            fVar177 * fStack_1620 +
            local_14f8 * fVar174 +
            fStack_ac4 * fStack_1620 +
            fStack_14ec * fVar211 +
            fStack_d14 * local_14f8 +
            fVar112 * local_14f8 +
            -fVar66 * fStack_340 * fVar108 * fVar130 * fStack_1544 +
            -fVar123 * fVar132 * fStack_1620 +
            fStack_14ec * fStack_15d4 +
            fVar176 * fVar132 * fStack_1620 +
            fStack_14ec * -local_468 +
            local_6d8 * fStack_1620 +
            fStack_314 * fStack_15f4 +
            fStack_744 * local_14f8 +
            fVar181 * local_14f8 +
            fStack_14ec * -local_1538 +
            local_358 * fVar130 * local_14f8 +
            fStack_1014 * local_14f8 +
            local_338 * local_14f8 +
            local_14f8 * local_bb8 * fStack_1580 * fVar127 +
            fStack_1544 * -fVar99 +
            local_14f8 *
            -fVar185 * fVar36 * fStack_1580 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] +
            local_14f8 * local_fb8 +
            fStack_1544 *
            fVar185 * fStack_340 * fStack_1580 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] +
            fVar182 * fVar131 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] * fStack_1620 +
            fStack_1580 * fVar197 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] * fStack_14ec +
            fStack_1620 * fStack_4c4 +
            fStack_1620 * -fStack_1434 * fVar127 +
            fStack_514 * fStack_14ec +
            fStack_15f4 *
            fStack_1580 * fVar185 * fVar190 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] +
            fStack_484 * local_14f8 +
            fVar76 * fStack_1580 * fVar132 * local_14f8 +
            local_14f8 * fVar152 * local_378 * fVar130 +
            fStack_344 * fStack_1544 +
            fStack_d7c * fStack_1544 + -local_378 * fStack_1580 * fVar62 * local_14f8 +
            fStack_1620 *
            fVar148 * fVar190 * fVar131 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] + fStack_1620 * local_a98;
      local_8b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = fStack_1204 * fVar127 * fStack_1620 +
            fVar130 * local_8d8 * fStack_1544 +
            local_e58 * fStack_1620 +
            fStack_1594 * fStack_1620 +
            fVar212 * fStack_1620 +
            local_e8 * fStack_1620 +
            fStack_13f4 * fStack_1544 +
            fStack_f54 * fStack_8f4 +
            fStack_1544 * local_908 +
            fStack_1620 * fVar71 +
            fStack_174 * fVar169 * fStack_1544 +
            local_eb8 * fVar142 * fStack_1434 +
            fVar56 * fStack_1620 +
            local_14f8 * fVar133 +
            -fStack_a54 * fStack_1620 +
            local_a88 * fStack_1544 +
            fStack_134 * fStack_1620 +
            fStack_1620 * fVar58 +
            fVar65 * fStack_1620 +
            fStack_1620 * fStack_f4c +
            -fStack_1224 * fStack_1544 +
            local_238 * fStack_1620 +
            fStack_15f4 * -fStack_724 +
            fStack_1620 * fStack_154 +
            fStack_1504 * local_14f8 +
            local_eb8 * fStack_1d4 +
            -fVar128 * fStack_1544 +
            fStack_a84 * fStack_1544 +
            -fStack_2b4 * fStack_1620 +
            fStack_15f4 * fStack_15bc +
            local_188 * fVar130 * fStack_1544 +
            -local_10e8 * fStack_1544 +
            local_c88 * local_14f8 +
            local_d38 * fStack_1620 +
            fVar120 * local_14f8 +
            local_eb8 * local_268._0_4_ +
            local_14f8 * fVar155 +
            local_d28 * fStack_1544 +
            fStack_a24 * fStack_1620 +
            fStack_1620 * -local_1f8._0_4_ +
            fStack_1620 * -local_a68 +
            -local_11d8 * local_14f8 +
            fStack_1620 * local_1378 +
            fStack_1130 * local_14f8 +
            local_9b8 * fStack_1544 +
            local_1408 * fStack_1620 +
            local_8c8 * local_14f8 +
            fStack_6b4 * fStack_1544 +
            -local_738 * fStack_1620 +
            -fStack_1514 * fStack_1620 +
            fVar104 * fStack_1620 +
            fVar121 * local_14f8 +
            fStack_1544 * local_b38 +
            fVar61 * fStack_1620 +
            fStack_224 * fVar130 * fStack_1620 +
            fVar39 * local_14f8 +
            fStack_1544 *
            local_248 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] +
            -(local_258 *
             local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0xd]) * fStack_1620 +
            fStack_1620 * local_2e8._0_4_ +
            local_2f8 * fVar127 * fStack_1620 +
            fVar129 * local_14f8 +
            fStack_10e4 * fStack_1544 +
            fStack_1620 * fVar73 +
            fStack_1620 * local_3c8 +
            fStack_1620 * -(fStack_504 * fVar127) +
            local_308 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] * local_14f8 +
            local_14f8 * fStack_1040 +
            fStack_1544 * fStack_b74 +
            fStack_1544 * local_3b8 * fVar127 +
            fStack_14ec * local_418._0_4_ +
            fStack_14ec * local_3d8 * fVar127 +
            fStack_15f4 * fVar183 +
            fStack_15f4 * fVar127 * fVar72 +
            local_d08 * local_14f8 +
            -fVar140 * local_14f8 +
            -fVar174 * fStack_1544 +
            local_368 * local_14f8 +
            local_328 * fVar132 * fStack_1544 +
            fStack_1620 * -local_458 +
            fStack_14ec * local_778 +
            fVar132 * local_768 * fStack_1620 +
            fStack_14ec * -(fVar130 * local_768) +
            local_428 * fVar62 * fStack_1620 +
            fStack_15f4 * -fVar211 +
            local_ec8 * local_14f8 +
            fStack_1544 * -fVar102 +
            fVar206 * fStack_1544 +
            local_498 * fVar62 * local_14f8 +
            fVar171 * fStack_1544 +
            fVar116 * fStack_1620 +
            fStack_14ec * local_ef8 +
            local_4a8 * fStack_1620 +
            fStack_15f4 * -local_4b8 +
            -local_448 * fStack_1620 +
            local_468 * fStack_15f4 +
            (float)local_3e8 * local_14f8 +
            fVar187 * fStack_1620 +
            fStack_1544 * -fStack_744 +
            fStack_1394 * fStack_1620 +
            -local_1018 * local_14f8 +
            fStack_6c4 * local_14f8 +
            fVar170 * fStack_1544 +
            local_14f8 * fVar154 +
            fStack_1544 * fStack_c44 +
            fStack_1620 * fStack_784 +
            fStack_14ec * fVar107 +
            -local_478._0_4_ * fStack_1620 +
            -fVar149 * fStack_1620 +
            fStack_14ec * local_4c8 +
            fStack_15f4 * local_1538 +
            local_518 * local_14f8 +
            local_14f8 * fVar191 +
            local_488 * fStack_1620 +
            fVar98 * fStack_1620 +
            local_14f8 * fVar193 +
            local_348 * fStack_1544 +
            fStack_d84 * local_14f8 +
            fVar184 * fStack_1544 +
            (((fStack_1424 * fStack_1620 +
              fStack_1054 * fStack_14ec +
              fStack_9c4 * fStack_1620 +
              local_1128 * fStack_15f4 +
              (((fVar57 * fStack_1620 +
                fVar210 * fStack_1544 +
                fStack_1464 * fStack_1620 +
                fStack_1044 * local_14f8 +
                local_b08 * fStack_1544 +
                (((float)local_1578 * local_14f8 +
                 local_f48 * fStack_1544 +
                 (((fStack_e74 * fStack_14ec +
                   auStack_7d4._60_4_ * fStack_15f4 +
                   fVar194 * fStack_1620 +
                   (((((fVar157 + (((((((((fVar141 +
                                          (((fStack_d7c * local_14f8 - fVar114) + fVar179) - fVar122
                                          )) - fVar103) - fVar60) + fVar75) - fVar63) + fVar106 +
                                     fVar115 * local_14f8) - fVar40) + fVar201 + fVar38 + fVar144) -
                                  fVar153) + fVar145 + fVar199 + local_528) - fVar113) -
                     local_4f8 * local_14f8) + fVar175 + fVar208 + fVar213 + fVar70) - local_538)) -
                  local_d48 * fStack_1620) - fVar204 * fStack_1620)) - local_fb8 * fStack_1544)) -
               fStack_c74 * fStack_1544) - local_d68 * local_14f8)) - fStack_1014 * fStack_1544) -
            fStack_d54 * local_14f8) + local_14f8 * -fVar200 + fStack_1544 * fStack_a90;
      local_8b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = fStack_1204 * fVar127 * fStack_1620 +
            fVar130 * local_8d8 * fStack_1544 +
            local_e58 * fStack_1620 +
            fStack_1594 * fStack_1620 +
            fVar212 * fStack_1620 +
            local_e8 * fStack_1620 +
            fStack_13f4 * fStack_1544 +
            fStack_f54 * fStack_8f4 +
            fStack_1544 * local_908 +
            fStack_1620 * fVar71 +
            fStack_174 * fVar169 * fStack_1544 +
            local_eb8 * fVar142 * fStack_1434 +
            fVar56 * fStack_1620 +
            local_14f8 * fVar133 +
            fStack_a54 * fStack_1620 +
            -local_a88 * fStack_1544 +
            fStack_134 * fStack_1620 +
            fStack_1620 * fStack_a44 +
            fVar65 * fStack_1620 +
            fStack_1620 * fStack_f4c +
            fStack_1224 * fStack_1544 +
            fStack_a34 * fStack_1620 +
            fStack_15f4 * fStack_724 +
            fStack_1620 * fStack_154 +
            fStack_1504 * local_14f8 +
            local_eb8 * fStack_1d4 +
            fVar128 * fStack_1544 +
            -fStack_a84 * fStack_1544 +
            fStack_2b4 * fStack_1620 +
            -fStack_15bc * fStack_15f4 +
            fVar202 * fStack_1544 +
            local_10e8 * fStack_1544 +
            local_c88 * local_14f8 +
            local_d38 * fStack_1620 +
            fVar120 * local_14f8 +
            local_eb8 * local_268._0_4_ +
            local_14f8 * fVar155 +
            local_d28 * fStack_1544 +
            -fStack_a24 * fStack_1620 +
            fStack_1620 * local_1f8._0_4_ +
            fStack_1620 * local_a68 +
            local_11d8 * local_14f8 +
            fStack_1620 * local_1378 +
            -fStack_1130 * local_14f8 +
            -local_9b8 * fStack_1544 +
            local_1408 * fStack_1620 +
            local_8c8 * local_14f8 +
            fStack_6b4 * fStack_1544 +
            local_738 * fStack_1620 +
            fStack_1514 * fStack_1620 +
            -fVar104 * fStack_1620 +
            -fVar121 * local_14f8 +
            fStack_1544 * local_f78 +
            fVar61 * fStack_1620 +
            fStack_224 * fVar130 * fStack_1620 +
            fVar39 * local_14f8 +
            fStack_1544 *
            local_248 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] +
            local_258 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] * fStack_1620 +
            fStack_1620 * -local_2e8._0_4_ +
            -(local_2f8 * fVar127) * fStack_1620 +
            fVar129 * local_14f8 +
            fStack_10e4 * fStack_1544 +
            fStack_1620 * -fVar73 +
            fStack_1620 * -local_3c8 +
            fStack_1620 * fStack_504 * fVar127 +
            local_308 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] * local_14f8 +
            local_14f8 * fStack_1040 +
            fStack_1544 * fStack_b74 +
            fStack_1544 * local_3b8 * fVar127 +
            fStack_14ec * local_418._0_4_ +
            fStack_14ec * local_3d8 * fVar127 +
            fStack_15f4 * fVar183 +
            fStack_15f4 * fVar127 * fVar72 +
            -local_d08 * local_14f8 +
            fVar140 * local_14f8 +
            fVar174 * fStack_1544 +
            local_368 * local_14f8 +
            local_328 * fVar132 * fStack_1544 +
            fStack_1620 * local_458 +
            fStack_14ec * -local_778 +
            -(fVar132 * local_768) * fStack_1620 +
            fStack_14ec * fVar130 * local_768 +
            -(local_428 * fVar62) * fStack_1620 +
            fStack_15f4 * fVar211 +
            fVar68 * local_14f8 +
            fStack_1544 * fVar102 +
            fVar112 * fStack_1544 +
            local_498 * fVar62 * local_14f8 +
            fVar171 * fStack_1544 +
            -fVar116 * fStack_1620 +
            fStack_14ec * fVar166 +
            -local_4a8 * fStack_1620 +
            fStack_15f4 * local_4b8 +
            local_448 * fStack_1620 +
            -local_468 * fStack_15f4 +
            -(float)local_3e8 * local_14f8 +
            fVar187 * fStack_1620 +
            fStack_1544 * fStack_744 +
            fStack_1394 * fStack_1620 +
            local_1018 * local_14f8 +
            fStack_330 * local_14f8 +
            fStack_1544 * fVar181 +
            local_14f8 * fVar154 +
            fStack_1544 * fStack_c44 +
            fStack_1620 * -fStack_784 +
            fStack_14ec * fVar44 +
            local_478._0_4_ * fStack_1620 +
            fVar149 * fStack_1620 +
            fStack_14ec * -local_4c8 +
            fStack_15f4 * -local_1538 +
            local_958 * local_14f8 +
            local_14f8 * -fVar191 +
            local_488 * fStack_1620 +
            fVar98 * fStack_1620 +
            local_14f8 * fVar193 +
            local_348 * fStack_1544 +
            -fStack_d84 * local_14f8 +
            -fVar184 * fStack_1544 +
            fStack_d54 * local_14f8 +
            fStack_1014 * fStack_1544 +
            fStack_1424 * fStack_1620 +
            fStack_1054 * fStack_14ec +
            fStack_9c4 * fStack_1620 +
            fStack_15f4 * local_1128 +
            local_d68 * local_14f8 +
            fStack_c74 * fStack_1544 +
            fStack_1620 * fVar57 +
            -fVar210 * fStack_1544 +
            fStack_1464 * fStack_1620 +
            -fStack_1044 * local_14f8 +
            ((local_fb8 * fStack_1544 +
             (float)local_1578 * local_14f8 +
             fStack_1544 * local_f48 +
             fVar204 * fStack_1620 +
             local_d48 * fStack_1620 +
             fStack_14ec * -fStack_e74 +
             ((-fVar194 * fStack_1620 +
              ((((((((((((((fVar114 - fStack_d7c * local_14f8) - fVar179) + fVar122) - fVar141) +
                        fVar103 + fVar60) - fVar75) + fVar63) - fVar106) - fVar115 * local_14f8) +
                   fVar40 + fVar201 + fVar38) - fVar144) + fVar153 + fVar157 + fVar145 + fVar199 +
                 local_528 + fVar113 + local_4f8 * local_14f8) - fVar175) - fVar208) + fVar213 +
              fVar70 + local_538) - fStack_15f4 * auStack_7d4._60_4_)) - local_b08 * fStack_1544) +
            local_14f8 * fVar200 + fStack_1544 * fVar41;
      local_8b8.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = -fStack_8d4 * fVar127 * local_14f8 +
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd] * fStack_8d4 * fStack_1544 +
            fStack_e54 * fStack_1620 +
            -fVar110 * fStack_1620 +
            (float)uStack_160 * local_14f8 +
            fStack_e4 * fStack_1620 +
            fVar64 * fStack_1544 +
            fStack_1620 * fStack_8f0 +
            local_14f8 * fStack_904 +
            fStack_1544 * fVar77 +
            -fVar74 * fStack_1620 +
            fStack_1620 * fVar100 +
            fVar111 * fStack_1620 +
            fStack_1620 * local_e88 +
            -local_9f8 * fVar127 * local_14f8 +
            local_1438 * fStack_1544 +
            local_e98 * local_14f8 +
            fStack_f54 * local_10c8 +
            fVar117 * fStack_1544 +
            fVar43 * fStack_204 +
            local_c58 * fStack_1620 +
            -local_948 * fStack_1620 +
            fStack_1620 * -local_728 +
            fStack_1620 * local_10d8 +
            local_11f8 * fStack_1620 +
            local_14f8 * -local_c68 +
            local_15e8 * local_eb8 +
            local_12e8 * fStack_1620 +
            -local_988 * fStack_1620 +
            fStack_1544 * fStack_15c0 +
            -local_10f8 * local_eb8 +
            local_13d8 * fStack_1620 +
            fStack_c84 * local_14f8 +
            fStack_d34 * fStack_1620 +
            local_278._4_4_ * fStack_1620 +
            local_14f8 * local_968 +
            local_eb8 * local_978._4_4_ +
            fStack_d24 * fStack_1620 +
            local_1238 * fStack_1620 +
            local_eb8 * local_9e8 +
            fStack_1544 * -local_11e8 +
            fStack_11d4 * fStack_1620 +
            fStack_1620 * fStack_1374 +
            -local_a78 * fStack_1544 +
            local_15a8 * local_eb8 +
            fStack_1404 * fStack_1620 +
            fVar67 * fStack_1620 +
            local_6b8 * local_eb8 +
            fStack_734 * local_14f8 +
            -local_1518 * fStack_1544 +
            local_12a8 * fStack_1620 +
            local_1218 * fStack_1620 +
            local_14f8 * local_1248 +
            local_14b8 * fStack_1620 +
            -local_11a8 * fStack_1620 +
            -local_1388 * local_14f8 +
            fStack_1544 * local_1488 +
            local_ee8 * fStack_1620 +
            fStack_1620 * local_998 +
            local_1148 * fStack_1544 +
            -local_1588 * fStack_1544 +
            fVar105 * fStack_15f4 +
            fStack_15f4 * (float)local_2c8 +
            fStack_1544 * local_d88 +
            local_14f8 * (float)local_2d8 +
            local_1108 * fStack_1544 +
            fStack_1620 * local_fd8 +
            fStack_15f4 * fVar137 +
            fStack_1620 * local_e78 +
            fStack_1544 * local_fc8 +
            fStack_15f4 * fVar69 +
            local_14f8 * local_e28 +
            fStack_1620 * -local_108 +
            local_6f8 * fStack_1544 +
            local_ca8 * local_14f8 +
            -local_718._0_4_ * fStack_1544 +
            local_cd8 * fStack_1620 +
            fVar109 * fStack_15f4 +
            fStack_1620 *
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[8] +
            local_14f8 * local_b28 +
            local_6e8 * local_14f8 +
            fStack_1620 * local_1418 +
            (float)local_408 * fStack_1620 +
            fStack_1544 * local_1008 +
            local_ac8 * fStack_1544 +
            fStack_1620 * -local_cf8 +
            fVar42 * fStack_15f4 +
            local_1448 * fStack_1544 +
            local_b88 * fStack_1620 +
            fVar143 * fStack_1544 +
            fStack_15f4 * fVar150 * fVar127 +
            (float)local_438 * fStack_1544 +
            fStack_1544 * local_6a8 +
            fStack_6d4 * fStack_1620 +
            local_318 * fStack_15f4 +
            local_748 * local_14f8 +
            -fVar198 * fStack_1544 +
            fStack_1620 * local_12b8 +
            local_1398 * local_14f8 +
            local_fa8 * fStack_1620 +
            local_6c8 * fStack_1544 +
            fStack_1620 * -local_11c8 +
            local_14f8 * -local_c8 +
            fStack_1544 * local_c48 +
            fStack_1620 * local_788 +
            fStack_1620 * fVar138 +
            local_b68 * local_14f8 +
            -local_ff8 * local_14f8 +
            fStack_14ec * local_f18 +
            fStack_14ec * -fStack_1534 +
            fStack_954 * local_14f8 +
            fStack_14ec * local_f88 +
            local_b58 * local_14f8 +
            -local_1458 * local_14f8 +
            fStack_1544 * local_b48 +
            local_fe8 * fStack_1620 +
            fVar59 * fStack_1620 +
            local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[4] * fStack_14ec +
            local_d58 * local_14f8 +
            -local_1278 * fStack_1620 +
            local_1428 * local_14f8 +
            local_1058 * fStack_14ec +
            local_9c8 * local_14f8 +
            local_14f8 * fVar189 +
            -local_ae8 * fStack_1620 +
            local_c78 * fStack_14ec +
            fStack_1544 * fVar119 +
            local_11b8 * fStack_1620 +
            local_1468 * local_14f8 +
            local_708 * local_14f8 +
            ((fStack_fb4 * fStack_1620 +
             fVar188 * fStack_1620 +
             fStack_14ec * fStack_f44 +
             -local_ad8 * local_14f8 +
             fStack_d44 * local_14f8 +
             fStack_1620 * local_1158 +
             ((local_15b8 * fStack_1544 + (local_388 - local_f38) + local_398) -
             fStack_14ec * local_3a8)) - fStack_b04 * fStack_1544) + fStack_1620 * local_e18 +
            fStack_1544 * fVar55;
      fStack_161c = fStack_1620;
      fStack_15fc = fStack_1600;
      fStack_15f0 = fStack_15f4;
      fStack_15ec = fStack_15f4;
      fStack_1584 = fVar126;
      fStack_157c = fVar131;
      fStack_1554 = fVar214;
      fStack_154c = fVar215;
      local_1548 = fStack_1620;
      fStack_1540 = fStack_1620;
      fStack_153c = fStack_1544;
      fStack_14f4 = fStack_1544;
      fStack_14f0 = fStack_1620;
      fStack_1494 = local_1498;
      fStack_1490 = local_1498;
      fStack_148c = local_1498;
      fStack_1484 = fVar126;
      fStack_1480 = fStack_1580;
      fStack_147c = fVar131;
      fStack_1454 = fVar132;
      fStack_1450 = fVar132;
      fStack_144c = fVar132;
      fStack_1430 = fVar130;
      fStack_142c = fVar132;
      fStack_13e4 = local_1498;
      fStack_13dc = local_1608;
      fStack_13d4 = local_1608;
      local_13c8 = fStack_1620;
      fStack_13c4 = local_14f8;
      fStack_13c0 = local_14f8;
      fStack_13bc = local_14f8;
      local_13b8 = fStack_1620;
      fStack_13b4 = fStack_1544;
      fStack_13b0 = fStack_1544;
      fStack_13ac = fStack_1544;
      fStack_1384 = local_1608;
      fStack_1360 = fStack_1364;
      fStack_135c = fStack_1364;
      local_1348 = local_1608;
      fStack_1344 = local_1608;
      fStack_1340 = local_1608;
      fStack_133c = local_1608;
      fStack_12e4 = fStack_14a4;
      fStack_12e0 = fStack_14a0;
      fStack_12dc = fStack_149c;
      local_12d8 = fStack_1620;
      fStack_12d4 = local_14f8;
      fStack_12d0 = fStack_1620;
      fStack_12cc = local_14f8;
      local_12c8 = fStack_14ec;
      fStack_12c4 = fStack_14ec;
      fStack_12c0 = fStack_14ec;
      fStack_12bc = fStack_14ec;
      local_1298 = fVar108;
      fStack_1294 = fStack_1580;
      fStack_1290 = fStack_1580;
      fStack_128c = fVar131;
      fStack_1274 = local_1498;
      fStack_1270 = local_1498;
      fStack_126c = local_1498;
      fStack_11f4 = local_1608;
      fStack_11e4 = local_1498;
      fStack_11e0 = fStack_13e0;
      fStack_11dc = local_1608;
      fStack_11c4 = local_1608;
      fStack_11c0 = local_1608;
      fStack_11bc = local_1608;
      fStack_11b4 = local_1498;
      fStack_11b0 = fStack_13e0;
      fStack_11ac = local_1608;
      fStack_11a4 = fStack_1214;
      fStack_11a0 = fStack_1210;
      fStack_119c = fStack_120c;
      fStack_1194 = fStack_1214;
      fStack_1190 = fStack_1210;
      fStack_118c = fStack_120c;
      fStack_1144 = local_1608;
      local_1138 = fStack_15f4;
      fStack_112c = fStack_1130;
      local_1118 = fStack_1620;
      fStack_1114 = fStack_1620;
      fStack_1110 = fStack_1544;
      fStack_110c = fStack_1620;
      fStack_10f4 = fVar126;
      fStack_10f0 = fVar126;
      fStack_10ec = fVar126;
      local_1038 = local_14f8;
      fStack_1034 = fStack_14ec;
      fStack_1030 = local_14f8;
      fStack_102c = local_14f8;
      local_1028 = fStack_1544;
      fStack_1024 = fStack_1544;
      fStack_1020 = fStack_1620;
      fStack_101c = fStack_1544;
      fStack_ff4 = fVar126;
      fStack_ff0 = fStack_1580;
      fStack_fec = fVar131;
      fStack_fe4 = fVar126;
      fStack_fe0 = fStack_1580;
      fStack_fdc = fVar131;
      fStack_fd4 = fStack_1104;
      fStack_fd0 = fStack_1100;
      fStack_fcc = fStack_10fc;
      fStack_fc4 = local_1608;
      fStack_fa4 = local_1608;
      fStack_fa0 = local_1608;
      fStack_f9c = local_1608;
      local_f98 = local_14f8;
      fStack_f94 = fStack_1620;
      fStack_f90 = fStack_1620;
      fStack_f8c = fStack_1620;
      fStack_f84 = fVar126;
      fStack_f80 = fStack_1580;
      fStack_f7c = fVar131;
      local_f68 = local_14f8;
      fStack_f64 = fStack_1620;
      fStack_f60 = local_14f8;
      fStack_f5c = local_14f8;
      local_f58 = fStack_1620;
      fStack_f50 = local_14f8;
      fStack_f34 = local_1498;
      fStack_f30 = fStack_13e0;
      fStack_f2c = local_1608;
      local_f28 = fStack_1544;
      fStack_f24 = local_14f8;
      fStack_f20 = fStack_1620;
      fStack_f1c = fStack_1620;
      fStack_f14 = fVar127;
      fStack_f10 = fVar130;
      fStack_f0c = fVar132;
      fStack_ee4 = local_1608;
      local_ea8 = fStack_1620;
      fStack_ea4 = fStack_1544;
      fStack_ea0 = local_eb8;
      fStack_e9c = fStack_1544;
      fStack_e94 = fVar126;
      fStack_e90 = fVar126;
      fStack_e8c = fVar126;
      fStack_e84 = fVar126;
      fStack_e80 = fStack_1580;
      fStack_e7c = fVar131;
      fStack_e60 = fStack_e64;
      fStack_e5c = fStack_e64;
      fStack_e40 = fStack_1620;
      fStack_e3c = local_14f8;
      fStack_e34 = local_1608;
      local_da8 = local_14f8;
      fStack_da4 = fStack_1620;
      fStack_da0 = fStack_1620;
      fStack_d9c = fStack_14ec;
      local_d98 = local_14f8;
      fStack_d94 = local_14f8;
      fStack_d90 = local_14f8;
      fStack_d8c = local_14f8;
      local_d78 = fStack_1544;
      fStack_d74 = fStack_1544;
      fStack_d70 = fStack_1544;
      fStack_d6c = fStack_1544;
      fStack_d60 = fStack_d64;
      fStack_d5c = fStack_d64;
      fStack_d00 = fStack_d04;
      fStack_cfc = fStack_d04;
      fStack_ce4 = local_1608;
      fStack_ce0 = local_1608;
      fStack_cdc = local_1608;
      fStack_c64 = local_1608;
      fStack_c54 = local_1608;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = fVar132;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = fVar130;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = fVar132;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = fStack_1434;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = fVar130;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = fVar130;
      local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = fVar132;
      fStack_bc4 = local_1608;
      fStack_b94 = fStack_cb4;
      uStack_b90 = uStack_cb0;
      uStack_b8c = uStack_cac;
      fStack_b84 = local_1498;
      fStack_b80 = fStack_13e0;
      fStack_b7c = local_1608;
      fStack_b64 = local_1608;
      fStack_b54 = local_1608;
      fStack_b44 = fVar126;
      fStack_b40 = fStack_1580;
      fStack_b3c = fVar131;
      fStack_b34 = fVar126;
      fStack_b30 = fStack_1580;
      fStack_b2c = fVar131;
      fStack_b24 = fStack_1434;
      fStack_b20 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10];
      fStack_b1c = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xb];
      local_b18 = local_d88;
      fStack_b14 = fStack_d80;
      fStack_af0 = fStack_af4;
      fStack_aec = fStack_af4;
      fStack_ae4 = fStack_d64;
      fStack_ad4 = fStack_1154;
      fStack_ad0 = fStack_1150;
      fStack_acc = fStack_114c;
      fStack_aa4 = local_1498;
      fStack_aa0 = local_1498;
      fStack_a9c = local_1498;
      fStack_a64 = fVar126;
      fStack_a60 = fStack_1580;
      fStack_a5c = fVar131;
      fStack_a14 = local_1608;
      fStack_9f4 = local_1608;
      fStack_9a0 = fVar132;
      fStack_984 = local_1608;
      fStack_944 = fVar126;
      fStack_940 = fStack_1580;
      fStack_93c = fVar131;
      fStack_934 = fVar127;
      fStack_930 = fVar127;
      fStack_92c = fVar127;
      fStack_910 = fStack_914;
      fStack_90c = fStack_914;
      fStack_8ec = fStack_8f4;
      fStack_8e4 = fStack_c34;
      fStack_8e0 = fStack_c30;
      fStack_8dc = fStack_c2c;
      fStack_774 = fVar132;
      fStack_770 = fVar130;
      fStack_76c = fVar132;
      fStack_764 = fVar126;
      fStack_760 = fVar126;
      fStack_75c = fVar126;
      local_758 = fStack_d84;
      fStack_754 = fStack_d7c;
      fStack_704 = fVar127;
      fStack_700 = fVar127;
      fStack_6fc = fVar127;
      fStack_6a4 = fStack_1104;
      fStack_6a0 = fStack_1100;
      fStack_69c = fStack_10fc;
      local_548 = local_d68;
      fStack_544 = fStack_d64;
      fStack_540 = fStack_d64;
      fStack_53c = fStack_d64;
      fStack_534 = fVar131;
      fStack_530 = fStack_1580;
      fStack_52c = fVar131;
      fStack_524 = fVar132;
      fStack_520 = fVar132;
      fStack_51c = fVar132;
      fStack_50c = fVar131;
      fStack_4f4 = fStack_1104;
      fStack_4f0 = fStack_1100;
      fStack_4ec = fStack_10fc;
      local_4d8 = fStack_1434;
      fStack_4d4 = fVar126;
      fStack_4d0 = fVar131;
      fStack_4cc = fVar131;
      fStack_4b4 = fVar132;
      fStack_4b0 = fVar130;
      fStack_4ac = fVar132;
      fStack_4a4 = fStack_1104;
      fStack_4a0 = fStack_1100;
      fStack_49c = fStack_10fc;
      fStack_494 = fVar126;
      fStack_490 = fVar126;
      fStack_48c = fVar126;
      fStack_480 = fVar131;
      fStack_464 = fVar132;
      fStack_460 = fVar130;
      fStack_45c = fVar132;
      fStack_454 = fVar132;
      fStack_450 = fVar132;
      fStack_44c = fVar132;
      fStack_444 = fStack_1104;
      fStack_440 = fStack_1100;
      fStack_43c = fStack_10fc;
      fStack_424 = fVar126;
      fStack_420 = fStack_1580;
      fStack_41c = fVar131;
      _local_3e8 = auVar78;
      fStack_3d4 = fVar126;
      fStack_3d0 = fStack_1580;
      fStack_3cc = fVar131;
      fStack_3c4 = fVar127;
      fStack_3c0 = fVar127;
      fStack_3bc = fVar127;
      fStack_3b4 = fVar126;
      fStack_3b0 = fStack_1580;
      fStack_3ac = fVar131;
      fStack_3a4 = fVar131;
      fStack_3a0 = fStack_1580;
      fStack_39c = fVar131;
      fStack_394 = fVar131;
      fStack_390 = fStack_1580;
      fStack_38c = fVar131;
      fStack_384 = fVar131;
      fStack_380 = fStack_1580;
      fStack_37c = fVar131;
      fStack_374 = local_1498;
      fStack_370 = fStack_13e0;
      fStack_36c = local_1608;
      fStack_364 = fVar132;
      fStack_360 = fVar132;
      fStack_35c = fVar132;
      fStack_354 = fVar131;
      fStack_350 = fVar131;
      fStack_34c = fVar131;
      fStack_334 = local_1498;
      fStack_324 = fVar126;
      fStack_320 = fStack_1580;
      fStack_31c = fVar131;
      fStack_304 = fVar126;
      fStack_300 = fVar126;
      fStack_2fc = fVar126;
      fStack_2f4 = fVar126;
      fStack_2f0 = fStack_1580;
      fStack_2ec = fVar131;
      fStack_2a4 = fStack_9d4;
      fStack_2a0 = fStack_9d4;
      fStack_29c = fStack_9d4;
      fStack_284 = local_1608;
      local_278 = uVar34;
      fStack_26c = fStack_cc4;
      fStack_250 = fVar126;
      fStack_244 = fVar126;
      fStack_240 = fStack_1580;
      fStack_23c = fVar131;
      local_208 = fStack_f54;
      fStack_200 = fStack_f4c;
      fStack_1fc = fStack_f4c;
      local_1e8 = local_258;
      fStack_1e4 = fVar126;
      fStack_1e0 = fStack_1580;
      fStack_1dc = fVar131;
      fStack_1c4 = fVar131;
      fStack_1c0 = fStack_1580;
      fStack_1bc = fVar131;
      fStack_1b0 = fStack_1b4;
      fStack_1ac = fStack_1b4;
      fStack_1a4 = fStack_1154;
      fStack_1a0 = fStack_1150;
      fStack_19c = fStack_114c;
      fStack_194 = local_1608;
      fStack_184 = fStack_1434;
      fStack_180 = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10];
      fStack_17c = local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xb];
      fStack_170 = fVar126;
      fStack_144 = fVar127;
      fStack_140 = fVar130;
      fStack_13c = fVar132;
      fStack_124 = local_1498;
      fStack_120 = fStack_13e0;
      fStack_11c = local_1608;
      fStack_114 = fVar126;
      fStack_110 = fVar126;
      fStack_10c = fVar126;
      fStack_104 = local_1498;
      fStack_100 = local_1498;
      fStack_fc = local_1498;
      local_f8 = fStack_8f4;
      fStack_f4 = fStack_8f0;
      fStack_d4 = fVar127;
      fStack_d0 = fVar130;
      fStack_cc = fVar132;
      fStack_c4 = local_1608;
      fStack_c0 = fStack_13e0;
      fStack_bc = local_1608;
      o4_roots<float>((vector<float,_std::allocator<float>_> *)&local_1330,
                      (Matrix<float,_5,_1,_0,_5,_1> *)&local_8b8);
      *(undefined8 *)local_14e8 = 0;
      *(pointer *)(local_14e8 + 8) = (pointer)0x0;
      *(pointer *)(local_14e8 + 0x10) = (pointer)0x0;
      uVar34 = (ulong)(local_1330.
                       super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                       .m_rows.m_value -
                      (long)local_1330.
                            super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                            .
                            super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                            .
                            super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                            .m_data) >> 2;
      if ((int)uVar34 != 0) {
        fStack_15f4 = -local_13a8._4_4_;
        fStack_15f0 = -fStack_13a0;
        fStack_15ec = -fStack_139c;
        local_15f8 = -(float)local_13a8 * (float)local_1648._0_4_ * fVar45 +
                     fVar108 * local_bc8 * fVar130 +
                     fVar108 * local_e38 * fVar169 + -local_e38 * local_14a8 * fVar45;
        local_15e8 = fVar108 * local_e38 * fVar127 - fVar45 * local_e38 * fVar126;
        local_13a8 = CONCAT44(local_13a8._4_4_,
                              -(float)local_13a8 * (float)local_1648._0_4_ * fVar127 +
                              local_bc8 * fVar126 * fVar130 +
                              local_e38 * fVar126 * fVar169 + -local_e38 * local_14a8 * fVar127) ^
                     0x8000000000000000;
        fStack_13a0 = fStack_15f0;
        fStack_139c = fStack_15ec;
        local_1538 = -local_13e8;
        fStack_1534 = -fStack_13e4;
        fStack_1530 = -fStack_13e0;
        fStack_152c = -fStack_13dc;
        do {
          fVar36 = *(float *)(local_1330.
                              super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                              .
                              super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                              .
                              super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                              .
                              super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                              .m_rows.m_value + -4);
          auVar164._0_4_ = 1.0 - fVar36 * fVar36;
          auVar125._0_4_ = fVar36 * fVar36 + 1.0;
          auVar164._4_4_ = fVar36 + fVar36;
          auVar164._8_8_ = 0;
          auVar125._4_4_ = auVar125._0_4_;
          auVar125._8_4_ = auVar125._0_4_;
          auVar125._12_4_ = auVar125._0_4_;
          auVar78 = divps(auVar164,auVar125);
          local_164c = auVar78._0_4_;
          local_1568 = (float)local_1358._0_4_ * local_164c;
          local_115c = auVar78._4_4_;
          fVar42 = local_1498 * local_164c;
          local_15a8 = fVar42;
          fVar128 = (float)local_e08._0_4_ * local_164c * local_1538;
          fVar194 = fVar131 * fVar128;
          local_1508 = fVar194;
          fVar36 = local_1558 * local_1568;
          fVar55 = fVar215 * local_1568;
          local_1518 = fVar55;
          fStack_1424 = -local_115c;
          fStack_1420 = -auVar78._8_4_;
          fStack_141c = -auVar78._12_4_;
          local_13f8 = local_1348 * -local_164c * (float)local_e08._0_4_ * fVar108;
          fStack_1404 = -(float)local_e08._4_4_;
          fStack_1400 = -fStack_e00;
          fStack_13fc = -fStack_dfc;
          local_1408 = -((float)local_e08._0_4_ * fVar42) * fVar152;
          local_1418 = fVar214 * local_1568;
          local_1368 = fVar108 * local_1418;
          local_1568 = local_1568 * local_1608;
          local_1428 = -local_164c * local_1198 * (float)local_e08._0_4_ * fVar126;
          fVar128 = fVar128 * (float)local_1648._0_4_;
          local_1638._0_4_ = fVar128;
          fVar133 = local_13e8 * local_115c;
          _local_1628 = CONCAT44(fStack_13e4,fVar133);
          fStack_1620 = fStack_13e0;
          fStack_161c = fStack_13dc;
          fStack_14b4 = -(float)local_e08._4_4_;
          fStack_14b0 = -fStack_e00;
          fStack_14ac = -fStack_dfc;
          local_14b8 = -((float)local_e08._0_4_ * fVar133) * fVar152;
          fVar37 = (float)local_e08._0_4_ * local_1498 * local_115c;
          local_1378 = fVar131 * fVar37;
          fVar38 = (float)local_1358._0_4_ * local_115c;
          local_1388 = local_1558 * fVar38;
          local_14c8 = fVar108 * local_1388;
          local_15b8 = fVar215 * fVar38;
          fStack_1570 = -(float)local_1358._8_4_;
          fStack_156c = -fStack_134c;
          fVar65 = fVar214 * -fVar38;
          local_1598 = fVar65;
          fVar56 = -fVar38 * local_1608;
          local_1578 = CONCAT44(local_1358._4_4_,fVar56) ^ 0x8000000000000000;
          fStack_1394 = -local_115c;
          fStack_1390 = -local_115c;
          fStack_138c = -local_115c;
          local_c28.m_dst =
               (DstEvaluatorType *)(CONCAT44(local_c28.m_dst._4_4_,local_115c) ^ 0x80000000);
          local_1398 = -local_115c * local_1348 * (float)local_e08._0_4_ * fVar126;
          local_11a8 = local_1198 * local_115c * (float)local_e08._0_4_ * fVar108;
          fVar37 = fVar37 * (float)local_1648._0_4_;
          local_11b8 = local_c38 * local_115c;
          fVar61 = local_115c * local_164c;
          local_de8._0_4_ = local_164c;
          local_14d8._0_4_ = local_164c * local_164c;
          fVar38 = local_13e8 * (float)local_14d8._0_4_;
          local_11c8 = local_1348 * (float)local_14d8._0_4_;
          fVar43 = fVar214 * fVar38;
          local_1528 = fVar43;
          local_12b8 = (float)local_1648._0_4_ * fVar43;
          fVar39 = local_1498 * (float)local_14d8._0_4_;
          local_15d8 = local_1558 * fVar39;
          local_14d8._0_4_ = (float)local_14d8._0_4_ * local_1198;
          local_14d8._4_4_ = local_115c;
          fStack_14d0 = auVar78._8_4_;
          fStack_14cc = auVar78._12_4_;
          fVar149 = local_115c * local_115c;
          local_11e8 = local_13e8 * fVar149;
          fStack_11e4 = fStack_13e4;
          fStack_11e0 = fStack_13e0;
          fStack_11dc = fStack_13dc;
          fVar40 = local_1498 * fVar149;
          local_11d8 = local_1558 * fVar40;
          local_11f8 = local_1348 * fVar149;
          fVar59 = local_13e8 * fVar61;
          local_1228 = local_1558 * fVar59;
          fStack_1224 = fStack_1554;
          fStack_1220 = fStack_1550;
          fStack_121c = fStack_154c;
          fStack_1204 = -fStack_1554;
          fStack_1200 = -fStack_1550;
          fStack_11fc = -fStack_154c;
          local_1208 = -local_1228 * (float)local_1648._0_4_;
          local_1238 = fVar214 * fVar59;
          local_1218 = (float)local_1648._0_4_ * local_1238;
          fVar64 = -fVar59 * fVar215 * (float)local_1648._0_4_;
          local_1248 = local_1608 * fVar59 * (float)local_1648._0_4_;
          fStack_1244 = fStack_1604;
          fStack_1240 = fStack_1600;
          fStack_123c = fStack_15fc;
          fVar41 = local_1498 * fVar61;
          fVar60 = local_1558 * fVar41;
          local_1268._0_4_ = fVar60;
          fVar59 = (float)local_1648._0_4_ * fVar60;
          local_15c8 = fVar59;
          fVar44 = fVar215 * fVar41 * (float)local_1648._0_4_;
          _local_1258 = CONCAT44(fStack_1254,fVar44);
          fVar57 = local_1558 * local_1348 * fVar61;
          _local_1288 = CONCAT44(fStack_1284,fVar57);
          local_1278 = local_1348 * fVar61 * fVar214;
          local_1438 = local_1558 * fVar61 * local_1198;
          local_12a8 = fVar214 * fVar41;
          local_1298 = (float)local_1648._0_4_ * local_12a8;
          fVar66 = fVar41 * local_1608 * (float)local_1648._0_4_;
          fStack_1610 = -local_115c;
          fStack_160c = -local_115c;
          fVar61 = -(fVar61 * local_1198) * fVar214;
          local_1618 = CONCAT44(local_115c,fVar61) ^ 0x8000000000000000;
          fVar111 = (float)local_e08._0_4_ * fVar42 * (float)local_1648._0_4_;
          fVar119 = (float)local_e08._0_4_ * fVar133 * (float)local_1648._0_4_;
          fVar41 = ((((fVar36 * fVar126 * fVar130 +
                      fVar111 * fVar45 + fVar128 * fVar127 + local_15e8) - local_1368 * fVar130) +
                    fVar119 * fVar45) - local_14c8 * fVar130) + fVar37 * fVar127 +
                   fVar65 * fVar126 * fVar130 + local_12b8 * fVar130;
          fVar58 = -fVar39 * local_1558 * (float)local_1648._0_4_;
          fVar120 = fVar214 * local_11e8 * (float)local_1648._0_4_;
          fVar63 = fVar120 * fVar130;
          local_14f8 = (float)local_1648._0_4_ * local_11d8 * fVar130;
          local_c08.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = -(fVar126 * fVar61 * fVar130 +
                      fVar66 * fVar127 +
                      ((local_1298 * fVar62 +
                       (((fVar126 * fVar57 * fVar130 +
                         fVar44 * fVar45 +
                         ((fVar59 * fVar132 +
                          local_1248 * fVar45 +
                          fVar64 * fVar127 +
                          ((local_1218 * fVar132 +
                           fVar152 * local_1228 * fVar130 +
                           local_1208 * fVar62 +
                           fVar214 * fVar149 * local_1198 * fVar108 * fVar130 +
                           (((fVar215 * fVar40 * (float)local_1648._0_4_ * fVar127 +
                             fVar214 * fVar40 * fVar131 * fVar130 +
                             (((float)local_1648._0_4_ * local_11d8 * fVar62 +
                              ((local_1558 * (float)local_14d8._0_4_ * fVar126 * fVar130 +
                               fVar152 * local_15d8 * fVar130 +
                               (((local_1558 * local_11c8 * fVar108 * fVar130 +
                                 ((local_1558 * fVar38 * fVar131 * fVar130 +
                                  (((local_14a8 * fVar65 * fVar130 +
                                    local_1498 * local_115c * local_df8 * (float)local_1648._0_4_ *
                                    fVar130 + fVar37 * fVar169 +
                                              local_11a8 * fVar45 +
                                              local_1398 * fVar45 +
                                              fVar108 * fVar56 * fVar45 +
                                              fVar108 * local_15b8 * fVar127 +
                                              fVar108 * fVar65 * fVar132 +
                                              local_14c8 * fVar62 +
                                              local_1378 * fVar45 +
                                              local_14b8 * fVar45 +
                                              local_1558 * local_c38 * local_164c *
                                              (float)local_1648._0_4_ * fVar130 +
                                              local_14a8 * fVar36 * fVar130 +
                                              local_164c * local_1538 * local_df8 *
                                              (float)local_1648._0_4_ * fVar130 +
                                              fVar128 * fVar169 +
                                              local_1428 * fVar45 +
                                              fVar108 * local_1568 * fVar127 +
                                              local_1368 * fVar62 +
                                              local_1408 * fVar45 +
                                              local_13f8 * fVar45 +
                                              fVar108 * fVar55 * fVar45 +
                                              fVar108 * fVar36 * fVar132 +
                                              fVar194 * fVar45 + local_15f8) -
                                   fVar214 * local_11b8 * (float)local_1648._0_4_ * fVar130) -
                                  (float)local_1648._0_4_ * local_1558 * fVar38 * fVar132)) -
                                 fVar215 * fVar38 * (float)local_1648._0_4_ * fVar45)) -
                                local_12b8 * fVar62) -
                               fVar38 * local_1608 * (float)local_1648._0_4_ * fVar127)) -
                              fVar152 * fVar214 * local_11e8 * fVar130)) -
                             (float)local_1648._0_4_ * fVar214 * fVar40 * fVar132)) -
                            fVar40 * local_1608 * (float)local_1648._0_4_ * fVar45) -
                           fVar214 * local_11f8 * fVar126 * fVar130)) -
                          fVar131 * local_1238 * fVar130)) - fVar131 * fVar60 * fVar130)) -
                        fVar108 * local_1278 * fVar130) - fVar108 * local_1438 * fVar130)) -
                      fVar152 * local_12a8 * fVar130)) /
                     (((fVar41 - local_15d8 * (float)local_1648._0_4_ * fVar130) + fVar63) -
                     local_14f8);
          local_14e0.data._0_4_ =
               -(fVar61 * fVar108 * fVar130 +
                local_1438 * fVar126 * fVar130 +
                local_1278 * fVar126 * fVar130 +
                fVar66 * fVar45 +
                (((local_1298 * fVar132 +
                  fVar60 * fVar152 * fVar130 +
                  (((local_1238 * fVar152 * fVar130 +
                    ((fVar57 * fVar108 * fVar130 +
                     fVar64 * fVar45 +
                     local_1228 * fVar131 * fVar130 +
                     local_1208 * fVar132 +
                     ((local_11f8 * local_1558 * fVar126 * fVar130 +
                      ((local_11e8 * local_1608 * (float)local_1648._0_4_ * fVar45 +
                       ((fVar120 * fVar132 +
                        local_1558 * local_11e8 * fVar152 * fVar130 +
                        (((float)local_14d8._0_4_ * fVar214 * fVar126 * fVar130 +
                         ((fVar214 * fVar39 * fVar152 * fVar130 +
                          ((local_11c8 * fVar214 * fVar108 * fVar130 +
                           ((fVar58 * fVar132 +
                            fVar43 * fVar131 * fVar130 +
                            local_11b8 * local_1558 * (float)local_1648._0_4_ * fVar130 +
                            local_1388 * local_14a8 * fVar130 +
                            (((local_11a8 * fVar127 +
                              local_1398 * fVar127 +
                              fVar56 * fVar126 * fVar45 +
                              local_15b8 * fVar126 * fVar127 +
                              fVar65 * fVar126 * fVar132 +
                              fVar126 * local_1388 * fVar62 +
                              local_1378 * fVar127 +
                              local_14b8 * fVar127 +
                              local_c38 * local_164c * fVar214 * (float)local_1648._0_4_ * fVar130 +
                              local_1418 * local_14a8 * fVar130 +
                              (((local_1428 * fVar127 +
                                local_1568 * fVar126 * fVar127 +
                                fVar126 * local_1418 * fVar62 +
                                local_1408 * fVar127 +
                                local_13f8 * fVar127 +
                                fVar55 * fVar126 * fVar45 +
                                fVar36 * fVar126 * fVar132 + fVar194 * fVar127 + (float)local_13a8)
                               - fVar111 * fVar169) -
                              fVar42 * local_df8 * (float)local_1648._0_4_ * fVar130)) -
                             fVar119 * fVar169) -
                            fVar133 * local_df8 * (float)local_1648._0_4_ * fVar130)) -
                           fVar215 * fVar39 * (float)local_1648._0_4_ * fVar45)) -
                          (float)local_1648._0_4_ * fVar214 * fVar39 * fVar62)) -
                         fVar39 * local_1608 * (float)local_1648._0_4_ * fVar127)) -
                        (float)local_1648._0_4_ * local_1558 * local_11e8 * fVar62)) -
                       fVar215 * local_11e8 * (float)local_1648._0_4_ * fVar127)) -
                      local_11d8 * fVar131 * fVar130)) -
                     fVar149 * local_1198 * local_1558 * fVar108 * fVar130)) - local_1218 * fVar62))
                   - local_1248 * fVar127) - fVar59 * fVar62)) - local_12a8 * fVar131 * fVar130) -
                fVar44 * fVar127)) / ((fVar58 * fVar130 + fVar41 + fVar63) - local_14f8);
          local_1330.
          super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.
          m_value = local_1330.
                    super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                    .m_rows.m_value + -4;
          local_10b8 = (undefined1  [8])local_de8;
          uStack_10b0 = 0;
          local_10a8 = (Matrix<float,_3,_3,_0,_3,_3> *)0x1;
          uStack_10a0 = (XprTypeNested)0x1;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_10b8,
                               (Scalar *)&local_c28);
          local_1160 = 0;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,(Scalar *)&local_1160);
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,(Scalar *)&local_c08);
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_115c);
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_164c);
          local_1164 = 0.0;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_1164);
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,(Scalar *)&local_14e0);
          local_1168 = 0.0;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_1168);
          local_116c = 0.0;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_116c);
          local_1170 = 1.0;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_1170);
          local_1174 = 0.0;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_1174);
          local_1178 = 0.0;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_1178);
          local_117c = 0.0;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_117c);
          local_1180 = 0.0;
          pCVar31 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar31,&local_1180);
          local_1184 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                    (pCVar31,&local_1184);
          if (((long)&(((MapBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>
                         *)(uStack_10a0->super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                           ).m_storage.m_data.array)->
                      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
                      ).m_data + uStack_10b0 != 4) ||
             (local_10a8 != (Matrix<float,_3,_3,_0,_3,_3> *)0x4)) {
            __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                          ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                          "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 4, 4>>::finished() [MatrixType = Eigen::Matrix<float, 4, 4>]"
                         );
          }
          local_c28.m_dst = (DstEvaluatorType *)&local_b8;
          local_c28.m_src = (SrcEvaluatorType *)local_de8;
          Eigen::internal::
          Assignment<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<float,_4,_4,_0,_4,_4> *)local_10b8,(SrcXprType *)&local_c28,
                (assign_op<float,_float> *)&local_1160);
          fVar36 = *(float *)&(local_c28.m_src)->
                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>_>
          ;
          fVar37 = *(float *)((long)&(local_c28.m_src)->
                                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>_>
                             + 4);
          fVar38 = *(float *)&((plainobjectbase_evaluator_data<float,_3> *)(local_c28.m_src + 1))->
                              data;
          fVar39 = *(float *)((long)&((plainobjectbase_evaluator_data<float,_3> *)
                                     (local_c28.m_src + 1))->data + 4);
          fVar40 = fVar39 * (float)local_1088 +
                   fVar38 * (float)local_1098 +
                   fVar37 * (float)local_10a8 + fVar36 * (float)local_10b8._0_4_;
          fVar59 = fVar39 * local_1088._4_4_ +
                   fVar38 * local_1098._4_4_ +
                   fVar37 * local_10a8._4_4_ + fVar36 * (float)local_10b8._4_4_;
          fVar61 = fVar39 * (float)uStack_1080 +
                   fVar38 * (float)uStack_1090 +
                   fVar37 * (float)uStack_10a0 + fVar36 * uStack_10b0._0_4_;
          fVar41 = fVar39 * uStack_1080._4_4_ +
                   fVar38 * uStack_1090._4_4_ +
                   fVar37 * uStack_10a0._4_4_ + fVar36 * uStack_10b0._4_4_;
          fVar36 = *(float *)&((plainobjectbase_evaluator_data<float,_3> *)(local_c28.m_src + 2))->
                              data;
          fVar37 = *(float *)((long)&((plainobjectbase_evaluator_data<float,_3> *)
                                     (local_c28.m_src + 2))->data + 4);
          fVar38 = *(float *)&((plainobjectbase_evaluator_data<float,_3> *)(local_c28.m_src + 3))->
                              data;
          fVar39 = *(float *)((long)&((plainobjectbase_evaluator_data<float,_3> *)
                                     (local_c28.m_src + 3))->data + 4);
          fVar42 = fVar39 * (float)local_1088 +
                   fVar38 * (float)local_1098 +
                   fVar37 * (float)local_10a8 + fVar36 * (float)local_10b8._0_4_;
          fVar43 = fVar39 * local_1088._4_4_ +
                   fVar38 * local_1098._4_4_ +
                   fVar37 * local_10a8._4_4_ + fVar36 * (float)local_10b8._4_4_;
          fVar44 = fVar39 * (float)uStack_1080 +
                   fVar38 * (float)uStack_1090 +
                   fVar37 * (float)uStack_10a0 + fVar36 * uStack_10b0._0_4_;
          fVar111 = fVar39 * uStack_1080._4_4_ +
                    fVar38 * uStack_1090._4_4_ +
                    fVar37 * uStack_10a0._4_4_ + fVar36 * uStack_10b0._4_4_;
          fVar36 = *(float *)&((plainobjectbase_evaluator_data<float,_3> *)(local_c28.m_src + 4))->
                              data;
          fVar37 = *(float *)((long)&((plainobjectbase_evaluator_data<float,_3> *)
                                     (local_c28.m_src + 4))->data + 4);
          fVar38 = *(float *)&((plainobjectbase_evaluator_data<float,_3> *)(local_c28.m_src + 5))->
                              data;
          fVar39 = *(float *)((long)&((plainobjectbase_evaluator_data<float,_3> *)
                                     (local_c28.m_src + 5))->data + 4);
          fVar119 = fVar39 * (float)local_1088 +
                    fVar38 * (float)local_1098 +
                    fVar37 * (float)local_10a8 + fVar36 * (float)local_10b8._0_4_;
          fVar120 = fVar39 * local_1088._4_4_ +
                    fVar38 * local_1098._4_4_ +
                    fVar37 * local_10a8._4_4_ + fVar36 * (float)local_10b8._4_4_;
          fVar128 = fVar39 * (float)uStack_1080 +
                    fVar38 * (float)uStack_1090 +
                    fVar37 * (float)uStack_10a0 + fVar36 * uStack_10b0._0_4_;
          fVar133 = fVar39 * uStack_1080._4_4_ +
                    fVar38 * uStack_1090._4_4_ +
                    fVar37 * uStack_10a0._4_4_ + fVar36 * uStack_10b0._4_4_;
          fVar36 = *(float *)&((plainobjectbase_evaluator_data<float,_3> *)(local_c28.m_src + 6))->
                              data;
          fVar37 = *(float *)((long)&((plainobjectbase_evaluator_data<float,_3> *)
                                     (local_c28.m_src + 6))->data + 4);
          fVar38 = *(float *)&((plainobjectbase_evaluator_data<float,_3> *)(local_c28.m_src + 7))->
                              data;
          fVar39 = *(float *)((long)&((plainobjectbase_evaluator_data<float,_3> *)
                                     (local_c28.m_src + 7))->data + 4);
          fVar149 = fVar39 * (float)local_1088 +
                    fVar38 * (float)local_1098 +
                    fVar37 * (float)local_10a8 + fVar36 * (float)local_10b8._0_4_;
          fVar194 = fVar39 * local_1088._4_4_ +
                    fVar38 * local_1098._4_4_ +
                    fVar37 * local_10a8._4_4_ + fVar36 * (float)local_10b8._4_4_;
          fVar60 = fVar39 * (float)uStack_1080 +
                   fVar38 * (float)uStack_1090 +
                   fVar37 * (float)uStack_10a0 + fVar36 * uStack_10b0._0_4_;
          fVar36 = fVar39 * uStack_1080._4_4_ +
                   fVar38 * uStack_1090._4_4_ +
                   fVar37 * uStack_10a0._4_4_ + fVar36 * uStack_10b0._4_4_;
          local_dc8 = local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xb] * fVar149 +
                      local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[10] * fVar119 +
                      local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[9] * fVar42 +
                      local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[8] * fVar40;
          fStack_dc4 = local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xb] * fVar194 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[10] * fVar120 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9] * fVar43 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[8] * fVar59;
          fStack_dc0 = local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xb] * fVar60 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[10] * fVar128 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9] * fVar44 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[8] * fVar61;
          fStack_dbc = local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xb] * fVar36 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[10] * fVar133 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[9] * fVar111 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[8] * fVar41;
          fStack_db0 = local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xf] * fVar60 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xe] * fVar128 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xd] * fVar44 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xc] * fVar61;
          fStack_dac = local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xf] * fVar36 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xe] * fVar133 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xd] * fVar111 +
                       local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0xc] * fVar41;
          local_de8._4_4_ =
               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[3] * fVar194 +
               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2] * fVar120 +
               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1] * fVar43 +
               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0] * fVar59;
          local_de8._0_4_ =
               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[3] * fVar149 +
               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[2] * fVar119 +
               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1] * fVar42 +
               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0] * fVar40;
          stack0xfffffffffffff220 =
               (DstXprType *)
               CONCAT44(local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[3] * fVar36 +
                        local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2] * fVar133 +
                        local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[1] * fVar111 +
                        local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0] * fVar41,
                        local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[3] * fVar60 +
                        local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2] * fVar128 +
                        local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[1] * fVar44 +
                        local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0] * fVar61);
          local_dd8 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                       *)CONCAT44(local_888.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[7] * fVar194 +
                                  local_888.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[6] * fVar120 +
                                  local_888.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[5] * fVar43 +
                                  local_888.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[4] * fVar59,
                                  local_888.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[7] * fVar149 +
                                  local_888.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[6] * fVar119 +
                                  local_888.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[5] * fVar42 +
                                  local_888.
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                  m_storage.m_data.array[4] * fVar40);
          uStack_dd0 = (SrcXprType *)
                       CONCAT44(local_888.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] * fVar36 +
                                local_888.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] * fVar133 +
                                local_888.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] * fVar111 +
                                local_888.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] * fVar41,
                                local_888.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] * fVar60 +
                                local_888.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] * fVar128 +
                                local_888.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] * fVar44 +
                                local_888.
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] * fVar61);
          local_db8 = CONCAT44(local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xf] * fVar194 +
                               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xe] * fVar120 +
                               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xd] * fVar43 +
                               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xc] * fVar59,
                               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xf] * fVar149 +
                               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xe] * fVar119 +
                               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xd] * fVar42 +
                               local_888.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                               .m_storage.m_data.array[0xc] * fVar40);
          __position._M_current = *(Matrix<float,_4,_4,_0,_4,_4> **)(local_14e8 + 8);
          if (__position._M_current == *(Matrix<float,_4,_4,_0,_4,_4> **)(local_14e8 + 0x10)) {
            std::
            vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
            _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                      (local_14e8,__position,(Matrix<float,_4,_4,_0,_4,_4> *)local_de8);
          }
          else {
            *(long *)(((__position._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                      array + 0xc) = local_db8;
            *(ulong *)(((__position._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 0xe) = CONCAT44(fStack_dac,fStack_db0);
            *(ulong *)(((__position._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 8) = CONCAT44(fStack_dc4,local_dc8);
            *(ulong *)(((__position._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 10) = CONCAT44(fStack_dbc,fStack_dc0);
            *(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
              **)(((__position._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                  array + 4) = local_dd8;
            *(SrcXprType **)
             (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
              .m_storage.m_data.array + 6) = uStack_dd0;
            *(undefined8 *)
             ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
             m_storage.m_data.array = local_de8._0_8_;
            *(DstXprType **)
             (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
              .m_storage.m_data.array + 2) = stack0xfffffffffffff220;
            *(Matrix<float,_4,_4,_0,_4,_4> **)(local_14e8 + 8) = __position._M_current + 1;
          }
          uVar33 = (int)uVar34 - 1;
          uVar34 = (ulong)uVar33;
        } while (uVar33 != 0);
      }
      if (local_1330.
          super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data
          != (float *)0x0) {
        operator_delete(local_1330.
                        super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                        .m_data,local_1330.
                                super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                                .m_cols.m_value -
                                (long)local_1330.
                                      super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                                      .
                                      super_BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                                      .
                                      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                                      .
                                      super_MapBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                                      .m_data);
      }
      if (local_840.
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_840.
                        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_840.
                              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_840.
                              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)local_14e8;
    }
  }
  local_14e0.data = (float *)local_de8;
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, 6, 6>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 6, 6>>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1P3L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{

	// check input vectors size
	if(plPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 plane, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu, P11, P12, Q11, Q12, P21, P22, Q21, Q22, P31, P32, Q31, Q32;
	Pi = plPair[0].first; Nu = plPair[0].second;

	P11 = lPair[0].first.first; P12 = lPair[0].first.second;
	Q11 = lPair[0].second.first; Q12 = lPair[0].second.second;
	P21 = lPair[1].first.first; P22 = lPair[1].first.second;
	Q21 = lPair[1].second.first; Q22 = lPair[1].second.second;
	P31 = lPair[2].first.first; P32 = lPair[2].first.second;
	Q31 = lPair[2].second.first; Q32 = lPair[2].second.second;

	bool verbose = false;

	Matrix<floatPrec, 3, 1> tP11, tP12, tQ11, tQ12;
	Matrix<floatPrec, 3, 1> tP21, tP22, tQ21, tQ22;
	Matrix<floatPrec, 3, 1> tP31, tP32, tQ31, tQ32;
	tP11 = P11.head(3) / P11(3);
	tP12 = P12.head(3) / P12(3);
	tQ11 = Q11.head(3) / Q11(3);
	tQ12 = Q12.head(3) / Q12(3);
	tP21 = P21.head(3) / P21(3);
	tP22 = P22.head(3) / P22(3);
	tQ21 = Q21.head(3) / Q21(3);
	tQ22 = Q22.head(3) / Q22(3);
	tP31 = P31.head(3) / P31(3);
	tP32 = P32.head(3) / P32(3);
	tQ31 = Q31.head(3) / Q31(3);
	tQ32 = Q32.head(3) / Q32(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3, 1> D1;
	Matrix<floatPrec, 6, 1> L11;
	Matrix<floatPrec, 6, 1> L21;
	Matrix<floatPrec, 6, 1> L31;

	D1 = tP12 - tP11;
	L11.head(3) = D1;
	L11.tail(3) = tP12.cross(tP11);
	L11 /= L11.head(3).norm();
	D1 = tP22 - tP21;
	L21.head(3) = D1;
	L21.tail(3) = tP22.cross(tP21);
	L21 /= L21.head(3).norm();
	D1 = tP32 - tP31;
	L31.head(3) = D1;
	L31.tail(3) = tP32.cross(tP31);
	L31 /= L31.head(3).norm();

	// starting from line 2
	Matrix<floatPrec, 6, 1> L12;
	Matrix<floatPrec, 6, 1> L22;
	Matrix<floatPrec, 6, 1> L32;
	D1 = tQ12 - tQ11;
	L12.head(3) = D1;
	L12.tail(3) = tQ12.cross(tQ11);
	L12 /= L12.head(3).norm();
	D1 = tQ22 - tQ21;
	L22.head(3) = D1;
	L22.tail(3) = tQ22.cross(tQ21);
	L22 /= L22.head(3).norm();
	D1 = tQ32 - tQ31;
	L32.head(3) = D1;
	L32.tail(3) = tQ32.cross(tQ31);
	L32 /= L32.head(3).norm();

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU = predTrans.back();
	predTrans.pop_back();

	if (verbose)
		cout << "[VERBOSE] Matrix TU" << endl
			 << TU << endl;
	if (verbose)
		cout << "[VERBOSE] Matrix TV" << endl
			 << TV << endl;

	// define the transformation to the lines
	Matrix<floatPrec, 6, 6> TL, TK;
	TL = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TL.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TL" << endl
			 << TL << endl;

	TK = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TK.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TK" << endl
			 << TK << endl;

	// apply predefined transformations to the lines
	// get the coefficients
	// get parameters of the first line correspondence
	Matrix<floatPrec, 6, 1> u1;
	floatPrec u11, u12, u13, u14, u15, u16;
	u1 = TL * L11;
	u11 = u1(0);
	u12 = u1(1);
	u13 = u1(2);
	u14 = u1(3);
	u15 = u1(4);
	u16 = u1(5);
	Matrix<floatPrec, 6, 1> v1;
	floatPrec v11, v12, v13, v14, v15, v16;
	v1 = TK * L12;
	v11 = v1(0);
	v12 = v1(1);
	v13 = v1(2);
	v14 = v1(3);
	v15 = v1(4);
	v16 = v1(5);

	// get the parameters of the secod line correspondence
	Matrix<floatPrec, 6, 1> u2;
	floatPrec u21, u22, u23, u24, u25, u26;
	u2 = TL * L21;
	u21 = u2(0);
	u22 = u2(1);
	u23 = u2(2);
	u24 = u2(3);
	u25 = u2(4);
	u26 = u2(5);

	Matrix<floatPrec, 6, 1> v2;
	floatPrec v21, v22, v23, v24, v25, v26;
	v2 = TK * L22;
	v21 = v2(0);
	v22 = v2(1);
	v23 = v2(2);
	v24 = v2(3);
	v25 = v2(4);
	v26 = v2(5);

	// get the parameters of the third line correspondence
	Matrix<floatPrec, 6, 1> u3;
	floatPrec u31, u32, u33, u34, u35, u36;
	u3 = TL * L31;
	u31 = u3(0);
	u32 = u3(1);
	u33 = u3(2);
	u34 = u3(3);
	u35 = u3(4);
	u36 = u3(5);

	Matrix<floatPrec, 6, 1> v3;
	floatPrec v31, v32, v33, v34, v35, v36;
	v3 = TK * L32;
	v31 = v3(0);
	v32 = v3(1);
	v33 = v3(2);
	v34 = v3(3);
	v35 = v3(4);
	v36 = v3(5);

	// compute the coefficients
	floatPrec c1, c2, c3, c4, c5;
	c1 = u11*u21*u32*v13*v24*v33 - u11*u21*u32*v14*v23*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 - u11*u22*u31*v13*v23*v34 + u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 - u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 - u11*u23*u33*v14*v21*v32 + u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 + u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 + u12*u21*u31*v13*v23*v34 - u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 + u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 - u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 + u13*u21*u33*v11*v24*v32 - u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 - u13*u23*u31*v11*v22*v34 + u13*u23*u31*v12*v21*v34 - u13*u23*u34*v11*v22*v31 + u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 + u13*u24*u33*v11*v21*v32 - u13*u24*u33*v12*v21*v31 - u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 + u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 - u14*u23*u33*v11*v21*v32 + u14*u23*u33*v11*v22*v31 - u11*u22*u32*v13*v23*v35 + u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 - u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 + u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 + u12*u21*u32*v13*v23*v35 - u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 + u12*u21*u35*v13*v23*v32 - u12*u22*u31*v13*v25*v33 + u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 - u12*u23*u33*v15*v21*v32 + u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 - u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 + u13*u22*u33*v11*v25*v32 - u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 - u13*u23*u32*v11*v22*v35 + u13*u23*u32*v12*v21*v35 - u13*u23*u35*v11*v22*v32 + u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 + u13*u25*u33*v11*v22*v32 - u13*u25*u33*v12*v22*v31 - u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 + u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 - u15*u23*u33*v12*v21*v32 + u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 + u11*u23*u33*v13*v22*v36 - u11*u23*u33*v13*v26*v32 + u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 - u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 - u12*u23*u33*v13*v21*v36 + u12*u23*u33*v13*v26*v31 - u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 + u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 - u13*u21*u33*v12*v23*v36 + u13*u21*u33*v16*v23*v32 - u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 + u13*u22*u33*v11*v23*v36 - u13*u22*u33*v16*v23*v31 + u13*u22*u36*v11*v23*v33 + u13*u23*u31*v12*v26*v33 - u13*u23*u31*v16*v22*v33 - u13*u23*u32*v11*v26*v33 + u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 + u13*u26*u31*v12*v23*v33 - u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 + u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 - u16*u22*u33*v13*v23*v31 - u16*u23*u31*v13*v22*v33 + u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;
	c2 = 2*u11*u21*u33*v13*v24*v31 - 2*u11*u21*u33*v14*v23*v31 - 2*u11*u23*u31*v13*v21*v34 + 2*u11*u23*u31*v14*v21*v33 - 2*u11*u23*u34*v13*v21*v31 + 2*u11*u24*u33*v13*v21*v31 + 2*u13*u21*u31*v11*v23*v34 - 2*u13*u21*u31*v11*v24*v33 + 2*u13*u21*u34*v11*v23*v31 - 2*u13*u24*u31*v11*v21*v33 - 2*u14*u21*u33*v11*v23*v31 + 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 - 2*u11*u21*u33*v13*v25*v32 + 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 + 2*u11*u22*u33*v13*v24*v32 + 2*u11*u22*u33*v13*v25*v31 - 2*u11*u22*u33*v14*v23*v32 - 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 + 2*u11*u23*u31*v13*v22*v35 - 2*u11*u23*u31*v15*v22*v33 - 2*u11*u23*u32*v13*v21*v35 - 2*u11*u23*u32*v13*v22*v34 + 2*u11*u23*u32*v14*v22*v33 + 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 + 2*u11*u23*u34*v13*v22*v32 - 2*u11*u23*u35*v13*v21*v32 - 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 - 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 + 2*u11*u25*u33*v13*v21*v32 + 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 + 2*u12*u21*u33*v13*v24*v32 + 2*u12*u21*u33*v13*v25*v31 - 2*u12*u21*u33*v14*v23*v32 - 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 - 2*u12*u22*u33*v13*v24*v31 + 2*u12*u22*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v35 - 2*u12*u23*u31*v13*v22*v34 + 2*u12*u23*u31*v14*v22*v33 + 2*u12*u23*u31*v15*v21*v33 + 2*u12*u23*u32*v13*v21*v34 - 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 - 2*u12*u23*u34*v13*v21*v32 - 2*u12*u23*u34*v13*v22*v31 + 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 + 2*u12*u24*u33*v13*v21*v32 + 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 - 2*u12*u25*u33*v13*v21*v31 - 2*u13*u21*u31*v12*v23*v35 + 2*u13*u21*u31*v12*v25*v33 + 2*u13*u21*u32*v11*v23*v35 - 2*u13*u21*u32*v11*v25*v33 + 2*u13*u21*u32*v12*v23*v34 - 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 - 2*u13*u21*u34*v12*v23*v32 + 2*u13*u21*u35*v11*v23*v32 + 2*u13*u21*u35*v12*v23*v31 + 2*u13*u22*u31*v11*v23*v35 - 2*u13*u22*u31*v11*v25*v33 + 2*u13*u22*u31*v12*v23*v34 - 2*u13*u22*u31*v12*v24*v33 - 2*u13*u22*u32*v11*v23*v34 + 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 + 2*u13*u22*u34*v11*v23*v32 + 2*u13*u22*u34*v12*v23*v31 - 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 + 2*u13*u24*u31*v12*v22*v33 - 2*u13*u24*u32*v11*v22*v33 - 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 - 2*u13*u25*u31*v11*v22*v33 - 2*u13*u25*u31*v12*v21*v33 + 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 + 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 - 2*u14*u22*u33*v11*v23*v32 - 2*u14*u22*u33*v12*v23*v31 - 2*u14*u23*u31*v12*v22*v33 + 2*u14*u23*u32*v11*v22*v33 + 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 - 2*u15*u21*u33*v11*v23*v32 - 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 + 2*u15*u22*u33*v11*v23*v31 + 2*u15*u23*u31*v11*v22*v33 + 2*u15*u23*u31*v12*v21*v33 - 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 + 2*u12*u22*u33*v13*v25*v32 - 2*u12*u22*u33*v15*v23*v32 - 2*u12*u23*u32*v13*v22*v35 + 2*u12*u23*u32*v15*v22*v33 - 2*u12*u23*u35*v13*v22*v32 + 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 + 2*u13*u22*u32*v12*v23*v35 - 2*u13*u22*u32*v12*v25*v33 + 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 - 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 - 2*u15*u22*u33*v12*v23*v32 + 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c3 = 2*u11*u21*u33*v14*v23*v32 - 4*u11*u21*u33*v13*v25*v31 - 2*u11*u21*u33*v13*v24*v32 + 4*u11*u21*u33*v15*v23*v31 + 4*u11*u22*u33*v13*v24*v31 - 2*u11*u22*u33*v14*v23*v31 + 4*u11*u23*u31*v13*v21*v35 + 2*u11*u23*u31*v13*v22*v34 - 2*u11*u23*u31*v14*v22*v33 - 4*u11*u23*u31*v15*v21*v33 - 4*u11*u23*u32*v13*v21*v34 + 2*u11*u23*u32*v14*v21*v33 + 4*u11*u23*u34*v13*v21*v32 + 2*u11*u23*u34*v13*v22*v31 - 4*u11*u23*u35*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v32 - 4*u11*u24*u33*v13*v22*v31 + 4*u11*u25*u33*v13*v21*v31 + 2*u12*u21*u33*v13*v24*v31 - 4*u12*u21*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v34 + 4*u12*u23*u31*v14*v21*v33 - 2*u12*u23*u34*v13*v21*v31 + 2*u12*u24*u33*v13*v21*v31 - 4*u13*u21*u31*v11*v23*v35 + 4*u13*u21*u31*v11*v25*v33 - 2*u13*u21*u31*v12*v23*v34 + 2*u13*u21*u31*v12*v24*v33 + 4*u13*u21*u32*v11*v23*v34 - 2*u13*u21*u32*v11*v24*v33 - 4*u13*u21*u34*v11*v23*v32 - 2*u13*u21*u34*v12*v23*v31 + 4*u13*u21*u35*v11*v23*v31 + 2*u13*u22*u31*v11*v23*v34 - 4*u13*u22*u31*v11*v24*v33 + 2*u13*u22*u34*v11*v23*v31 + 4*u13*u24*u31*v11*v22*v33 + 2*u13*u24*u31*v12*v21*v33 - 2*u13*u24*u32*v11*v21*v33 - 4*u13*u25*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v32 + 4*u14*u21*u33*v12*v23*v31 - 2*u14*u22*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v22*v33 - 4*u14*u23*u31*v12*v21*v33 + 2*u14*u23*u32*v11*v21*v33 - 4*u15*u21*u33*v11*v23*v31 + 4*u15*u23*u31*v11*v21*v33 - 2*u11*u22*u33*v13*v25*v32 + 4*u11*u22*u33*v15*v23*v32 + 2*u11*u23*u32*v13*v22*v35 - 4*u11*u23*u32*v15*v22*v33 + 2*u11*u23*u35*v13*v22*v32 - 2*u11*u25*u33*v13*v22*v32 - 4*u12*u21*u33*v13*v25*v32 + 2*u12*u21*u33*v15*v23*v32 + 4*u12*u22*u33*v13*v24*v32 + 2*u12*u22*u33*v13*v25*v31 - 4*u12*u22*u33*v14*v23*v32 - 2*u12*u22*u33*v15*v23*v31 + 4*u12*u23*u31*v13*v22*v35 - 2*u12*u23*u31*v15*v22*v33 - 2*u12*u23*u32*v13*v21*v35 - 4*u12*u23*u32*v13*v22*v34 + 4*u12*u23*u32*v14*v22*v33 + 2*u12*u23*u32*v15*v21*v33 + 4*u12*u23*u34*v13*v22*v32 - 2*u12*u23*u35*v13*v21*v32 - 4*u12*u23*u35*v13*v22*v31 - 4*u12*u24*u33*v13*v22*v32 + 4*u12*u25*u33*v13*v21*v32 + 2*u12*u25*u33*v13*v22*v31 - 2*u13*u21*u32*v12*v23*v35 + 4*u13*u21*u32*v12*v25*v33 - 2*u13*u21*u35*v12*v23*v32 - 4*u13*u22*u31*v12*v23*v35 + 2*u13*u22*u31*v12*v25*v33 + 2*u13*u22*u32*v11*v23*v35 - 2*u13*u22*u32*v11*v25*v33 + 4*u13*u22*u32*v12*v23*v34 - 4*u13*u22*u32*v12*v24*v33 - 4*u13*u22*u34*v12*v23*v32 + 2*u13*u22*u35*v11*v23*v32 + 4*u13*u22*u35*v12*v23*v31 + 4*u13*u24*u32*v12*v22*v33 + 2*u13*u25*u31*v12*v22*v33 - 2*u13*u25*u32*v11*v22*v33 - 4*u13*u25*u32*v12*v21*v33 + 4*u14*u22*u33*v12*v23*v32 - 4*u14*u23*u32*v12*v22*v33 + 2*u15*u21*u33*v12*v23*v32 - 4*u15*u22*u33*v11*v23*v32 - 2*u15*u22*u33*v12*v23*v31 - 2*u15*u23*u31*v12*v22*v33 + 4*u15*u23*u32*v11*v22*v33 + 2*u15*u23*u32*v12*v21*v33 + 2*u11*u22*u33*v13*v23*v36 + 2*u11*u22*u36*v13*v23*v33 - 2*u11*u23*u32*v13*v26*v33 - 2*u11*u26*u32*v13*v23*v33 - 2*u12*u21*u33*v13*v23*v36 - 2*u12*u21*u36*v13*v23*v33 + 2*u12*u23*u31*v13*v26*v33 + 2*u12*u26*u31*v13*v23*v33 + 2*u13*u21*u32*v16*v23*v33 - 2*u13*u22*u31*v16*v23*v33 + 2*u13*u23*u33*v11*v22*v36 - 2*u13*u23*u33*v11*v26*v32 - 2*u13*u23*u33*v12*v21*v36 + 2*u13*u23*u33*v12*v26*v31 + 2*u13*u23*u33*v16*v21*v32 - 2*u13*u23*u33*v16*v22*v31 + 2*u13*u23*u36*v11*v22*v33 - 2*u13*u23*u36*v12*v21*v33 - 2*u13*u26*u33*v11*v23*v32 + 2*u13*u26*u33*v12*v23*v31 + 2*u16*u21*u32*v13*v23*v33 - 2*u16*u22*u31*v13*v23*v33 + 2*u16*u23*u33*v13*v21*v32 - 2*u16*u23*u33*v13*v22*v31;
	c4 = 2*u11*u21*u33*v14*v23*v31 - 2*u11*u21*u33*v13*v24*v31 + 2*u11*u23*u31*v13*v21*v34 - 2*u11*u23*u31*v14*v21*v33 + 2*u11*u23*u34*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v31 - 2*u13*u21*u31*v11*v23*v34 + 2*u13*u21*u31*v11*v24*v33 - 2*u13*u21*u34*v11*v23*v31 + 2*u13*u24*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 + 2*u11*u21*u33*v13*v25*v32 - 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 - 2*u11*u22*u33*v13*v24*v32 - 2*u11*u22*u33*v13*v25*v31 + 2*u11*u22*u33*v14*v23*v32 + 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 - 2*u11*u23*u31*v13*v22*v35 + 2*u11*u23*u31*v15*v22*v33 + 2*u11*u23*u32*v13*v21*v35 + 2*u11*u23*u32*v13*v22*v34 - 2*u11*u23*u32*v14*v22*v33 - 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 - 2*u11*u23*u34*v13*v22*v32 + 2*u11*u23*u35*v13*v21*v32 + 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 + 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 - 2*u11*u25*u33*v13*v21*v32 - 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 - 2*u12*u21*u33*v13*v24*v32 - 2*u12*u21*u33*v13*v25*v31 + 2*u12*u21*u33*v14*v23*v32 + 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 + 2*u12*u22*u33*v13*v24*v31 - 2*u12*u22*u33*v14*v23*v31 + 2*u12*u23*u31*v13*v21*v35 + 2*u12*u23*u31*v13*v22*v34 - 2*u12*u23*u31*v14*v22*v33 - 2*u12*u23*u31*v15*v21*v33 - 2*u12*u23*u32*v13*v21*v34 + 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 + 2*u12*u23*u34*v13*v21*v32 + 2*u12*u23*u34*v13*v22*v31 - 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 - 2*u12*u24*u33*v13*v21*v32 - 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 + 2*u12*u25*u33*v13*v21*v31 + 2*u13*u21*u31*v12*v23*v35 - 2*u13*u21*u31*v12*v25*v33 - 2*u13*u21*u32*v11*v23*v35 + 2*u13*u21*u32*v11*v25*v33 - 2*u13*u21*u32*v12*v23*v34 + 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 + 2*u13*u21*u34*v12*v23*v32 - 2*u13*u21*u35*v11*v23*v32 - 2*u13*u21*u35*v12*v23*v31 - 2*u13*u22*u31*v11*v23*v35 + 2*u13*u22*u31*v11*v25*v33 - 2*u13*u22*u31*v12*v23*v34 + 2*u13*u22*u31*v12*v24*v33 + 2*u13*u22*u32*v11*v23*v34 - 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 - 2*u13*u22*u34*v11*v23*v32 - 2*u13*u22*u34*v12*v23*v31 + 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 - 2*u13*u24*u31*v12*v22*v33 + 2*u13*u24*u32*v11*v22*v33 + 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 + 2*u13*u25*u31*v11*v22*v33 + 2*u13*u25*u31*v12*v21*v33 - 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 - 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 + 2*u14*u22*u33*v11*v23*v32 + 2*u14*u22*u33*v12*v23*v31 + 2*u14*u23*u31*v12*v22*v33 - 2*u14*u23*u32*v11*v22*v33 - 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 + 2*u15*u21*u33*v11*v23*v32 + 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 - 2*u15*u22*u33*v11*v23*v31 - 2*u15*u23*u31*v11*v22*v33 - 2*u15*u23*u31*v12*v21*v33 + 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 - 2*u12*u22*u33*v13*v25*v32 + 2*u12*u22*u33*v15*v23*v32 + 2*u12*u23*u32*v13*v22*v35 - 2*u12*u23*u32*v15*v22*v33 + 2*u12*u23*u35*v13*v22*v32 - 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 - 2*u13*u22*u32*v12*v23*v35 + 2*u13*u22*u32*v12*v25*v33 - 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 + 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 + 2*u15*u22*u33*v12*v23*v32 - 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c5 = u11*u21*u32*v14*v23*v33 - u11*u21*u32*v13*v24*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 + u11*u22*u31*v13*v23*v34 - u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 + u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 + u11*u23*u33*v14*v21*v32 - u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 - u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 - u12*u21*u31*v13*v23*v34 + u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 - u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 + u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 - u13*u21*u33*v11*v24*v32 + u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 + u13*u23*u31*v11*v22*v34 - u13*u23*u31*v12*v21*v34 + u13*u23*u34*v11*v22*v31 - u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 - u13*u24*u33*v11*v21*v32 + u13*u24*u33*v12*v21*v31 + u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 - u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 + u14*u23*u33*v11*v21*v32 - u14*u23*u33*v11*v22*v31 + u11*u22*u32*v13*v23*v35 - u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 + u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 - u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 - u12*u21*u32*v13*v23*v35 + u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 - u12*u21*u35*v13*v23*v32 + u12*u22*u31*v13*v25*v33 - u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 + u12*u23*u33*v15*v21*v32 - u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 + u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 - u13*u22*u33*v11*v25*v32 + u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 + u13*u23*u32*v11*v22*v35 - u13*u23*u32*v12*v21*v35 + u13*u23*u35*v11*v22*v32 - u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 - u13*u25*u33*v11*v22*v32 + u13*u25*u33*v12*v22*v31 + u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 - u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 + u15*u23*u33*v12*v21*v32 - u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 - u11*u23*u33*v13*v22*v36 + u11*u23*u33*v13*v26*v32 - u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 + u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 + u12*u23*u33*v13*v21*v36 - u12*u23*u33*v13*v26*v31 + u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 - u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 + u13*u21*u33*v12*v23*v36 - u13*u21*u33*v16*v23*v32 + u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 - u13*u22*u33*v11*v23*v36 + u13*u22*u33*v16*v23*v31 - u13*u22*u36*v11*v23*v33 - u13*u23*u31*v12*v26*v33 + u13*u23*u31*v16*v22*v33 + u13*u23*u32*v11*v26*v33 - u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 - u13*u26*u31*v12*v23*v33 + u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 - u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 + u16*u22*u33*v13*v23*v31 + u16*u23*u31*v13*v22*v33 - u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;

	//	std::cerr << "[ERR]: new version working" << std::endl;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = c1;
	factors(1, 0) = c2;
	factors(2, 0) = c3;
	factors(3, 0) = c4;
	factors(4, 0) = c5;
	vector<floatPrec> realRoots = o4_roots(factors);
	if (verbose)
		cout << "[VERBOSE] The number of valid solutions is: " << realRoots.size() << endl;

	// estimate the resulting transformations for each of the roots
	floatPrec s, sTheta1, sTheta2, tx, ty;
	floatPrec a, b, shouldBeZero1, shouldBeZero2;
	Matrix<floatPrec, 4, 4> transOut;
	vector<Matrix<floatPrec, 4, 4>> out;
	unsigned int numSolutions = realRoots.size();
	for (unsigned int iter = 0; iter < numSolutions; iter++)
	{

		// get the cTheta
		s = realRoots.back();
		realRoots.pop_back();

		// get the transformation for sTheta1
        a = (1-s*s) / (1+s*s);
        b = 2*s / (1+s*s);
		
		tx = -(u13 * u23 * v11 * v26 - u13 * u23 * v16 * v21 + u13 * u26 * v11 * v23 - u16 * u23 * v13 * v21 - a * u11 * u23 * v14 * v21 + a * u13 * u21 * v11 * v24 + a * u13 * u24 * v11 * v21 - a * u14 * u23 * v11 * v21 - a * u12 * u23 * v15 * v21 + a * u13 * u22 * v11 * v25 + a * u13 * u25 * v11 * v22 - a * u15 * u23 * v12 * v21 - a * u11 * u23 * v13 * v26 - a * u11 * u26 * v13 * v23 + a * u13 * u21 * v16 * v23 + a * u16 * u21 * v13 * v23 - b * u11 * u23 * v15 * v21 + b * u12 * u23 * v14 * v21 + b * u13 * u21 * v11 * v25 - b * u13 * u22 * v11 * v24 + b * u13 * u24 * v11 * v22 - b * u13 * u25 * v11 * v21 - b * u14 * u23 * v12 * v21 + b * u15 * u23 * v11 * v21 + b * u12 * u23 * v13 * v26 + b * u12 * u26 * v13 * v23 - b * u13 * u22 * v16 * v23 - b * u16 * u22 * v13 * v23 - (a * a) * u11 * u21 * v13 * v24 + (a * a) * u11 * u21 * v14 * v23 - (a * a) * u11 * u24 * v13 * v21 + (a * a) * u14 * u21 * v11 * v23 - (a * a) * u11 * u22 * v13 * v25 - (a * a) * u11 * u25 * v13 * v22 + (a * a) * u12 * u21 * v15 * v23 + (a * a) * u15 * u21 * v12 * v23 - (b * b) * u11 * u22 * v15 * v23 + (b * b) * u12 * u21 * v13 * v25 - (b * b) * u12 * u22 * v13 * v24 + (b * b) * u12 * u22 * v14 * v23 + (b * b) * u12 * u24 * v13 * v22 - (b * b) * u12 * u25 * v13 * v21 - (b * b) * u14 * u22 * v12 * v23 + (b * b) * u15 * u22 * v11 * v23 - a * b * u11 * u21 * v13 * v25 + a * b * u11 * u21 * v15 * v23 + a * b * u11 * u22 * v13 * v24 - a * b * u11 * u22 * v14 * v23 - a * b * u11 * u24 * v13 * v22 + a * b * u11 * u25 * v13 * v21 + a * b * u12 * u21 * v13 * v24 - a * b * u12 * u21 * v14 * v23 + a * b * u12 * u24 * v13 * v21 + a * b * u14 * u21 * v12 * v23 - a * b * u14 * u22 * v11 * v23 - a * b * u15 * u21 * v11 * v23 + a * b * u12 * u22 * v13 * v25 - a * b * u12 * u22 * v15 * v23 + a * b * u12 * u25 * v13 * v22 - a * b * u15 * u22 * v12 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		ty = -(u13 * u23 * v12 * v26 - u13 * u23 * v16 * v22 + u13 * u26 * v12 * v23 - u16 * u23 * v13 * v22 - a * u11 * u23 * v14 * v22 + a * u13 * u21 * v12 * v24 + a * u13 * u24 * v12 * v21 - a * u14 * u23 * v11 * v22 - a * u12 * u23 * v15 * v22 + a * u13 * u22 * v12 * v25 + a * u13 * u25 * v12 * v22 - a * u15 * u23 * v12 * v22 - a * u12 * u23 * v13 * v26 - a * u12 * u26 * v13 * v23 + a * u13 * u22 * v16 * v23 + a * u16 * u22 * v13 * v23 - b * u11 * u23 * v15 * v22 + b * u12 * u23 * v14 * v22 + b * u13 * u21 * v12 * v25 - b * u13 * u22 * v12 * v24 + b * u13 * u24 * v12 * v22 - b * u13 * u25 * v12 * v21 - b * u14 * u23 * v12 * v22 + b * u15 * u23 * v11 * v22 - b * u11 * u23 * v13 * v26 - b * u11 * u26 * v13 * v23 + b * u13 * u21 * v16 * v23 + b * u16 * u21 * v13 * v23 + (a * a) * u11 * u22 * v14 * v23 - (a * a) * u12 * u21 * v13 * v24 - (a * a) * u12 * u24 * v13 * v21 + (a * a) * u14 * u22 * v11 * v23 - (a * a) * u12 * u22 * v13 * v25 + (a * a) * u12 * u22 * v15 * v23 - (a * a) * u12 * u25 * v13 * v22 + (a * a) * u15 * u22 * v12 * v23 - (b * b) * u11 * u21 * v13 * v25 + (b * b) * u11 * u21 * v15 * v23 + (b * b) * u11 * u22 * v13 * v24 - (b * b) * u11 * u24 * v13 * v22 + (b * b) * u11 * u25 * v13 * v21 - (b * b) * u12 * u21 * v14 * v23 + (b * b) * u14 * u21 * v12 * v23 - (b * b) * u15 * u21 * v11 * v23 - a * b * u11 * u21 * v13 * v24 + a * b * u11 * u21 * v14 * v23 - a * b * u11 * u24 * v13 * v21 + a * b * u14 * u21 * v11 * v23 - a * b * u11 * u22 * v13 * v25 + a * b * u11 * u22 * v15 * v23 - a * b * u11 * u25 * v13 * v22 - a * b * u12 * u21 * v13 * v25 + a * b * u12 * u21 * v15 * v23 + a * b * u12 * u22 * v13 * v24 - a * b * u12 * u22 * v14 * v23 - a * b * u12 * u24 * v13 * v22 + a * b * u12 * u25 * v13 * v21 + a * b * u14 * u22 * v12 * v23 + a * b * u15 * u21 * v12 * v23 - a * b * u15 * u22 * v11 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		
		transOut << a, -b, 0, tx,
			b, a, 0, ty,
			0, 0, 1, 0,
			0, 0, 0, 1;
		transOut = TV.inverse() * transOut * TU;
		
		// push the valid transformation to the Output
		out.push_back(transOut);
		if (verbose)
			cout << "[VERBOSE] The estimated " << iter + 1 << " solution is:" << endl
				 << transOut << endl;
	}

	return out;
}